

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx::CurveNiMBIntersector1<4>::
     occluded_h<embree::avx::RibbonCurve1Intersector1<embree::HermiteCurveT,8>,embree::avx::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined1 (*pauVar9) [28];
  undefined1 (*pauVar10) [32];
  undefined1 (*pauVar11) [28];
  undefined4 uVar12;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar13;
  Primitive PVar14;
  Geometry *pGVar15;
  __int_type_conflict _Var16;
  long lVar17;
  long lVar18;
  long lVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [28];
  undefined1 auVar119 [28];
  undefined1 auVar120 [28];
  undefined1 auVar121 [28];
  undefined1 auVar122 [28];
  uint uVar123;
  int iVar124;
  RTCIntersectArguments *pRVar125;
  ulong uVar126;
  uint uVar127;
  ulong uVar128;
  long lVar129;
  long lVar130;
  RTCFilterFunctionN p_Var131;
  float fVar132;
  vint4 bi_2;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar147;
  float fVar149;
  float fVar150;
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  float fVar146;
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [64];
  float fVar148;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  float fVar151;
  float fVar166;
  vint4 bi_1;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar152;
  undefined1 auVar156 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  float fVar171;
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  float fVar164;
  float fVar165;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  undefined1 auVar163 [64];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  vint4 bi;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  float fVar181;
  undefined1 auVar180 [32];
  float fVar182;
  float fVar183;
  float fVar193;
  float fVar194;
  vint4 ai_1;
  undefined1 auVar184 [16];
  float fVar196;
  undefined1 auVar185 [16];
  float fVar197;
  undefined1 auVar187 [16];
  undefined1 auVar186 [16];
  float fVar198;
  float fVar199;
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  float fVar195;
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  float fVar200;
  float fVar213;
  float fVar216;
  vint4 ai_2;
  undefined1 auVar204 [16];
  float fVar218;
  undefined1 auVar205 [16];
  float fVar201;
  float fVar202;
  float fVar203;
  undefined1 auVar207 [16];
  undefined1 auVar206 [16];
  float fVar214;
  float fVar219;
  float fVar220;
  undefined1 auVar208 [32];
  float fVar215;
  float fVar217;
  float fVar221;
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  float fVar222;
  float fVar223;
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  float fVar224;
  float fVar232;
  float fVar233;
  undefined1 auVar225 [16];
  float fVar234;
  float fVar235;
  float fVar236;
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  float fVar237;
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  float fVar246;
  undefined1 auVar245 [32];
  float fVar247;
  float fVar248;
  float fVar256;
  float fVar257;
  float fVar258;
  float fVar259;
  vint4 ai;
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  float fVar260;
  float fVar261;
  float fVar262;
  float fVar263;
  float fVar264;
  undefined1 auVar255 [32];
  float fVar265;
  float fVar272;
  float fVar273;
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  float fVar276;
  undefined1 auVar269 [32];
  float fVar274;
  undefined1 auVar270 [32];
  float fVar275;
  undefined1 auVar271 [32];
  float fVar277;
  float fVar285;
  float fVar286;
  undefined1 auVar278 [16];
  float fVar288;
  float fVar289;
  float fVar290;
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  float fVar287;
  undefined1 auVar284 [64];
  undefined1 auVar291 [16];
  float fVar294;
  float fVar295;
  float fVar296;
  float fVar297;
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  float fVar298;
  float fVar301;
  float fVar302;
  float fVar303;
  undefined1 auVar299 [16];
  float fVar304;
  float fVar305;
  float fVar306;
  float fVar307;
  float fVar308;
  float fVar309;
  undefined1 auVar300 [32];
  undefined1 auVar310 [16];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [16];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  float fVar319;
  float fVar321;
  float fVar322;
  float fVar323;
  undefined1 auVar320 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [16];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_8> bhit;
  bool local_7f9;
  int local_7ec;
  Primitive *local_7e8;
  undefined1 local_7e0 [4];
  undefined1 auStack_7dc [8];
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  uint local_7c0;
  undefined4 uStack_7bc;
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  ulong local_790;
  Precalculations *local_788;
  undefined1 local_780 [32];
  undefined1 local_760 [48];
  RTCFilterFunctionNArguments local_730;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [8];
  undefined8 uStack_6d8;
  undefined1 auStack_6d0 [8];
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [8];
  undefined8 uStack_6b8;
  undefined1 auStack_6b0 [8];
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [48];
  undefined1 local_670 [8];
  undefined8 uStack_668;
  undefined8 local_660;
  undefined4 local_658;
  float local_654;
  uint local_650;
  undefined4 local_64c;
  undefined4 local_648;
  uint local_644;
  uint local_640;
  ulong local_628;
  undefined1 local_620 [32];
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  undefined1 auStack_5b0 [8];
  float fStack_5a8;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  undefined1 auStack_510 [8];
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4b0 [16];
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [8];
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined1 local_360 [8];
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  uint local_280;
  uint local_27c;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined1 local_220 [32];
  float local_200 [4];
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  undefined1 auVar157 [24];
  
  PVar14 = prim[1];
  uVar126 = (ulong)(byte)PVar14;
  lVar19 = uVar126 * 0x25;
  fVar298 = *(float *)(prim + lVar19 + 0x12);
  auVar327 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + lVar19 + 6));
  auVar249._0_4_ = fVar298 * (ray->dir).field_0.m128[0];
  auVar249._4_4_ = fVar298 * (ray->dir).field_0.m128[1];
  auVar249._8_4_ = fVar298 * (ray->dir).field_0.m128[2];
  auVar249._12_4_ = fVar298 * (ray->dir).field_0.m128[3];
  auVar172._0_4_ = fVar298 * auVar327._0_4_;
  auVar172._4_4_ = fVar298 * auVar327._4_4_;
  auVar172._8_4_ = fVar298 * auVar327._8_4_;
  auVar172._12_4_ = fVar298 * auVar327._12_4_;
  auVar327 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 4 + 6)));
  auVar327 = vcvtdq2ps_avx(auVar327);
  auVar176 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 5 + 6)));
  auVar176 = vcvtdq2ps_avx(auVar176);
  auVar207 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 6 + 6)));
  auVar207 = vcvtdq2ps_avx(auVar207);
  auVar187 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 0xf + 6)));
  auVar187 = vcvtdq2ps_avx(auVar187);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar14 * 0x10 + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar14 * 0x10 + uVar126 + 6)));
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 0x1a + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 0x1b + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 0x1c + 6)));
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar25 = vshufps_avx(auVar249,auVar249,0);
  auVar26 = vshufps_avx(auVar249,auVar249,0x55);
  auVar27 = vshufps_avx(auVar249,auVar249,0xaa);
  fVar298 = auVar27._0_4_;
  fVar181 = auVar27._4_4_;
  fVar301 = auVar27._8_4_;
  fVar197 = auVar27._12_4_;
  fVar200 = auVar26._0_4_;
  fVar213 = auVar26._4_4_;
  fVar216 = auVar26._8_4_;
  fVar218 = auVar26._12_4_;
  fVar183 = auVar25._0_4_;
  fVar193 = auVar25._4_4_;
  fVar194 = auVar25._8_4_;
  fVar196 = auVar25._12_4_;
  auVar310._0_4_ = fVar183 * auVar327._0_4_ + fVar200 * auVar176._0_4_ + fVar298 * auVar207._0_4_;
  auVar310._4_4_ = fVar193 * auVar327._4_4_ + fVar213 * auVar176._4_4_ + fVar181 * auVar207._4_4_;
  auVar310._8_4_ = fVar194 * auVar327._8_4_ + fVar216 * auVar176._8_4_ + fVar301 * auVar207._8_4_;
  auVar310._12_4_ =
       fVar196 * auVar327._12_4_ + fVar218 * auVar176._12_4_ + fVar197 * auVar207._12_4_;
  auVar315._0_4_ = fVar183 * auVar187._0_4_ + fVar200 * auVar20._0_4_ + auVar21._0_4_ * fVar298;
  auVar315._4_4_ = fVar193 * auVar187._4_4_ + fVar213 * auVar20._4_4_ + auVar21._4_4_ * fVar181;
  auVar315._8_4_ = fVar194 * auVar187._8_4_ + fVar216 * auVar20._8_4_ + auVar21._8_4_ * fVar301;
  auVar315._12_4_ = fVar196 * auVar187._12_4_ + fVar218 * auVar20._12_4_ + auVar21._12_4_ * fVar197;
  auVar250._0_4_ = fVar183 * auVar22._0_4_ + fVar200 * auVar23._0_4_ + auVar24._0_4_ * fVar298;
  auVar250._4_4_ = fVar193 * auVar22._4_4_ + fVar213 * auVar23._4_4_ + auVar24._4_4_ * fVar181;
  auVar250._8_4_ = fVar194 * auVar22._8_4_ + fVar216 * auVar23._8_4_ + auVar24._8_4_ * fVar301;
  auVar250._12_4_ = fVar196 * auVar22._12_4_ + fVar218 * auVar23._12_4_ + auVar24._12_4_ * fVar197;
  auVar25 = vshufps_avx(auVar172,auVar172,0);
  auVar26 = vshufps_avx(auVar172,auVar172,0x55);
  auVar27 = vshufps_avx(auVar172,auVar172,0xaa);
  fVar298 = auVar27._0_4_;
  fVar181 = auVar27._4_4_;
  fVar301 = auVar27._8_4_;
  fVar197 = auVar27._12_4_;
  fVar200 = auVar26._0_4_;
  fVar213 = auVar26._4_4_;
  fVar216 = auVar26._8_4_;
  fVar218 = auVar26._12_4_;
  fVar183 = auVar25._0_4_;
  fVar193 = auVar25._4_4_;
  fVar194 = auVar25._8_4_;
  fVar196 = auVar25._12_4_;
  auVar173._0_4_ = fVar183 * auVar327._0_4_ + fVar200 * auVar176._0_4_ + fVar298 * auVar207._0_4_;
  auVar173._4_4_ = fVar193 * auVar327._4_4_ + fVar213 * auVar176._4_4_ + fVar181 * auVar207._4_4_;
  auVar173._8_4_ = fVar194 * auVar327._8_4_ + fVar216 * auVar176._8_4_ + fVar301 * auVar207._8_4_;
  auVar173._12_4_ =
       fVar196 * auVar327._12_4_ + fVar218 * auVar176._12_4_ + fVar197 * auVar207._12_4_;
  auVar153._0_4_ = fVar183 * auVar187._0_4_ + auVar21._0_4_ * fVar298 + fVar200 * auVar20._0_4_;
  auVar153._4_4_ = fVar193 * auVar187._4_4_ + auVar21._4_4_ * fVar181 + fVar213 * auVar20._4_4_;
  auVar153._8_4_ = fVar194 * auVar187._8_4_ + auVar21._8_4_ * fVar301 + fVar216 * auVar20._8_4_;
  auVar153._12_4_ = fVar196 * auVar187._12_4_ + auVar21._12_4_ * fVar197 + fVar218 * auVar20._12_4_;
  auVar133._0_4_ = fVar183 * auVar22._0_4_ + fVar200 * auVar23._0_4_ + auVar24._0_4_ * fVar298;
  auVar133._4_4_ = fVar193 * auVar22._4_4_ + fVar213 * auVar23._4_4_ + auVar24._4_4_ * fVar181;
  auVar133._8_4_ = fVar194 * auVar22._8_4_ + fVar216 * auVar23._8_4_ + auVar24._8_4_ * fVar301;
  auVar133._12_4_ = fVar196 * auVar22._12_4_ + fVar218 * auVar23._12_4_ + auVar24._12_4_ * fVar197;
  auVar238._8_4_ = 0x7fffffff;
  auVar238._0_8_ = 0x7fffffff7fffffff;
  auVar238._12_4_ = 0x7fffffff;
  auVar327 = vandps_avx(auVar310,auVar238);
  auVar204._8_4_ = 0x219392ef;
  auVar204._0_8_ = 0x219392ef219392ef;
  auVar204._12_4_ = 0x219392ef;
  auVar327 = vcmpps_avx(auVar327,auVar204,1);
  auVar176 = vblendvps_avx(auVar310,auVar204,auVar327);
  auVar327 = vandps_avx(auVar315,auVar238);
  auVar327 = vcmpps_avx(auVar327,auVar204,1);
  auVar207 = vblendvps_avx(auVar315,auVar204,auVar327);
  auVar327 = vandps_avx(auVar250,auVar238);
  auVar327 = vcmpps_avx(auVar327,auVar204,1);
  auVar327 = vblendvps_avx(auVar250,auVar204,auVar327);
  auVar187 = vrcpps_avx(auVar176);
  fVar183 = auVar187._0_4_;
  auVar184._0_4_ = fVar183 * auVar176._0_4_;
  fVar193 = auVar187._4_4_;
  auVar184._4_4_ = fVar193 * auVar176._4_4_;
  fVar194 = auVar187._8_4_;
  auVar184._8_4_ = fVar194 * auVar176._8_4_;
  fVar196 = auVar187._12_4_;
  auVar184._12_4_ = fVar196 * auVar176._12_4_;
  auVar251._8_4_ = 0x3f800000;
  auVar251._0_8_ = &DAT_3f8000003f800000;
  auVar251._12_4_ = 0x3f800000;
  auVar176 = vsubps_avx(auVar251,auVar184);
  fVar183 = fVar183 + fVar183 * auVar176._0_4_;
  fVar193 = fVar193 + fVar193 * auVar176._4_4_;
  fVar194 = fVar194 + fVar194 * auVar176._8_4_;
  fVar196 = fVar196 + fVar196 * auVar176._12_4_;
  auVar176 = vrcpps_avx(auVar207);
  fVar200 = auVar176._0_4_;
  auVar225._0_4_ = fVar200 * auVar207._0_4_;
  fVar213 = auVar176._4_4_;
  auVar225._4_4_ = fVar213 * auVar207._4_4_;
  fVar216 = auVar176._8_4_;
  auVar225._8_4_ = fVar216 * auVar207._8_4_;
  fVar218 = auVar176._12_4_;
  auVar225._12_4_ = fVar218 * auVar207._12_4_;
  auVar176 = vsubps_avx(auVar251,auVar225);
  fVar200 = fVar200 + fVar200 * auVar176._0_4_;
  fVar213 = fVar213 + fVar213 * auVar176._4_4_;
  fVar216 = fVar216 + fVar216 * auVar176._8_4_;
  fVar218 = fVar218 + fVar218 * auVar176._12_4_;
  auVar176 = vrcpps_avx(auVar327);
  fVar224 = auVar176._0_4_;
  auVar239._0_4_ = fVar224 * auVar327._0_4_;
  fVar232 = auVar176._4_4_;
  auVar239._4_4_ = fVar232 * auVar327._4_4_;
  fVar233 = auVar176._8_4_;
  auVar239._8_4_ = fVar233 * auVar327._8_4_;
  fVar234 = auVar176._12_4_;
  auVar239._12_4_ = fVar234 * auVar327._12_4_;
  auVar327 = vsubps_avx(auVar251,auVar239);
  fVar224 = fVar224 + fVar224 * auVar327._0_4_;
  fVar232 = fVar232 + fVar232 * auVar327._4_4_;
  fVar233 = fVar233 + fVar233 * auVar327._8_4_;
  fVar234 = fVar234 + fVar234 * auVar327._12_4_;
  auVar327 = ZEXT416((uint)(((ray->dir).field_0.m128[3] - *(float *)(prim + lVar19 + 0x16)) *
                           *(float *)(prim + lVar19 + 0x1a)));
  auVar207 = vshufps_avx(auVar327,auVar327,0);
  auVar327._8_8_ = 0;
  auVar327._0_8_ = *(ulong *)(prim + uVar126 * 7 + 6);
  auVar327 = vpmovsxwd_avx(auVar327);
  auVar327 = vcvtdq2ps_avx(auVar327);
  auVar176._8_8_ = 0;
  auVar176._0_8_ = *(ulong *)(prim + uVar126 * 0xb + 6);
  auVar176 = vpmovsxwd_avx(auVar176);
  auVar176 = vcvtdq2ps_avx(auVar176);
  auVar176 = vsubps_avx(auVar176,auVar327);
  fVar298 = auVar207._0_4_;
  fVar181 = auVar207._4_4_;
  fVar301 = auVar207._8_4_;
  fVar197 = auVar207._12_4_;
  auVar252._0_4_ = auVar176._0_4_ * fVar298 + auVar327._0_4_;
  auVar252._4_4_ = auVar176._4_4_ * fVar181 + auVar327._4_4_;
  auVar252._8_4_ = auVar176._8_4_ * fVar301 + auVar327._8_4_;
  auVar252._12_4_ = auVar176._12_4_ * fVar197 + auVar327._12_4_;
  auVar207._8_8_ = 0;
  auVar207._0_8_ = *(ulong *)(prim + uVar126 * 9 + 6);
  auVar327 = vpmovsxwd_avx(auVar207);
  auVar327 = vcvtdq2ps_avx(auVar327);
  auVar187._8_8_ = 0;
  auVar187._0_8_ = *(ulong *)(prim + uVar126 * 0xd + 6);
  auVar176 = vpmovsxwd_avx(auVar187);
  auVar176 = vcvtdq2ps_avx(auVar176);
  auVar176 = vsubps_avx(auVar176,auVar327);
  auVar266._0_4_ = auVar176._0_4_ * fVar298 + auVar327._0_4_;
  auVar266._4_4_ = auVar176._4_4_ * fVar181 + auVar327._4_4_;
  auVar266._8_4_ = auVar176._8_4_ * fVar301 + auVar327._8_4_;
  auVar266._12_4_ = auVar176._12_4_ * fVar197 + auVar327._12_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar126 * 0x12 + 6);
  auVar327 = vpmovsxwd_avx(auVar20);
  auVar327 = vcvtdq2ps_avx(auVar327);
  uVar128 = (ulong)(uint)((int)(uVar126 * 5) << 2);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar126 * 2 + uVar128 + 6);
  auVar176 = vpmovsxwd_avx(auVar21);
  auVar176 = vcvtdq2ps_avx(auVar176);
  auVar176 = vsubps_avx(auVar176,auVar327);
  auVar278._0_4_ = auVar176._0_4_ * fVar298 + auVar327._0_4_;
  auVar278._4_4_ = auVar176._4_4_ * fVar181 + auVar327._4_4_;
  auVar278._8_4_ = auVar176._8_4_ * fVar301 + auVar327._8_4_;
  auVar278._12_4_ = auVar176._12_4_ * fVar197 + auVar327._12_4_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar128 + 6);
  auVar327 = vpmovsxwd_avx(auVar22);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar126 * 0x18 + 6);
  auVar176 = vpmovsxwd_avx(auVar23);
  auVar327 = vcvtdq2ps_avx(auVar327);
  auVar176 = vcvtdq2ps_avx(auVar176);
  auVar176 = vsubps_avx(auVar176,auVar327);
  auVar291._0_4_ = auVar176._0_4_ * fVar298 + auVar327._0_4_;
  auVar291._4_4_ = auVar176._4_4_ * fVar181 + auVar327._4_4_;
  auVar291._8_4_ = auVar176._8_4_ * fVar301 + auVar327._8_4_;
  auVar291._12_4_ = auVar176._12_4_ * fVar197 + auVar327._12_4_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar126 * 0x1d + 6);
  auVar327 = vpmovsxwd_avx(auVar24);
  auVar327 = vcvtdq2ps_avx(auVar327);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar126 + (ulong)(byte)PVar14 * 0x20 + 6);
  auVar176 = vpmovsxwd_avx(auVar25);
  auVar176 = vcvtdq2ps_avx(auVar176);
  auVar207 = vsubps_avx(auVar176,auVar327);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar14 * 0x20 - uVar126) + 6);
  auVar176 = vpmovsxwd_avx(auVar26);
  auVar299._0_4_ = auVar207._0_4_ * fVar298 + auVar327._0_4_;
  auVar299._4_4_ = auVar207._4_4_ * fVar181 + auVar327._4_4_;
  auVar299._8_4_ = auVar207._8_4_ * fVar301 + auVar327._8_4_;
  auVar299._12_4_ = auVar207._12_4_ * fVar197 + auVar327._12_4_;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar126 * 0x23 + 6);
  auVar207 = vpmovsxwd_avx(auVar27);
  auVar327 = vcvtdq2ps_avx(auVar176);
  auVar176 = vcvtdq2ps_avx(auVar207);
  auVar176 = vsubps_avx(auVar176,auVar327);
  auVar240._0_4_ = auVar327._0_4_ + auVar176._0_4_ * fVar298;
  auVar240._4_4_ = auVar327._4_4_ + auVar176._4_4_ * fVar181;
  auVar240._8_4_ = auVar327._8_4_ + auVar176._8_4_ * fVar301;
  auVar240._12_4_ = auVar327._12_4_ + auVar176._12_4_ * fVar197;
  auVar327 = vsubps_avx(auVar252,auVar173);
  auVar253._0_4_ = fVar183 * auVar327._0_4_;
  auVar253._4_4_ = fVar193 * auVar327._4_4_;
  auVar253._8_4_ = fVar194 * auVar327._8_4_;
  auVar253._12_4_ = fVar196 * auVar327._12_4_;
  auVar327 = vsubps_avx(auVar266,auVar173);
  auVar174._0_4_ = fVar183 * auVar327._0_4_;
  auVar174._4_4_ = fVar193 * auVar327._4_4_;
  auVar174._8_4_ = fVar194 * auVar327._8_4_;
  auVar174._12_4_ = fVar196 * auVar327._12_4_;
  auVar327 = vsubps_avx(auVar278,auVar153);
  auVar185._0_4_ = fVar200 * auVar327._0_4_;
  auVar185._4_4_ = fVar213 * auVar327._4_4_;
  auVar185._8_4_ = fVar216 * auVar327._8_4_;
  auVar185._12_4_ = fVar218 * auVar327._12_4_;
  auVar327 = vsubps_avx(auVar291,auVar153);
  auVar154._0_4_ = fVar200 * auVar327._0_4_;
  auVar154._4_4_ = fVar213 * auVar327._4_4_;
  auVar154._8_4_ = fVar216 * auVar327._8_4_;
  auVar154._12_4_ = fVar218 * auVar327._12_4_;
  auVar327 = vsubps_avx(auVar299,auVar133);
  auVar205._0_4_ = fVar224 * auVar327._0_4_;
  auVar205._4_4_ = fVar232 * auVar327._4_4_;
  auVar205._8_4_ = fVar233 * auVar327._8_4_;
  auVar205._12_4_ = fVar234 * auVar327._12_4_;
  auVar327 = vsubps_avx(auVar240,auVar133);
  auVar134._0_4_ = fVar224 * auVar327._0_4_;
  auVar134._4_4_ = fVar232 * auVar327._4_4_;
  auVar134._8_4_ = fVar233 * auVar327._8_4_;
  auVar134._12_4_ = fVar234 * auVar327._12_4_;
  auVar327 = vpminsd_avx(auVar253,auVar174);
  auVar176 = vpminsd_avx(auVar185,auVar154);
  auVar327 = vmaxps_avx(auVar327,auVar176);
  auVar176 = vpminsd_avx(auVar205,auVar134);
  uVar12 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar267._4_4_ = uVar12;
  auVar267._0_4_ = uVar12;
  auVar267._8_4_ = uVar12;
  auVar267._12_4_ = uVar12;
  auVar176 = vmaxps_avx(auVar176,auVar267);
  auVar327 = vmaxps_avx(auVar327,auVar176);
  local_2f0._0_4_ = auVar327._0_4_ * 0.99999964;
  local_2f0._4_4_ = auVar327._4_4_ * 0.99999964;
  local_2f0._8_4_ = auVar327._8_4_ * 0.99999964;
  local_2f0._12_4_ = auVar327._12_4_ * 0.99999964;
  auVar327 = vpmaxsd_avx(auVar253,auVar174);
  auVar176 = vpmaxsd_avx(auVar185,auVar154);
  auVar327 = vminps_avx(auVar327,auVar176);
  auVar176 = vpmaxsd_avx(auVar205,auVar134);
  fVar298 = ray->tfar;
  auVar175._4_4_ = fVar298;
  auVar175._0_4_ = fVar298;
  auVar175._8_4_ = fVar298;
  auVar175._12_4_ = fVar298;
  auVar176 = vminps_avx(auVar176,auVar175);
  auVar327 = vminps_avx(auVar327,auVar176);
  auVar135._0_4_ = auVar327._0_4_ * 1.0000004;
  auVar135._4_4_ = auVar327._4_4_ * 1.0000004;
  auVar135._8_4_ = auVar327._8_4_ * 1.0000004;
  auVar135._12_4_ = auVar327._12_4_ * 1.0000004;
  auVar327 = vpshufd_avx(ZEXT116((byte)PVar14),0);
  auVar176 = vpcmpgtd_avx(auVar327,_DAT_01ff0cf0);
  auVar327 = vcmpps_avx(local_2f0,auVar135,2);
  auVar327 = vandps_avx(auVar327,auVar176);
  uVar123 = vmovmskps_avx(auVar327);
  local_7f9 = uVar123 != 0;
  if (local_7f9) {
    uVar123 = uVar123 & 0xff;
    local_4a0 = mm_lookupmask_ps._16_8_;
    uStack_498 = mm_lookupmask_ps._24_8_;
    uStack_490 = mm_lookupmask_ps._16_8_;
    uStack_488 = mm_lookupmask_ps._24_8_;
    local_788 = pre;
    do {
      lVar19 = 0;
      if (uVar123 != 0) {
        for (; (uVar123 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
        }
      }
      local_790 = (ulong)*(uint *)(prim + 2);
      local_628 = (ulong)*(uint *)(prim + lVar19 * 4 + 6);
      pGVar15 = (context->scene->geometries).items[local_790].ptr;
      uVar126 = (ulong)*(uint *)(*(long *)&pGVar15->field_0x58 +
                                local_628 *
                                pGVar15[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i);
      fVar298 = (pGVar15->time_range).lower;
      fVar298 = pGVar15->fnumTimeSegments *
                (((ray->dir).field_0.m128[3] - fVar298) / ((pGVar15->time_range).upper - fVar298));
      auVar327 = vroundss_avx(ZEXT416((uint)fVar298),ZEXT416((uint)fVar298),9);
      auVar327 = vminss_avx(auVar327,ZEXT416((uint)(pGVar15->fnumTimeSegments + -1.0)));
      auVar327 = vmaxss_avx(ZEXT816(0) << 0x20,auVar327);
      fVar298 = fVar298 - auVar327._0_4_;
      _Var16 = pGVar15[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar129 = (long)(int)auVar327._0_4_ * 0x38;
      lVar130 = *(long *)(_Var16 + 0x10 + lVar129);
      lVar17 = *(long *)(_Var16 + 0x38 + lVar129);
      lVar18 = *(long *)(_Var16 + 0x48 + lVar129);
      auVar327 = vshufps_avx(ZEXT416((uint)fVar298),ZEXT416((uint)fVar298),0);
      pfVar1 = (float *)(lVar17 + lVar18 * uVar126);
      fVar181 = auVar327._0_4_;
      fVar301 = auVar327._4_4_;
      fVar197 = auVar327._8_4_;
      fVar183 = auVar327._12_4_;
      lVar19 = uVar126 + 1;
      pfVar2 = (float *)(lVar17 + lVar18 * lVar19);
      p_Var131 = pGVar15[4].occlusionFilterN;
      auVar327 = vshufps_avx(ZEXT416((uint)(1.0 - fVar298)),ZEXT416((uint)(1.0 - fVar298)),0);
      pfVar3 = (float *)(*(long *)(_Var16 + lVar129) + lVar130 * uVar126);
      fVar298 = auVar327._0_4_;
      fVar193 = auVar327._4_4_;
      fVar194 = auVar327._8_4_;
      fVar196 = auVar327._12_4_;
      pfVar4 = (float *)(*(long *)(_Var16 + lVar129) + lVar130 * lVar19);
      pfVar5 = (float *)(*(long *)(p_Var131 + lVar129 + 0x38) +
                        uVar126 * *(long *)(p_Var131 + lVar129 + 0x48));
      pfVar6 = (float *)(*(long *)(p_Var131 + lVar129 + 0x38) +
                        *(long *)(p_Var131 + lVar129 + 0x48) * lVar19);
      pfVar7 = (float *)(*(long *)(p_Var131 + lVar129) +
                        *(long *)(p_Var131 + lVar129 + 0x10) * uVar126);
      pfVar8 = (float *)(*(long *)(p_Var131 + lVar129) +
                        *(long *)(p_Var131 + lVar129 + 0x10) * lVar19);
      uVar127 = (uint)pGVar15[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar19 = (long)(int)uVar127 * 0x44;
      fVar200 = fVar298 * *pfVar3 + fVar181 * *pfVar1;
      fVar213 = fVar193 * pfVar3[1] + fVar301 * pfVar1[1];
      local_670 = (undefined1  [8])CONCAT44(fVar213,fVar200);
      uStack_668._0_4_ = fVar194 * pfVar3[2] + fVar197 * pfVar1[2];
      uStack_668._4_4_ = fVar196 * pfVar3[3] + fVar183 * pfVar1[3];
      local_3d0._0_8_ =
           CONCAT44(fVar193 * pfVar4[1] + fVar301 * pfVar2[1],fVar298 * *pfVar4 + fVar181 * *pfVar2)
      ;
      local_3d0._8_4_ = fVar194 * pfVar4[2] + fVar197 * pfVar2[2];
      local_3d0._12_4_ = fVar196 * pfVar4[3] + fVar183 * pfVar2[3];
      local_4b0._0_8_ =
           CONCAT44(fVar213 + (fVar193 * pfVar7[1] + fVar301 * pfVar5[1]) * 0.33333334,
                    fVar200 + (fVar298 * *pfVar7 + fVar181 * *pfVar5) * 0.33333334);
      local_4b0._8_4_ = (float)uStack_668 + (fVar194 * pfVar7[2] + fVar197 * pfVar5[2]) * 0.33333334
      ;
      local_4b0._12_4_ = uStack_668._4_4_ + (fVar196 * pfVar7[3] + fVar183 * pfVar5[3]) * 0.33333334
      ;
      auVar136._0_4_ = (fVar298 * *pfVar8 + fVar181 * *pfVar6) * 0.33333334;
      auVar136._4_4_ = (fVar193 * pfVar8[1] + fVar301 * pfVar6[1]) * 0.33333334;
      auVar136._8_4_ = (fVar194 * pfVar8[2] + fVar197 * pfVar6[2]) * 0.33333334;
      auVar136._12_4_ = (fVar196 * pfVar8[3] + fVar183 * pfVar6[3]) * 0.33333334;
      local_3e0 = vsubps_avx(local_3d0,auVar136);
      aVar13 = (ray->org).field_0;
      auVar207 = vsubps_avx(_local_670,(undefined1  [16])aVar13);
      auVar327 = vshufps_avx(auVar207,auVar207,0);
      auVar176 = vshufps_avx(auVar207,auVar207,0x55);
      auVar207 = vshufps_avx(auVar207,auVar207,0xaa);
      fVar298 = (local_788->ray_space).vx.field_0.m128[0];
      fVar181 = (local_788->ray_space).vx.field_0.m128[1];
      fVar301 = (local_788->ray_space).vx.field_0.m128[2];
      fVar197 = (local_788->ray_space).vx.field_0.m128[3];
      fVar183 = (local_788->ray_space).vy.field_0.m128[0];
      fVar193 = (local_788->ray_space).vy.field_0.m128[1];
      fVar194 = (local_788->ray_space).vy.field_0.m128[2];
      fVar196 = (local_788->ray_space).vy.field_0.m128[3];
      fVar200 = (local_788->ray_space).vz.field_0.m128[0];
      fVar213 = (local_788->ray_space).vz.field_0.m128[1];
      fVar216 = (local_788->ray_space).vz.field_0.m128[2];
      fVar218 = (local_788->ray_space).vz.field_0.m128[3];
      auVar186._0_8_ =
           CONCAT44(auVar327._4_4_ * fVar181 + auVar207._4_4_ * fVar213 + auVar176._4_4_ * fVar193,
                    auVar327._0_4_ * fVar298 + auVar207._0_4_ * fVar200 + auVar176._0_4_ * fVar183);
      auVar186._8_4_ =
           auVar327._8_4_ * fVar301 + auVar207._8_4_ * fVar216 + auVar176._8_4_ * fVar194;
      auVar186._12_4_ =
           auVar327._12_4_ * fVar197 + auVar207._12_4_ * fVar218 + auVar176._12_4_ * fVar196;
      auVar327 = vblendps_avx(auVar186,_local_670,8);
      auVar187 = vsubps_avx(local_4b0,(undefined1  [16])aVar13);
      auVar176 = vshufps_avx(auVar187,auVar187,0);
      auVar207 = vshufps_avx(auVar187,auVar187,0x55);
      auVar187 = vshufps_avx(auVar187,auVar187,0xaa);
      auVar254._0_4_ =
           auVar176._0_4_ * fVar298 + auVar207._0_4_ * fVar183 + fVar200 * auVar187._0_4_;
      auVar254._4_4_ =
           auVar176._4_4_ * fVar181 + auVar207._4_4_ * fVar193 + fVar213 * auVar187._4_4_;
      auVar254._8_4_ =
           auVar176._8_4_ * fVar301 + auVar207._8_4_ * fVar194 + fVar216 * auVar187._8_4_;
      auVar254._12_4_ =
           auVar176._12_4_ * fVar197 + auVar207._12_4_ * fVar196 + fVar218 * auVar187._12_4_;
      auVar176 = vblendps_avx(auVar254,local_4b0,8);
      auVar20 = vsubps_avx(local_3e0,(undefined1  [16])aVar13);
      auVar207 = vshufps_avx(auVar20,auVar20,0);
      auVar187 = vshufps_avx(auVar20,auVar20,0x55);
      auVar20 = vshufps_avx(auVar20,auVar20,0xaa);
      auVar268._0_4_ = auVar207._0_4_ * fVar298 + auVar187._0_4_ * fVar183 + auVar20._0_4_ * fVar200
      ;
      auVar268._4_4_ = auVar207._4_4_ * fVar181 + auVar187._4_4_ * fVar193 + auVar20._4_4_ * fVar213
      ;
      auVar268._8_4_ = auVar207._8_4_ * fVar301 + auVar187._8_4_ * fVar194 + auVar20._8_4_ * fVar216
      ;
      auVar268._12_4_ =
           auVar207._12_4_ * fVar197 + auVar187._12_4_ * fVar196 + auVar20._12_4_ * fVar218;
      auVar207 = vblendps_avx(auVar268,local_3e0,8);
      auVar21 = vsubps_avx(local_3d0,(undefined1  [16])aVar13);
      auVar187 = vshufps_avx(auVar21,auVar21,0);
      auVar20 = vshufps_avx(auVar21,auVar21,0x55);
      auVar21 = vshufps_avx(auVar21,auVar21,0xaa);
      auVar155._0_4_ = auVar187._0_4_ * fVar298 + auVar21._0_4_ * fVar200 + auVar20._0_4_ * fVar183;
      auVar155._4_4_ = auVar187._4_4_ * fVar181 + auVar21._4_4_ * fVar213 + auVar20._4_4_ * fVar193;
      auVar155._8_4_ = auVar187._8_4_ * fVar301 + auVar21._8_4_ * fVar216 + auVar20._8_4_ * fVar194;
      auVar155._12_4_ =
           auVar187._12_4_ * fVar197 + auVar21._12_4_ * fVar218 + auVar20._12_4_ * fVar196;
      auVar187 = vblendps_avx(auVar155,local_3d0,8);
      auVar206._8_4_ = 0x7fffffff;
      auVar206._0_8_ = 0x7fffffff7fffffff;
      auVar206._12_4_ = 0x7fffffff;
      auVar327 = vandps_avx(auVar327,auVar206);
      auVar176 = vandps_avx(auVar176,auVar206);
      auVar20 = vmaxps_avx(auVar327,auVar176);
      auVar327 = vandps_avx(auVar207,auVar206);
      auVar176 = vandps_avx(auVar187,auVar206);
      auVar327 = vmaxps_avx(auVar327,auVar176);
      auVar327 = vmaxps_avx(auVar20,auVar327);
      auVar176 = vmovshdup_avx(auVar327);
      auVar176 = vmaxss_avx(auVar176,auVar327);
      auVar327 = vshufpd_avx(auVar327,auVar327,1);
      auVar327 = vmaxss_avx(auVar327,auVar176);
      fVar298 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar19 + 0x908);
      fVar181 = *(float *)(bezier_basis0 + lVar19 + 0x90c);
      fVar301 = *(float *)(bezier_basis0 + lVar19 + 0x910);
      fVar197 = *(float *)(bezier_basis0 + lVar19 + 0x914);
      fVar183 = *(float *)(bezier_basis0 + lVar19 + 0x918);
      fVar193 = *(float *)(bezier_basis0 + lVar19 + 0x91c);
      fVar194 = *(float *)(bezier_basis0 + lVar19 + 0x920);
      auVar119 = *(undefined1 (*) [28])(bezier_basis0 + lVar19 + 0x908);
      local_760._0_16_ = auVar268;
      auVar176 = vshufps_avx(auVar268,auVar268,0);
      register0x00001250 = auVar176;
      _local_580 = auVar176;
      auVar207 = vshufps_avx(auVar268,auVar268,0x55);
      register0x00001310 = auVar207;
      _local_5a0 = auVar207;
      fVar196 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar19 + 0xd8c);
      fVar200 = *(float *)(bezier_basis0 + lVar19 + 0xd90);
      fVar213 = *(float *)(bezier_basis0 + lVar19 + 0xd94);
      fVar216 = *(float *)(bezier_basis0 + lVar19 + 0xd98);
      fVar218 = *(float *)(bezier_basis0 + lVar19 + 0xd9c);
      fVar224 = *(float *)(bezier_basis0 + lVar19 + 0xda0);
      fVar232 = *(float *)(bezier_basis0 + lVar19 + 0xda4);
      auVar118 = *(undefined1 (*) [28])(bezier_basis0 + lVar19 + 0xd8c);
      auVar187 = vshufps_avx(auVar155,auVar155,0);
      register0x00001550 = auVar187;
      _local_3a0 = auVar187;
      fVar277 = auVar187._0_4_;
      fVar285 = auVar187._4_4_;
      fVar286 = auVar187._8_4_;
      fVar287 = auVar187._12_4_;
      fVar151 = auVar176._0_4_;
      fVar164 = auVar176._4_4_;
      fVar237 = auVar176._8_4_;
      fVar167 = auVar176._12_4_;
      auVar176 = vshufps_avx(auVar155,auVar155,0x55);
      register0x00001250 = auVar176;
      _local_600 = auVar176;
      fVar152 = auVar176._0_4_;
      fVar165 = auVar176._4_4_;
      fVar166 = auVar176._8_4_;
      fVar168 = auVar176._12_4_;
      fVar201 = auVar207._0_4_;
      fVar214 = auVar207._4_4_;
      fVar222 = auVar207._8_4_;
      fVar219 = auVar207._12_4_;
      auVar176 = vshufps_avx(local_3e0,local_3e0,0xff);
      register0x00001390 = auVar176;
      _local_140 = auVar176;
      auVar207 = vshufps_avx(local_3d0,local_3d0,0xff);
      register0x00001590 = auVar207;
      _local_80 = auVar207;
      fVar288 = auVar207._0_4_;
      fVar289 = auVar207._4_4_;
      fVar290 = auVar207._8_4_;
      fVar319 = auVar207._12_4_;
      fVar203 = auVar176._0_4_;
      fVar215 = auVar176._4_4_;
      fVar217 = auVar176._8_4_;
      auVar207 = vshufps_avx(auVar254,auVar254,0);
      register0x00001510 = auVar207;
      _local_700 = auVar207;
      pauVar10 = (undefined1 (*) [32])(bezier_basis0 + lVar19 + 0x484);
      fVar233 = *(float *)*pauVar10;
      fVar234 = *(float *)(bezier_basis0 + lVar19 + 0x488);
      fVar294 = *(float *)(bezier_basis0 + lVar19 + 0x48c);
      fVar170 = *(float *)(bezier_basis0 + lVar19 + 0x490);
      fVar297 = *(float *)(bezier_basis0 + lVar19 + 0x494);
      fVar223 = *(float *)(bezier_basis0 + lVar19 + 0x498);
      fVar295 = *(float *)(bezier_basis0 + lVar19 + 0x49c);
      auVar120 = *(undefined1 (*) [28])*pauVar10;
      fVar302 = *(float *)(bezier_basis0 + lVar19 + 0x4a0);
      _auStack_510 = SUB3216(*pauVar10,0x10);
      fVar273 = auVar207._0_4_;
      fVar274 = auVar207._4_4_;
      fVar275 = auVar207._8_4_;
      fVar276 = auVar207._12_4_;
      auVar207 = vshufps_avx(auVar254,auVar254,0x55);
      register0x000014d0 = auVar207;
      _local_480 = auVar207;
      fVar261 = auVar207._0_4_;
      fVar262 = auVar207._4_4_;
      fVar263 = auVar207._8_4_;
      fVar264 = auVar207._12_4_;
      auVar187 = vpermilps_avx(local_4b0,0xff);
      register0x00001410 = auVar187;
      _local_160 = auVar187;
      fVar221 = auVar187._0_4_;
      fVar265 = auVar187._4_4_;
      fVar272 = auVar187._8_4_;
      auVar111._8_4_ = auVar186._8_4_;
      auVar111._0_8_ = auVar186._0_8_;
      auVar111._12_4_ = auVar186._12_4_;
      auVar207 = vshufps_avx(auVar111,auVar111,0);
      register0x00001310 = auVar207;
      _local_340 = auVar207;
      fVar304 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar19);
      fVar198 = *(float *)(bezier_basis0 + lVar19 + 4);
      fVar296 = *(float *)(bezier_basis0 + lVar19 + 8);
      fVar308 = *(float *)(bezier_basis0 + lVar19 + 0xc);
      fVar303 = *(float *)(bezier_basis0 + lVar19 + 0x10);
      fVar199 = *(float *)(bezier_basis0 + lVar19 + 0x14);
      fVar305 = *(float *)(bezier_basis0 + lVar19 + 0x18);
      auVar121 = *(undefined1 (*) [28])(bezier_basis0 + lVar19);
      fVar202 = auVar207._0_4_;
      fVar182 = auVar207._4_4_;
      fVar246 = auVar207._8_4_;
      fVar220 = auVar207._12_4_;
      auVar324._0_4_ = fVar202 * fVar304 + fVar273 * fVar233 + fVar151 * fVar298 + fVar277 * fVar196
      ;
      auVar324._4_4_ = fVar182 * fVar198 + fVar274 * fVar234 + fVar164 * fVar181 + fVar285 * fVar200
      ;
      auVar324._8_4_ = fVar246 * fVar296 + fVar275 * fVar294 + fVar237 * fVar301 + fVar286 * fVar213
      ;
      auVar324._12_4_ =
           fVar220 * fVar308 + fVar276 * fVar170 + fVar167 * fVar197 + fVar287 * fVar216;
      auVar324._16_4_ =
           fVar202 * fVar303 + fVar273 * fVar297 + fVar151 * fVar183 + fVar277 * fVar218;
      auVar324._20_4_ =
           fVar182 * fVar199 + fVar274 * fVar223 + fVar164 * fVar193 + fVar285 * fVar224;
      auVar324._24_4_ =
           fVar246 * fVar305 + fVar275 * fVar295 + fVar237 * fVar194 + fVar286 * fVar232;
      auVar324._28_4_ = fVar302 + fVar167 + 0.0 + 0.0;
      auVar207 = vshufps_avx(auVar111,auVar111,0x55);
      register0x000013d0 = auVar207;
      _local_400 = auVar207;
      fVar247 = auVar207._0_4_;
      fVar256 = auVar207._4_4_;
      fVar258 = auVar207._8_4_;
      fVar260 = auVar207._12_4_;
      auVar279._0_4_ = fVar247 * fVar304 + fVar261 * fVar233 + fVar201 * fVar298 + fVar152 * fVar196
      ;
      auVar279._4_4_ = fVar256 * fVar198 + fVar262 * fVar234 + fVar214 * fVar181 + fVar165 * fVar200
      ;
      auVar279._8_4_ = fVar258 * fVar296 + fVar263 * fVar294 + fVar222 * fVar301 + fVar166 * fVar213
      ;
      auVar279._12_4_ =
           fVar260 * fVar308 + fVar264 * fVar170 + fVar219 * fVar197 + fVar168 * fVar216;
      auVar279._16_4_ =
           fVar247 * fVar303 + fVar261 * fVar297 + fVar201 * fVar183 + fVar152 * fVar218;
      auVar279._20_4_ =
           fVar256 * fVar199 + fVar262 * fVar223 + fVar214 * fVar193 + fVar165 * fVar224;
      auVar279._24_4_ =
           fVar258 * fVar305 + fVar263 * fVar295 + fVar222 * fVar194 + fVar166 * fVar232;
      auVar279._28_4_ = fVar168 + 0.0 + 0.0 + 0.0;
      auVar207 = vpermilps_avx(_local_670,0xff);
      register0x00001490 = auVar207;
      _local_a0 = auVar207;
      fVar248 = auVar207._0_4_;
      fVar257 = auVar207._4_4_;
      fVar259 = auVar207._8_4_;
      local_7e0 = (undefined1  [4])
                  (fVar248 * fVar304 + fVar221 * fVar233 + fVar203 * fVar298 + fVar288 * fVar196);
      auStack_7dc._0_4_ =
           fVar257 * fVar198 + fVar265 * fVar234 + fVar215 * fVar181 + fVar289 * fVar200;
      auStack_7dc._4_4_ =
           fVar259 * fVar296 + fVar272 * fVar294 + fVar217 * fVar301 + fVar290 * fVar213;
      fStack_7d4 = auVar207._12_4_ * fVar308 +
                   auVar187._12_4_ * fVar170 + auVar176._12_4_ * fVar197 + fVar319 * fVar216;
      fStack_7d0 = fVar248 * fVar303 + fVar221 * fVar297 + fVar203 * fVar183 + fVar288 * fVar218;
      fStack_7cc = fVar257 * fVar199 + fVar265 * fVar223 + fVar215 * fVar193 + fVar289 * fVar224;
      fStack_7c8 = fVar259 * fVar305 + fVar272 * fVar295 + fVar217 * fVar194 + fVar290 * fVar232;
      fStack_7c4 = *(float *)(bezier_basis0 + lVar19 + 0x924) + 0.0 + 0.0 + 0.0;
      fVar233 = *(float *)(bezier_basis1 + lVar19 + 0x908);
      fVar234 = *(float *)(bezier_basis1 + lVar19 + 0x90c);
      fVar294 = *(float *)(bezier_basis1 + lVar19 + 0x910);
      fVar170 = *(float *)(bezier_basis1 + lVar19 + 0x914);
      fVar297 = *(float *)(bezier_basis1 + lVar19 + 0x918);
      fVar223 = *(float *)(bezier_basis1 + lVar19 + 0x91c);
      fVar295 = *(float *)(bezier_basis1 + lVar19 + 0x920);
      fVar304 = *(float *)(bezier_basis1 + lVar19 + 0xd8c);
      fVar198 = *(float *)(bezier_basis1 + lVar19 + 0xd90);
      fVar296 = *(float *)(bezier_basis1 + lVar19 + 0xd94);
      fVar308 = *(float *)(bezier_basis1 + lVar19 + 0xd98);
      fVar303 = *(float *)(bezier_basis1 + lVar19 + 0xd9c);
      fVar199 = *(float *)(bezier_basis1 + lVar19 + 0xda0);
      fVar305 = *(float *)(bezier_basis1 + lVar19 + 0xda4);
      fVar235 = *(float *)(bezier_basis1 + lVar19 + 0x484);
      fVar306 = *(float *)(bezier_basis1 + lVar19 + 0x488);
      fVar148 = *(float *)(bezier_basis1 + lVar19 + 0x48c);
      fVar307 = *(float *)(bezier_basis1 + lVar19 + 0x490);
      fVar132 = *(float *)(bezier_basis1 + lVar19 + 0x494);
      fVar146 = *(float *)(bezier_basis1 + lVar19 + 0x498);
      fVar236 = *(float *)(bezier_basis1 + lVar19 + 0x49c);
      fVar181 = fVar287 + fVar302 + 0.0;
      fVar309 = *(float *)(bezier_basis1 + lVar19);
      fVar147 = *(float *)(bezier_basis1 + lVar19 + 4);
      fVar149 = *(float *)(bezier_basis1 + lVar19 + 8);
      fVar150 = *(float *)(bezier_basis1 + lVar19 + 0xc);
      fVar169 = *(float *)(bezier_basis1 + lVar19 + 0x10);
      fVar171 = *(float *)(bezier_basis1 + lVar19 + 0x14);
      fVar195 = *(float *)(bezier_basis1 + lVar19 + 0x18);
      auVar208._0_4_ = fVar202 * fVar309 + fVar273 * fVar235 + fVar233 * fVar151 + fVar277 * fVar304
      ;
      auVar208._4_4_ = fVar182 * fVar147 + fVar274 * fVar306 + fVar234 * fVar164 + fVar285 * fVar198
      ;
      auVar208._8_4_ = fVar246 * fVar149 + fVar275 * fVar148 + fVar294 * fVar237 + fVar286 * fVar296
      ;
      auVar208._12_4_ =
           fVar220 * fVar150 + fVar276 * fVar307 + fVar170 * fVar167 + fVar287 * fVar308;
      auVar208._16_4_ =
           fVar202 * fVar169 + fVar273 * fVar132 + fVar297 * fVar151 + fVar277 * fVar303;
      auVar208._20_4_ =
           fVar182 * fVar171 + fVar274 * fVar146 + fVar223 * fVar164 + fVar285 * fVar199;
      auVar208._24_4_ =
           fVar246 * fVar195 + fVar275 * fVar236 + fVar295 * fVar237 + fVar286 * fVar305;
      auVar208._28_4_ = fVar319 + fVar181;
      auVar188._0_4_ = fVar247 * fVar309 + fVar261 * fVar235 + fVar201 * fVar233 + fVar304 * fVar152
      ;
      auVar188._4_4_ = fVar256 * fVar147 + fVar262 * fVar306 + fVar214 * fVar234 + fVar198 * fVar165
      ;
      auVar188._8_4_ = fVar258 * fVar149 + fVar263 * fVar148 + fVar222 * fVar294 + fVar296 * fVar166
      ;
      auVar188._12_4_ =
           fVar260 * fVar150 + fVar264 * fVar307 + fVar219 * fVar170 + fVar308 * fVar168;
      auVar188._16_4_ =
           fVar247 * fVar169 + fVar261 * fVar132 + fVar201 * fVar297 + fVar303 * fVar152;
      auVar188._20_4_ =
           fVar256 * fVar171 + fVar262 * fVar146 + fVar214 * fVar223 + fVar199 * fVar165;
      auVar188._24_4_ =
           fVar258 * fVar195 + fVar263 * fVar236 + fVar222 * fVar295 + fVar305 * fVar166;
      auVar188._28_4_ = fVar181 + fVar287 + fVar302 + 0.0;
      local_6a0._0_4_ =
           fVar221 * fVar235 + fVar233 * fVar203 + fVar288 * fVar304 + fVar248 * fVar309;
      local_6a0._4_4_ =
           fVar265 * fVar306 + fVar234 * fVar215 + fVar289 * fVar198 + fVar257 * fVar147;
      local_6a0._8_4_ =
           fVar272 * fVar148 + fVar294 * fVar217 + fVar290 * fVar296 + fVar259 * fVar149;
      local_6a0._12_4_ =
           auVar187._12_4_ * fVar307 + fVar170 * auVar176._12_4_ + fVar319 * fVar308 +
           auVar207._12_4_ * fVar150;
      local_6a0._16_4_ =
           fVar221 * fVar132 + fVar297 * fVar203 + fVar288 * fVar303 + fVar248 * fVar169;
      local_6a0._20_4_ =
           fVar265 * fVar146 + fVar223 * fVar215 + fVar289 * fVar199 + fVar257 * fVar171;
      local_6a0._24_4_ =
           fVar272 * fVar236 + fVar295 * fVar217 + fVar290 * fVar305 + fVar259 * fVar195;
      local_6a0._28_4_ = fVar287 + fVar219 + fVar302 + fVar181;
      auVar28 = vsubps_avx(auVar208,auVar324);
      auVar29 = vsubps_avx(auVar188,auVar279);
      fVar298 = auVar28._0_4_;
      fVar301 = auVar28._4_4_;
      auVar162._4_4_ = auVar279._4_4_ * fVar301;
      auVar162._0_4_ = auVar279._0_4_ * fVar298;
      fVar183 = auVar28._8_4_;
      auVar162._8_4_ = auVar279._8_4_ * fVar183;
      fVar194 = auVar28._12_4_;
      auVar162._12_4_ = auVar279._12_4_ * fVar194;
      fVar200 = auVar28._16_4_;
      auVar162._16_4_ = auVar279._16_4_ * fVar200;
      fVar216 = auVar28._20_4_;
      auVar162._20_4_ = auVar279._20_4_ * fVar216;
      fVar224 = auVar28._24_4_;
      auVar162._24_4_ = auVar279._24_4_ * fVar224;
      auVar162._28_4_ = fVar181;
      fVar181 = auVar29._0_4_;
      fVar197 = auVar29._4_4_;
      auVar30._4_4_ = auVar324._4_4_ * fVar197;
      auVar30._0_4_ = auVar324._0_4_ * fVar181;
      fVar193 = auVar29._8_4_;
      auVar30._8_4_ = auVar324._8_4_ * fVar193;
      fVar196 = auVar29._12_4_;
      auVar30._12_4_ = auVar324._12_4_ * fVar196;
      fVar213 = auVar29._16_4_;
      auVar30._16_4_ = auVar324._16_4_ * fVar213;
      fVar218 = auVar29._20_4_;
      auVar30._20_4_ = auVar324._20_4_ * fVar218;
      fVar232 = auVar29._24_4_;
      auVar30._24_4_ = auVar324._24_4_ * fVar232;
      auVar30._28_4_ = auVar188._28_4_;
      auVar30 = vsubps_avx(auVar162,auVar30);
      auVar162 = vmaxps_avx(_local_7e0,local_6a0._0_32_);
      auVar37._4_4_ = auVar162._4_4_ * auVar162._4_4_ * (fVar301 * fVar301 + fVar197 * fVar197);
      auVar37._0_4_ = auVar162._0_4_ * auVar162._0_4_ * (fVar298 * fVar298 + fVar181 * fVar181);
      auVar37._8_4_ = auVar162._8_4_ * auVar162._8_4_ * (fVar183 * fVar183 + fVar193 * fVar193);
      auVar37._12_4_ = auVar162._12_4_ * auVar162._12_4_ * (fVar194 * fVar194 + fVar196 * fVar196);
      auVar37._16_4_ = auVar162._16_4_ * auVar162._16_4_ * (fVar200 * fVar200 + fVar213 * fVar213);
      auVar37._20_4_ = auVar162._20_4_ * auVar162._20_4_ * (fVar216 * fVar216 + fVar218 * fVar218);
      auVar37._24_4_ = auVar162._24_4_ * auVar162._24_4_ * (fVar224 * fVar224 + fVar232 * fVar232);
      auVar37._28_4_ = auVar208._28_4_ + auVar188._28_4_;
      auVar31._4_4_ = auVar30._4_4_ * auVar30._4_4_;
      auVar31._0_4_ = auVar30._0_4_ * auVar30._0_4_;
      auVar31._8_4_ = auVar30._8_4_ * auVar30._8_4_;
      auVar31._12_4_ = auVar30._12_4_ * auVar30._12_4_;
      auVar31._16_4_ = auVar30._16_4_ * auVar30._16_4_;
      auVar31._20_4_ = auVar30._20_4_ * auVar30._20_4_;
      auVar31._24_4_ = auVar30._24_4_ * auVar30._24_4_;
      auVar31._28_4_ = auVar30._28_4_;
      auVar162 = vcmpps_avx(auVar31,auVar37,2);
      local_3c0 = (float)(int)uVar127;
      fStack_3bc = 0.0;
      fStack_3b8 = 0.0;
      fStack_3b4 = 0.0;
      auVar176 = vshufps_avx(ZEXT416((uint)local_3c0),ZEXT416((uint)local_3c0),0);
      auVar189._16_16_ = auVar176;
      auVar189._0_16_ = auVar176;
      auVar30 = vcmpps_avx(_DAT_02020f40,auVar189,1);
      auVar112._8_4_ = auVar186._8_4_;
      auVar112._0_8_ = auVar186._0_8_;
      auVar112._12_4_ = auVar186._12_4_;
      auVar176 = vpermilps_avx(auVar112,0xaa);
      auVar269._16_16_ = auVar176;
      auVar269._0_16_ = auVar176;
      auVar207 = vpermilps_avx(auVar254,0xaa);
      register0x00001550 = auVar207;
      _local_320 = auVar207;
      auVar187 = vpermilps_avx(auVar268,0xaa);
      register0x00001590 = auVar187;
      _local_c0 = auVar187;
      auVar20 = vpermilps_avx(auVar155,0xaa);
      register0x00001310 = auVar20;
      _local_540 = auVar20;
      auVar37 = auVar30 & auVar162;
      local_7c0 = *(uint *)((long)&(ray->org).field_0 + 0xc);
      uStack_7bc = 0;
      fStack_7b8 = 0.0;
      fStack_7b4 = 0.0;
      auVar327 = ZEXT416((uint)(auVar327._0_4_ * 4.7683716e-07));
      local_7e8 = prim;
      fVar298 = fVar273;
      fVar181 = fVar274;
      fVar301 = fVar275;
      fVar197 = fVar276;
      if ((((((((auVar37 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar37 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar37 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar37 >> 0x7f,0) == '\0') &&
            (auVar37 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar37 >> 0xbf,0) == '\0') &&
          (auVar37 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar37[0x1f])
      {
        p_Var131 = (RTCFilterFunctionN)0x0;
      }
      else {
        auVar162 = vandps_avx(auVar162,auVar30);
        fVar265 = auVar176._0_4_;
        fVar272 = auVar176._4_4_;
        fVar248 = auVar176._8_4_;
        fVar257 = auVar176._12_4_;
        fVar259 = auVar207._0_4_;
        fVar288 = auVar207._4_4_;
        fVar289 = auVar207._8_4_;
        fVar290 = auVar207._12_4_;
        fVar319 = auVar187._0_4_;
        fVar321 = auVar187._4_4_;
        fVar322 = auVar187._8_4_;
        fVar323 = auVar187._12_4_;
        fVar203 = auVar20._0_4_;
        fVar215 = auVar20._4_4_;
        fVar217 = auVar20._8_4_;
        fVar221 = auVar20._12_4_;
        fVar183 = auVar30._28_4_ +
                  *(float *)(bezier_basis1 + lVar19 + 0x924) +
                  *(float *)(bezier_basis1 + lVar19 + 0x4a0);
        local_760._0_16_ = auVar327;
        local_440 = fVar265 * fVar309 + fVar259 * fVar235 + fVar319 * fVar233 + fVar203 * fVar304;
        fStack_43c = fVar272 * fVar147 + fVar288 * fVar306 + fVar321 * fVar234 + fVar215 * fVar198;
        fStack_438 = fVar248 * fVar149 + fVar289 * fVar148 + fVar322 * fVar294 + fVar217 * fVar296;
        fStack_434 = fVar257 * fVar150 + fVar290 * fVar307 + fVar323 * fVar170 + fVar221 * fVar308;
        fStack_430 = fVar265 * fVar169 + fVar259 * fVar132 + fVar319 * fVar297 + fVar203 * fVar303;
        fStack_42c = fVar272 * fVar171 + fVar288 * fVar146 + fVar321 * fVar223 + fVar215 * fVar199;
        fStack_428 = fVar248 * fVar195 + fVar289 * fVar236 + fVar322 * fVar295 + fVar217 * fVar305;
        fStack_424 = auVar162._28_4_ + fVar183;
        local_420._0_4_ = auVar121._0_4_;
        local_420._4_4_ = auVar121._4_4_;
        fStack_418 = auVar121._8_4_;
        fStack_414 = auVar121._12_4_;
        fStack_410 = auVar121._16_4_;
        fStack_40c = auVar121._20_4_;
        fStack_408 = auVar121._24_4_;
        local_520._0_4_ = auVar120._0_4_;
        local_520._4_4_ = auVar120._4_4_;
        fStack_518 = auVar120._8_4_;
        fStack_514 = auVar120._12_4_;
        auStack_510._0_4_ = auVar120._16_4_;
        auStack_510._4_4_ = auVar120._20_4_;
        fStack_508 = auVar120._24_4_;
        local_500._0_4_ = auVar119._0_4_;
        local_500._4_4_ = auVar119._4_4_;
        fStack_4f8 = auVar119._8_4_;
        fStack_4f4 = auVar119._12_4_;
        fStack_4f0 = auVar119._16_4_;
        fStack_4ec = auVar119._20_4_;
        fStack_4e8 = auVar119._24_4_;
        local_5e0._0_4_ = auVar118._0_4_;
        local_5e0._4_4_ = auVar118._4_4_;
        fStack_5d8 = auVar118._8_4_;
        fStack_5d4 = auVar118._12_4_;
        fStack_5d0 = auVar118._16_4_;
        fStack_5cc = auVar118._20_4_;
        fStack_5c8 = auVar118._24_4_;
        local_500._0_4_ =
             fVar265 * (float)local_420._0_4_ +
             fVar259 * (float)local_520._0_4_ +
             fVar319 * (float)local_500._0_4_ + fVar203 * (float)local_5e0._0_4_;
        local_500._4_4_ =
             fVar272 * (float)local_420._4_4_ +
             fVar288 * (float)local_520._4_4_ +
             fVar321 * (float)local_500._4_4_ + fVar215 * (float)local_5e0._4_4_;
        fStack_4f8 = fVar248 * fStack_418 +
                     fVar289 * fStack_518 + fVar322 * fStack_4f8 + fVar217 * fStack_5d8;
        fStack_4f4 = fVar257 * fStack_414 +
                     fVar290 * fStack_514 + fVar323 * fStack_4f4 + fVar221 * fStack_5d4;
        fStack_4f0 = fVar265 * fStack_410 +
                     fVar259 * (float)auStack_510._0_4_ +
                     fVar319 * fStack_4f0 + fVar203 * fStack_5d0;
        fStack_4ec = fVar272 * fStack_40c +
                     fVar288 * (float)auStack_510._4_4_ +
                     fVar321 * fStack_4ec + fVar215 * fStack_5cc;
        fStack_4e8 = fVar248 * fStack_408 +
                     fVar289 * fStack_508 + fVar322 * fStack_4e8 + fVar217 * fStack_5c8;
        fStack_4e4 = fStack_424 + fVar183 + auVar162._28_4_ + auVar30._28_4_;
        fVar183 = *(float *)(bezier_basis0 + lVar19 + 0x1210);
        fVar193 = *(float *)(bezier_basis0 + lVar19 + 0x1214);
        fVar194 = *(float *)(bezier_basis0 + lVar19 + 0x1218);
        fVar196 = *(float *)(bezier_basis0 + lVar19 + 0x121c);
        fVar200 = *(float *)(bezier_basis0 + lVar19 + 0x1220);
        fVar213 = *(float *)(bezier_basis0 + lVar19 + 0x1224);
        fVar216 = *(float *)(bezier_basis0 + lVar19 + 0x1228);
        fVar218 = *(float *)(bezier_basis0 + lVar19 + 0x1694);
        fVar224 = *(float *)(bezier_basis0 + lVar19 + 0x1698);
        fVar232 = *(float *)(bezier_basis0 + lVar19 + 0x169c);
        fVar233 = *(float *)(bezier_basis0 + lVar19 + 0x16a0);
        fVar234 = *(float *)(bezier_basis0 + lVar19 + 0x16a4);
        fVar294 = *(float *)(bezier_basis0 + lVar19 + 0x16a8);
        fVar170 = *(float *)(bezier_basis0 + lVar19 + 0x16ac);
        fVar297 = *(float *)(bezier_basis0 + lVar19 + 0x1b18);
        fVar223 = *(float *)(bezier_basis0 + lVar19 + 0x1b1c);
        fVar295 = *(float *)(bezier_basis0 + lVar19 + 0x1b20);
        fVar302 = *(float *)(bezier_basis0 + lVar19 + 0x1b24);
        fVar304 = *(float *)(bezier_basis0 + lVar19 + 0x1b28);
        fVar198 = *(float *)(bezier_basis0 + lVar19 + 0x1b2c);
        fVar296 = *(float *)(bezier_basis0 + lVar19 + 0x1b30);
        fVar308 = *(float *)(bezier_basis0 + lVar19 + 0x1f9c);
        fVar303 = *(float *)(bezier_basis0 + lVar19 + 0x1fa0);
        fVar199 = *(float *)(bezier_basis0 + lVar19 + 0x1fa4);
        fVar305 = *(float *)(bezier_basis0 + lVar19 + 0x1fa8);
        fVar235 = *(float *)(bezier_basis0 + lVar19 + 0x1fac);
        fVar306 = *(float *)(bezier_basis0 + lVar19 + 0x1fb0);
        fVar148 = *(float *)(bezier_basis0 + lVar19 + 0x1fb4);
        fVar132 = auVar279._28_4_ + *(float *)(bezier_basis1 + lVar19 + 0x4a0);
        fVar307 = *(float *)(bezier_basis0 + lVar19 + 0x1b34) +
                  *(float *)(bezier_basis0 + lVar19 + 0x1fb8);
        fVar146 = *(float *)(bezier_basis0 + lVar19 + 0x16b0) + fVar307;
        local_420._4_4_ =
             fVar182 * fVar193 + fVar224 * fVar274 + fVar164 * fVar223 + fVar285 * fVar303;
        local_420._0_4_ =
             fVar202 * fVar183 + fVar218 * fVar273 + fVar151 * fVar297 + fVar277 * fVar308;
        fStack_418 = fVar246 * fVar194 + fVar232 * fVar275 + fVar237 * fVar295 + fVar286 * fVar199;
        fStack_414 = fVar220 * fVar196 + fVar233 * fVar276 + fVar167 * fVar302 + fVar287 * fVar305;
        fStack_410 = fVar202 * fVar200 + fVar234 * fVar273 + fVar151 * fVar304 + fVar277 * fVar235;
        fStack_40c = fVar182 * fVar213 + fVar294 * fVar274 + fVar164 * fVar198 + fVar285 * fVar306;
        fStack_408 = fVar246 * fVar216 + fVar170 * fVar275 + fVar237 * fVar296 + fVar286 * fVar148;
        fStack_404 = *(float *)(bezier_basis0 + lVar19 + 0x16b0) +
                     *(float *)(bezier_basis0 + lVar19 + 0x1fb8) + fVar132;
        auVar158._0_4_ =
             fVar183 * fVar247 + fVar201 * fVar297 + fVar152 * fVar308 + fVar261 * fVar218;
        auVar158._4_4_ =
             fVar193 * fVar256 + fVar214 * fVar223 + fVar165 * fVar303 + fVar262 * fVar224;
        auVar158._8_4_ =
             fVar194 * fVar258 + fVar222 * fVar295 + fVar166 * fVar199 + fVar263 * fVar232;
        auVar158._12_4_ =
             fVar196 * fVar260 + fVar219 * fVar302 + fVar168 * fVar305 + fVar264 * fVar233;
        auVar158._16_4_ =
             fVar200 * fVar247 + fVar201 * fVar304 + fVar152 * fVar235 + fVar261 * fVar234;
        auVar158._20_4_ =
             fVar213 * fVar256 + fVar214 * fVar198 + fVar165 * fVar306 + fVar262 * fVar294;
        auVar158._24_4_ =
             fVar216 * fVar258 + fVar222 * fVar296 + fVar166 * fVar148 + fVar263 * fVar170;
        auVar158._28_4_ =
             fVar307 + auVar279._28_4_ + *(float *)(bezier_basis1 + lVar19 + 0x1c) + fVar132;
        auVar226._0_4_ =
             fVar259 * fVar218 + fVar319 * fVar297 + fVar203 * fVar308 + fVar265 * fVar183;
        auVar226._4_4_ =
             fVar288 * fVar224 + fVar321 * fVar223 + fVar215 * fVar303 + fVar272 * fVar193;
        auVar226._8_4_ =
             fVar289 * fVar232 + fVar322 * fVar295 + fVar217 * fVar199 + fVar248 * fVar194;
        auVar226._12_4_ =
             fVar290 * fVar233 + fVar323 * fVar302 + fVar221 * fVar305 + fVar257 * fVar196;
        auVar226._16_4_ =
             fVar259 * fVar234 + fVar319 * fVar304 + fVar203 * fVar235 + fVar265 * fVar200;
        auVar226._20_4_ =
             fVar288 * fVar294 + fVar321 * fVar198 + fVar215 * fVar306 + fVar272 * fVar213;
        auVar226._24_4_ =
             fVar289 * fVar170 + fVar322 * fVar296 + fVar217 * fVar148 + fVar248 * fVar216;
        auVar226._28_4_ = fVar146 + *(float *)(bezier_basis0 + lVar19 + 0x122c);
        fVar183 = *(float *)(bezier_basis1 + lVar19 + 0x1b18);
        fVar193 = *(float *)(bezier_basis1 + lVar19 + 0x1b1c);
        fVar194 = *(float *)(bezier_basis1 + lVar19 + 0x1b20);
        fVar196 = *(float *)(bezier_basis1 + lVar19 + 0x1b24);
        fVar200 = *(float *)(bezier_basis1 + lVar19 + 0x1b28);
        fVar213 = *(float *)(bezier_basis1 + lVar19 + 0x1b2c);
        fVar216 = *(float *)(bezier_basis1 + lVar19 + 0x1b30);
        fVar218 = *(float *)(bezier_basis1 + lVar19 + 0x1f9c);
        fVar224 = *(float *)(bezier_basis1 + lVar19 + 0x1fa0);
        fVar232 = *(float *)(bezier_basis1 + lVar19 + 0x1fa4);
        fVar233 = *(float *)(bezier_basis1 + lVar19 + 0x1fa8);
        fVar234 = *(float *)(bezier_basis1 + lVar19 + 0x1fac);
        fVar294 = *(float *)(bezier_basis1 + lVar19 + 0x1fb0);
        fVar170 = *(float *)(bezier_basis1 + lVar19 + 0x1fb4);
        fVar297 = *(float *)(bezier_basis1 + lVar19 + 0x1694);
        fVar223 = *(float *)(bezier_basis1 + lVar19 + 0x1698);
        fVar295 = *(float *)(bezier_basis1 + lVar19 + 0x169c);
        fVar302 = *(float *)(bezier_basis1 + lVar19 + 0x16a0);
        fVar304 = *(float *)(bezier_basis1 + lVar19 + 0x16a4);
        fVar198 = *(float *)(bezier_basis1 + lVar19 + 0x16a8);
        fVar296 = *(float *)(bezier_basis1 + lVar19 + 0x16ac);
        fVar308 = *(float *)(bezier_basis1 + lVar19 + 0x1210);
        fVar303 = *(float *)(bezier_basis1 + lVar19 + 0x1214);
        fVar199 = *(float *)(bezier_basis1 + lVar19 + 0x1218);
        fVar305 = *(float *)(bezier_basis1 + lVar19 + 0x121c);
        fVar235 = *(float *)(bezier_basis1 + lVar19 + 0x1220);
        fVar306 = *(float *)(bezier_basis1 + lVar19 + 0x1224);
        fVar148 = *(float *)(bezier_basis1 + lVar19 + 0x1228);
        auVar241._0_4_ =
             fVar202 * fVar308 + fVar297 * fVar273 + fVar151 * fVar183 + fVar277 * fVar218;
        auVar241._4_4_ =
             fVar182 * fVar303 + fVar223 * fVar274 + fVar164 * fVar193 + fVar285 * fVar224;
        auVar241._8_4_ =
             fVar246 * fVar199 + fVar295 * fVar275 + fVar237 * fVar194 + fVar286 * fVar232;
        auVar241._12_4_ =
             fVar220 * fVar305 + fVar302 * fVar276 + fVar167 * fVar196 + fVar287 * fVar233;
        auVar241._16_4_ =
             fVar202 * fVar235 + fVar304 * fVar273 + fVar151 * fVar200 + fVar277 * fVar234;
        auVar241._20_4_ =
             fVar182 * fVar306 + fVar198 * fVar274 + fVar164 * fVar213 + fVar285 * fVar294;
        auVar241._24_4_ =
             fVar246 * fVar148 + fVar296 * fVar275 + fVar237 * fVar216 + fVar286 * fVar170;
        auVar241._28_4_ = fVar167 + fVar167 + fVar146 + fVar287;
        auVar280._0_4_ =
             fVar308 * fVar247 + fVar261 * fVar297 + fVar201 * fVar183 + fVar152 * fVar218;
        auVar280._4_4_ =
             fVar303 * fVar256 + fVar262 * fVar223 + fVar214 * fVar193 + fVar165 * fVar224;
        auVar280._8_4_ =
             fVar199 * fVar258 + fVar263 * fVar295 + fVar222 * fVar194 + fVar166 * fVar232;
        auVar280._12_4_ =
             fVar305 * fVar260 + fVar264 * fVar302 + fVar219 * fVar196 + fVar168 * fVar233;
        auVar280._16_4_ =
             fVar235 * fVar247 + fVar261 * fVar304 + fVar201 * fVar200 + fVar152 * fVar234;
        auVar280._20_4_ =
             fVar306 * fVar256 + fVar262 * fVar198 + fVar214 * fVar213 + fVar165 * fVar294;
        auVar280._24_4_ =
             fVar148 * fVar258 + fVar263 * fVar296 + fVar222 * fVar216 + fVar166 * fVar170;
        auVar280._28_4_ = fVar167 + fVar167 + fVar167 + fVar146;
        auVar180._0_4_ =
             fVar265 * fVar308 + fVar259 * fVar297 + fVar319 * fVar183 + fVar218 * fVar203;
        auVar180._4_4_ =
             fVar272 * fVar303 + fVar288 * fVar223 + fVar321 * fVar193 + fVar224 * fVar215;
        auVar180._8_4_ =
             fVar248 * fVar199 + fVar289 * fVar295 + fVar322 * fVar194 + fVar232 * fVar217;
        auVar180._12_4_ =
             fVar257 * fVar305 + fVar290 * fVar302 + fVar323 * fVar196 + fVar233 * fVar221;
        auVar180._16_4_ =
             fVar265 * fVar235 + fVar259 * fVar304 + fVar319 * fVar200 + fVar234 * fVar203;
        auVar180._20_4_ =
             fVar272 * fVar306 + fVar288 * fVar198 + fVar321 * fVar213 + fVar294 * fVar215;
        auVar180._24_4_ =
             fVar248 * fVar148 + fVar289 * fVar296 + fVar322 * fVar216 + fVar170 * fVar217;
        auVar180._28_4_ =
             *(float *)(bezier_basis1 + lVar19 + 0x122c) +
             *(float *)(bezier_basis1 + lVar19 + 0x16b0) +
             *(float *)(bezier_basis1 + lVar19 + 0x1b34) +
             *(float *)(bezier_basis1 + lVar19 + 0x1fb8);
        auVar209._8_4_ = 0x7fffffff;
        auVar209._0_8_ = 0x7fffffff7fffffff;
        auVar209._12_4_ = 0x7fffffff;
        auVar209._16_4_ = 0x7fffffff;
        auVar209._20_4_ = 0x7fffffff;
        auVar209._24_4_ = 0x7fffffff;
        auVar209._28_4_ = 0x7fffffff;
        auVar30 = vandps_avx(_local_420,auVar209);
        auVar37 = vandps_avx(auVar158,auVar209);
        auVar37 = vmaxps_avx(auVar30,auVar37);
        auVar30 = vandps_avx(auVar226,auVar209);
        auVar30 = vmaxps_avx(auVar37,auVar30);
        auVar327 = vpermilps_avx(auVar327,0);
        auVar227._16_16_ = auVar327;
        auVar227._0_16_ = auVar327;
        auVar30 = vcmpps_avx(auVar30,auVar227,1);
        auVar31 = vblendvps_avx(_local_420,auVar28,auVar30);
        auVar189 = vblendvps_avx(auVar158,auVar29,auVar30);
        auVar30 = vandps_avx(auVar241,auVar209);
        auVar37 = vandps_avx(auVar280,auVar209);
        auVar32 = vmaxps_avx(auVar30,auVar37);
        auVar30 = vandps_avx(auVar180,auVar209);
        auVar30 = vmaxps_avx(auVar32,auVar30);
        auVar32 = vcmpps_avx(auVar30,auVar227,1);
        auVar30 = vblendvps_avx(auVar241,auVar28,auVar32);
        auVar28 = vblendvps_avx(auVar280,auVar29,auVar32);
        fVar132 = auVar31._0_4_;
        fVar146 = auVar31._4_4_;
        fVar236 = auVar31._8_4_;
        fVar309 = auVar31._12_4_;
        fVar147 = auVar31._16_4_;
        fVar149 = auVar31._20_4_;
        fVar150 = auVar31._24_4_;
        fVar237 = -auVar31._28_4_;
        fVar169 = auVar30._0_4_;
        fVar171 = auVar30._4_4_;
        fVar195 = auVar30._8_4_;
        fVar151 = auVar30._12_4_;
        fVar152 = auVar30._16_4_;
        fVar164 = auVar30._20_4_;
        fVar165 = auVar30._24_4_;
        fVar183 = auVar189._0_4_;
        fVar200 = auVar189._4_4_;
        fVar224 = auVar189._8_4_;
        fVar294 = auVar189._12_4_;
        fVar295 = auVar189._16_4_;
        fVar296 = auVar189._20_4_;
        fVar305 = auVar189._24_4_;
        auVar139._0_4_ = fVar183 * fVar183 + fVar132 * fVar132;
        auVar139._4_4_ = fVar200 * fVar200 + fVar146 * fVar146;
        auVar139._8_4_ = fVar224 * fVar224 + fVar236 * fVar236;
        auVar139._12_4_ = fVar294 * fVar294 + fVar309 * fVar309;
        auVar139._16_4_ = fVar295 * fVar295 + fVar147 * fVar147;
        auVar139._20_4_ = fVar296 * fVar296 + fVar149 * fVar149;
        auVar139._24_4_ = fVar305 * fVar305 + fVar150 * fVar150;
        auVar139._28_4_ = auVar280._28_4_ + auVar31._28_4_;
        auVar29 = vrsqrtps_avx(auVar139);
        fVar193 = auVar29._0_4_;
        fVar194 = auVar29._4_4_;
        auVar32._4_4_ = fVar194 * 1.5;
        auVar32._0_4_ = fVar193 * 1.5;
        fVar196 = auVar29._8_4_;
        auVar32._8_4_ = fVar196 * 1.5;
        fVar213 = auVar29._12_4_;
        auVar32._12_4_ = fVar213 * 1.5;
        fVar216 = auVar29._16_4_;
        auVar32._16_4_ = fVar216 * 1.5;
        fVar218 = auVar29._20_4_;
        auVar32._20_4_ = fVar218 * 1.5;
        fVar232 = auVar29._24_4_;
        fVar307 = auVar37._28_4_;
        auVar32._24_4_ = fVar232 * 1.5;
        auVar32._28_4_ = fVar307;
        auVar29._4_4_ = fVar194 * fVar194 * fVar194 * auVar139._4_4_ * 0.5;
        auVar29._0_4_ = fVar193 * fVar193 * fVar193 * auVar139._0_4_ * 0.5;
        auVar29._8_4_ = fVar196 * fVar196 * fVar196 * auVar139._8_4_ * 0.5;
        auVar29._12_4_ = fVar213 * fVar213 * fVar213 * auVar139._12_4_ * 0.5;
        auVar29._16_4_ = fVar216 * fVar216 * fVar216 * auVar139._16_4_ * 0.5;
        auVar29._20_4_ = fVar218 * fVar218 * fVar218 * auVar139._20_4_ * 0.5;
        auVar29._24_4_ = fVar232 * fVar232 * fVar232 * auVar139._24_4_ * 0.5;
        auVar29._28_4_ = auVar139._28_4_;
        auVar29 = vsubps_avx(auVar32,auVar29);
        fVar193 = auVar29._0_4_;
        fVar213 = auVar29._4_4_;
        fVar232 = auVar29._8_4_;
        fVar170 = auVar29._12_4_;
        fVar302 = auVar29._16_4_;
        fVar308 = auVar29._20_4_;
        fVar235 = auVar29._24_4_;
        fVar194 = auVar28._0_4_;
        fVar216 = auVar28._4_4_;
        fVar233 = auVar28._8_4_;
        fVar297 = auVar28._12_4_;
        fVar304 = auVar28._16_4_;
        fVar303 = auVar28._20_4_;
        fVar306 = auVar28._24_4_;
        auVar140._0_4_ = fVar194 * fVar194 + fVar169 * fVar169;
        auVar140._4_4_ = fVar216 * fVar216 + fVar171 * fVar171;
        auVar140._8_4_ = fVar233 * fVar233 + fVar195 * fVar195;
        auVar140._12_4_ = fVar297 * fVar297 + fVar151 * fVar151;
        auVar140._16_4_ = fVar304 * fVar304 + fVar152 * fVar152;
        auVar140._20_4_ = fVar303 * fVar303 + fVar164 * fVar164;
        auVar140._24_4_ = fVar306 * fVar306 + fVar165 * fVar165;
        auVar140._28_4_ = auVar30._28_4_ + auVar29._28_4_;
        auVar30 = vrsqrtps_avx(auVar140);
        fVar196 = auVar30._0_4_;
        fVar218 = auVar30._4_4_;
        auVar33._4_4_ = fVar218 * 1.5;
        auVar33._0_4_ = fVar196 * 1.5;
        fVar234 = auVar30._8_4_;
        auVar33._8_4_ = fVar234 * 1.5;
        fVar223 = auVar30._12_4_;
        auVar33._12_4_ = fVar223 * 1.5;
        fVar198 = auVar30._16_4_;
        auVar33._16_4_ = fVar198 * 1.5;
        fVar199 = auVar30._20_4_;
        auVar33._20_4_ = fVar199 * 1.5;
        fVar148 = auVar30._24_4_;
        auVar33._24_4_ = fVar148 * 1.5;
        auVar33._28_4_ = fVar307;
        auVar34._4_4_ = fVar218 * fVar218 * fVar218 * auVar140._4_4_ * 0.5;
        auVar34._0_4_ = fVar196 * fVar196 * fVar196 * auVar140._0_4_ * 0.5;
        auVar34._8_4_ = fVar234 * fVar234 * fVar234 * auVar140._8_4_ * 0.5;
        auVar34._12_4_ = fVar223 * fVar223 * fVar223 * auVar140._12_4_ * 0.5;
        auVar34._16_4_ = fVar198 * fVar198 * fVar198 * auVar140._16_4_ * 0.5;
        auVar34._20_4_ = fVar199 * fVar199 * fVar199 * auVar140._20_4_ * 0.5;
        auVar34._24_4_ = fVar148 * fVar148 * fVar148 * auVar140._24_4_ * 0.5;
        auVar34._28_4_ = auVar140._28_4_;
        auVar30 = vsubps_avx(auVar33,auVar34);
        fVar196 = auVar30._0_4_;
        fVar218 = auVar30._4_4_;
        fVar234 = auVar30._8_4_;
        fVar223 = auVar30._12_4_;
        fVar198 = auVar30._16_4_;
        fVar199 = auVar30._20_4_;
        fVar148 = auVar30._24_4_;
        fVar183 = (float)local_7e0 * fVar183 * fVar193;
        fVar200 = (float)auStack_7dc._0_4_ * fVar200 * fVar213;
        auVar35._4_4_ = fVar200;
        auVar35._0_4_ = fVar183;
        fVar224 = (float)auStack_7dc._4_4_ * fVar224 * fVar232;
        auVar35._8_4_ = fVar224;
        fVar294 = fStack_7d4 * fVar294 * fVar170;
        auVar35._12_4_ = fVar294;
        fVar295 = fStack_7d0 * fVar295 * fVar302;
        auVar35._16_4_ = fVar295;
        fVar296 = fStack_7cc * fVar296 * fVar308;
        auVar35._20_4_ = fVar296;
        fVar305 = fStack_7c8 * fVar305 * fVar235;
        auVar35._24_4_ = fVar305;
        auVar35._28_4_ = fVar307;
        local_5e0._4_4_ = fVar200 + auVar324._4_4_;
        local_5e0._0_4_ = fVar183 + auVar324._0_4_;
        fStack_5d8 = fVar224 + auVar324._8_4_;
        fStack_5d4 = fVar294 + auVar324._12_4_;
        fStack_5d0 = fVar295 + auVar324._16_4_;
        fStack_5cc = fVar296 + auVar324._20_4_;
        fStack_5c8 = fVar305 + auVar324._24_4_;
        fStack_5c4 = fVar307 + auVar324._28_4_;
        fVar183 = (float)local_7e0 * fVar193 * -fVar132;
        fVar200 = (float)auStack_7dc._0_4_ * fVar213 * -fVar146;
        auVar36._4_4_ = fVar200;
        auVar36._0_4_ = fVar183;
        fVar224 = (float)auStack_7dc._4_4_ * fVar232 * -fVar236;
        auVar36._8_4_ = fVar224;
        fVar294 = fStack_7d4 * fVar170 * -fVar309;
        auVar36._12_4_ = fVar294;
        fVar295 = fStack_7d0 * fVar302 * -fVar147;
        auVar36._16_4_ = fVar295;
        fVar296 = fStack_7cc * fVar308 * -fVar149;
        auVar36._20_4_ = fVar296;
        fVar305 = fStack_7c8 * fVar235 * -fVar150;
        auVar36._24_4_ = fVar305;
        auVar36._28_4_ = fVar237;
        local_520._4_4_ = auVar279._4_4_ + fVar200;
        local_520._0_4_ = auVar279._0_4_ + fVar183;
        fStack_518 = auVar279._8_4_ + fVar224;
        fStack_514 = auVar279._12_4_ + fVar294;
        auStack_510._0_4_ = auVar279._16_4_ + fVar295;
        auStack_510._4_4_ = auVar279._20_4_ + fVar296;
        fStack_508 = auVar279._24_4_ + fVar305;
        fStack_504 = auVar279._28_4_ + fVar237;
        fVar183 = fVar193 * 0.0 * (float)local_7e0;
        fVar193 = fVar213 * 0.0 * (float)auStack_7dc._0_4_;
        auVar38._4_4_ = fVar193;
        auVar38._0_4_ = fVar183;
        fVar200 = fVar232 * 0.0 * (float)auStack_7dc._4_4_;
        auVar38._8_4_ = fVar200;
        fVar213 = fVar170 * 0.0 * fStack_7d4;
        auVar38._12_4_ = fVar213;
        fVar224 = fVar302 * 0.0 * fStack_7d0;
        auVar38._16_4_ = fVar224;
        fVar232 = fVar308 * 0.0 * fStack_7cc;
        auVar38._20_4_ = fVar232;
        fVar294 = fVar235 * 0.0 * fStack_7c8;
        auVar38._24_4_ = fVar294;
        auVar38._28_4_ = fVar290;
        auVar242._0_4_ = (float)local_500._0_4_ + fVar183;
        auVar242._4_4_ = (float)local_500._4_4_ + fVar193;
        auVar242._8_4_ = fStack_4f8 + fVar200;
        auVar242._12_4_ = fStack_4f4 + fVar213;
        auVar242._16_4_ = fStack_4f0 + fVar224;
        auVar242._20_4_ = fStack_4ec + fVar232;
        auVar242._24_4_ = fStack_4e8 + fVar294;
        auVar242._28_4_ = fStack_4e4 + fVar290;
        fVar183 = local_6a0._0_4_ * fVar194 * fVar196;
        fVar193 = local_6a0._4_4_ * fVar216 * fVar218;
        auVar39._4_4_ = fVar193;
        auVar39._0_4_ = fVar183;
        fVar194 = local_6a0._8_4_ * fVar233 * fVar234;
        auVar39._8_4_ = fVar194;
        fVar200 = local_6a0._12_4_ * fVar297 * fVar223;
        auVar39._12_4_ = fVar200;
        fVar213 = local_6a0._16_4_ * fVar304 * fVar198;
        auVar39._16_4_ = fVar213;
        fVar216 = local_6a0._20_4_ * fVar303 * fVar199;
        auVar39._20_4_ = fVar216;
        fVar224 = local_6a0._24_4_ * fVar306 * fVar148;
        auVar39._24_4_ = fVar224;
        auVar39._28_4_ = auVar28._28_4_;
        auVar189 = vsubps_avx(auVar324,auVar35);
        auVar292._0_4_ = auVar208._0_4_ + fVar183;
        auVar292._4_4_ = auVar208._4_4_ + fVar193;
        auVar292._8_4_ = auVar208._8_4_ + fVar194;
        auVar292._12_4_ = auVar208._12_4_ + fVar200;
        auVar292._16_4_ = auVar208._16_4_ + fVar213;
        auVar292._20_4_ = auVar208._20_4_ + fVar216;
        auVar292._24_4_ = auVar208._24_4_ + fVar224;
        auVar292._28_4_ = auVar208._28_4_ + auVar28._28_4_;
        fVar183 = local_6a0._0_4_ * fVar196 * -fVar169;
        fVar193 = local_6a0._4_4_ * fVar218 * -fVar171;
        auVar28._4_4_ = fVar193;
        auVar28._0_4_ = fVar183;
        fVar194 = local_6a0._8_4_ * fVar234 * -fVar195;
        auVar28._8_4_ = fVar194;
        fVar200 = local_6a0._12_4_ * fVar223 * -fVar151;
        auVar28._12_4_ = fVar200;
        fVar213 = local_6a0._16_4_ * fVar198 * -fVar152;
        auVar28._16_4_ = fVar213;
        fVar216 = local_6a0._20_4_ * fVar199 * -fVar164;
        auVar28._20_4_ = fVar216;
        fVar224 = local_6a0._24_4_ * fVar148 * -fVar165;
        auVar28._24_4_ = fVar224;
        auVar28._28_4_ = fVar323;
        auVar279 = vsubps_avx(auVar279,auVar36);
        auVar300._0_4_ = fVar183 + auVar188._0_4_;
        auVar300._4_4_ = fVar193 + auVar188._4_4_;
        auVar300._8_4_ = fVar194 + auVar188._8_4_;
        auVar300._12_4_ = fVar200 + auVar188._12_4_;
        auVar300._16_4_ = fVar213 + auVar188._16_4_;
        auVar300._20_4_ = fVar216 + auVar188._20_4_;
        auVar300._24_4_ = fVar224 + auVar188._24_4_;
        auVar300._28_4_ = fVar323 + auVar188._28_4_;
        fVar183 = fVar196 * 0.0 * local_6a0._0_4_;
        fVar193 = fVar218 * 0.0 * local_6a0._4_4_;
        auVar40._4_4_ = fVar193;
        auVar40._0_4_ = fVar183;
        fVar194 = fVar234 * 0.0 * local_6a0._8_4_;
        auVar40._8_4_ = fVar194;
        fVar196 = fVar223 * 0.0 * local_6a0._12_4_;
        auVar40._12_4_ = fVar196;
        fVar200 = fVar198 * 0.0 * local_6a0._16_4_;
        auVar40._16_4_ = fVar200;
        fVar213 = fVar199 * 0.0 * local_6a0._20_4_;
        auVar40._20_4_ = fVar213;
        fVar216 = fVar148 * 0.0 * local_6a0._24_4_;
        auVar40._24_4_ = fVar216;
        auVar40._28_4_ = fVar237;
        auVar32 = vsubps_avx(_local_500,auVar38);
        auVar115._4_4_ = fStack_43c;
        auVar115._0_4_ = local_440;
        auVar115._8_4_ = fStack_438;
        auVar115._12_4_ = fStack_434;
        auVar115._16_4_ = fStack_430;
        auVar115._20_4_ = fStack_42c;
        auVar115._24_4_ = fStack_428;
        auVar115._28_4_ = fStack_424;
        auVar325._0_4_ = local_440 + fVar183;
        auVar325._4_4_ = fStack_43c + fVar193;
        auVar325._8_4_ = fStack_438 + fVar194;
        auVar325._12_4_ = fStack_434 + fVar196;
        auVar325._16_4_ = fStack_430 + fVar200;
        auVar325._20_4_ = fStack_42c + fVar213;
        auVar325._24_4_ = fStack_428 + fVar216;
        auVar325._28_4_ = fStack_424 + fVar237;
        auVar30 = vsubps_avx(auVar208,auVar39);
        auVar28 = vsubps_avx(auVar188,auVar28);
        auVar29 = vsubps_avx(auVar115,auVar40);
        auVar37 = vsubps_avx(auVar300,auVar279);
        auVar31 = vsubps_avx(auVar325,auVar32);
        auVar41._4_4_ = auVar32._4_4_ * auVar37._4_4_;
        auVar41._0_4_ = auVar32._0_4_ * auVar37._0_4_;
        auVar41._8_4_ = auVar32._8_4_ * auVar37._8_4_;
        auVar41._12_4_ = auVar32._12_4_ * auVar37._12_4_;
        auVar41._16_4_ = auVar32._16_4_ * auVar37._16_4_;
        auVar41._20_4_ = auVar32._20_4_ * auVar37._20_4_;
        auVar41._24_4_ = auVar32._24_4_ * auVar37._24_4_;
        auVar41._28_4_ = fVar323;
        auVar42._4_4_ = auVar279._4_4_ * auVar31._4_4_;
        auVar42._0_4_ = auVar279._0_4_ * auVar31._0_4_;
        auVar42._8_4_ = auVar279._8_4_ * auVar31._8_4_;
        auVar42._12_4_ = auVar279._12_4_ * auVar31._12_4_;
        auVar42._16_4_ = auVar279._16_4_ * auVar31._16_4_;
        auVar42._20_4_ = auVar279._20_4_ * auVar31._20_4_;
        auVar42._24_4_ = auVar279._24_4_ * auVar31._24_4_;
        auVar42._28_4_ = auVar188._28_4_;
        auVar324 = vsubps_avx(auVar42,auVar41);
        auVar43._4_4_ = auVar189._4_4_ * auVar31._4_4_;
        auVar43._0_4_ = auVar189._0_4_ * auVar31._0_4_;
        auVar43._8_4_ = auVar189._8_4_ * auVar31._8_4_;
        auVar43._12_4_ = auVar189._12_4_ * auVar31._12_4_;
        auVar43._16_4_ = auVar189._16_4_ * auVar31._16_4_;
        auVar43._20_4_ = auVar189._20_4_ * auVar31._20_4_;
        auVar43._24_4_ = auVar189._24_4_ * auVar31._24_4_;
        auVar43._28_4_ = auVar31._28_4_;
        auVar33 = vsubps_avx(auVar292,auVar189);
        auVar44._4_4_ = auVar32._4_4_ * auVar33._4_4_;
        auVar44._0_4_ = auVar32._0_4_ * auVar33._0_4_;
        auVar44._8_4_ = auVar32._8_4_ * auVar33._8_4_;
        auVar44._12_4_ = auVar32._12_4_ * auVar33._12_4_;
        auVar44._16_4_ = auVar32._16_4_ * auVar33._16_4_;
        auVar44._20_4_ = auVar32._20_4_ * auVar33._20_4_;
        auVar44._24_4_ = auVar32._24_4_ * auVar33._24_4_;
        auVar44._28_4_ = auVar208._28_4_;
        auVar34 = vsubps_avx(auVar44,auVar43);
        auVar45._4_4_ = auVar33._4_4_ * auVar279._4_4_;
        auVar45._0_4_ = auVar33._0_4_ * auVar279._0_4_;
        auVar45._8_4_ = auVar33._8_4_ * auVar279._8_4_;
        auVar45._12_4_ = auVar33._12_4_ * auVar279._12_4_;
        auVar45._16_4_ = auVar33._16_4_ * auVar279._16_4_;
        auVar45._20_4_ = auVar33._20_4_ * auVar279._20_4_;
        auVar45._24_4_ = auVar33._24_4_ * auVar279._24_4_;
        auVar45._28_4_ = auVar31._28_4_;
        auVar46._4_4_ = auVar189._4_4_ * auVar37._4_4_;
        auVar46._0_4_ = auVar189._0_4_ * auVar37._0_4_;
        auVar46._8_4_ = auVar189._8_4_ * auVar37._8_4_;
        auVar46._12_4_ = auVar189._12_4_ * auVar37._12_4_;
        auVar46._16_4_ = auVar189._16_4_ * auVar37._16_4_;
        auVar46._20_4_ = auVar189._20_4_ * auVar37._20_4_;
        auVar46._24_4_ = auVar189._24_4_ * auVar37._24_4_;
        auVar46._28_4_ = auVar37._28_4_;
        auVar37 = vsubps_avx(auVar46,auVar45);
        auVar141._0_4_ = auVar324._0_4_ * 0.0 + auVar37._0_4_ + auVar34._0_4_ * 0.0;
        auVar141._4_4_ = auVar324._4_4_ * 0.0 + auVar37._4_4_ + auVar34._4_4_ * 0.0;
        auVar141._8_4_ = auVar324._8_4_ * 0.0 + auVar37._8_4_ + auVar34._8_4_ * 0.0;
        auVar141._12_4_ = auVar324._12_4_ * 0.0 + auVar37._12_4_ + auVar34._12_4_ * 0.0;
        auVar141._16_4_ = auVar324._16_4_ * 0.0 + auVar37._16_4_ + auVar34._16_4_ * 0.0;
        auVar141._20_4_ = auVar324._20_4_ * 0.0 + auVar37._20_4_ + auVar34._20_4_ * 0.0;
        auVar141._24_4_ = auVar324._24_4_ * 0.0 + auVar37._24_4_ + auVar34._24_4_ * 0.0;
        auVar141._28_4_ = auVar37._28_4_ + auVar37._28_4_ + auVar34._28_4_;
        auVar324 = vcmpps_avx(auVar141,ZEXT432(0) << 0x20,2);
        local_620 = vblendvps_avx(auVar30,_local_5e0,auVar324);
        auVar30 = vblendvps_avx(auVar28,_local_520,auVar324);
        auVar28 = vblendvps_avx(auVar29,auVar242,auVar324);
        auVar29 = vblendvps_avx(auVar189,auVar292,auVar324);
        auVar37 = vblendvps_avx(auVar279,auVar300,auVar324);
        auVar31 = vblendvps_avx(auVar32,auVar325,auVar324);
        auVar189 = vblendvps_avx(auVar292,auVar189,auVar324);
        auVar279 = vblendvps_avx(auVar300,auVar279,auVar324);
        local_780._0_16_ = vpackssdw_avx(auVar162._0_16_,auVar162._16_16_);
        local_780._16_16_ = auVar162._16_16_;
        auVar162 = vblendvps_avx(auVar325,auVar32,auVar324);
        auVar189 = vsubps_avx(auVar189,local_620);
        auVar32 = vsubps_avx(auVar279,auVar30);
        auVar33 = vsubps_avx(auVar162,auVar28);
        auVar162 = vsubps_avx(auVar30,auVar37);
        fVar183 = auVar32._0_4_;
        fVar150 = auVar28._0_4_;
        fVar213 = auVar32._4_4_;
        fVar169 = auVar28._4_4_;
        auVar47._4_4_ = fVar169 * fVar213;
        auVar47._0_4_ = fVar150 * fVar183;
        fVar233 = auVar32._8_4_;
        fVar171 = auVar28._8_4_;
        auVar47._8_4_ = fVar171 * fVar233;
        fVar223 = auVar32._12_4_;
        fVar195 = auVar28._12_4_;
        auVar47._12_4_ = fVar195 * fVar223;
        fVar296 = auVar32._16_4_;
        fVar151 = auVar28._16_4_;
        auVar47._16_4_ = fVar151 * fVar296;
        fVar235 = auVar32._20_4_;
        fVar152 = auVar28._20_4_;
        auVar47._20_4_ = fVar152 * fVar235;
        fVar146 = auVar32._24_4_;
        fVar164 = auVar28._24_4_;
        auVar47._24_4_ = fVar164 * fVar146;
        auVar47._28_4_ = auVar279._28_4_;
        fVar193 = auVar30._0_4_;
        fVar214 = auVar33._0_4_;
        fVar216 = auVar30._4_4_;
        fVar182 = auVar33._4_4_;
        auVar48._4_4_ = fVar182 * fVar216;
        auVar48._0_4_ = fVar214 * fVar193;
        fVar234 = auVar30._8_4_;
        fVar222 = auVar33._8_4_;
        auVar48._8_4_ = fVar222 * fVar234;
        fVar295 = auVar30._12_4_;
        fVar246 = auVar33._12_4_;
        auVar48._12_4_ = fVar246 * fVar295;
        fVar308 = auVar30._16_4_;
        fVar219 = auVar33._16_4_;
        auVar48._16_4_ = fVar219 * fVar308;
        fVar306 = auVar30._20_4_;
        fVar220 = auVar33._20_4_;
        auVar48._20_4_ = fVar220 * fVar306;
        fVar236 = auVar30._24_4_;
        fVar203 = auVar33._24_4_;
        auVar48._24_4_ = fVar203 * fVar236;
        auVar48._28_4_ = auVar300._28_4_;
        auVar279 = vsubps_avx(auVar48,auVar47);
        fVar194 = local_620._0_4_;
        fVar218 = local_620._4_4_;
        auVar49._4_4_ = fVar182 * fVar218;
        auVar49._0_4_ = fVar214 * fVar194;
        fVar294 = local_620._8_4_;
        auVar49._8_4_ = fVar222 * fVar294;
        fVar302 = local_620._12_4_;
        auVar49._12_4_ = fVar246 * fVar302;
        fVar303 = local_620._16_4_;
        auVar49._16_4_ = fVar219 * fVar303;
        fVar148 = local_620._20_4_;
        auVar49._20_4_ = fVar220 * fVar148;
        fVar309 = local_620._24_4_;
        auVar49._24_4_ = fVar203 * fVar309;
        auVar49._28_4_ = auVar300._28_4_;
        fVar196 = auVar189._0_4_;
        auVar320._0_4_ = fVar150 * fVar196;
        fVar224 = auVar189._4_4_;
        auVar320._4_4_ = fVar169 * fVar224;
        fVar170 = auVar189._8_4_;
        auVar320._8_4_ = fVar171 * fVar170;
        fVar304 = auVar189._12_4_;
        auVar320._12_4_ = fVar195 * fVar304;
        fVar199 = auVar189._16_4_;
        auVar320._16_4_ = fVar151 * fVar199;
        fVar307 = auVar189._20_4_;
        auVar320._20_4_ = fVar152 * fVar307;
        fVar147 = auVar189._24_4_;
        auVar320._24_4_ = fVar164 * fVar147;
        auVar320._28_4_ = 0;
        auVar34 = vsubps_avx(auVar320,auVar49);
        auVar50._4_4_ = fVar216 * fVar224;
        auVar50._0_4_ = fVar193 * fVar196;
        auVar50._8_4_ = fVar234 * fVar170;
        auVar50._12_4_ = fVar295 * fVar304;
        auVar50._16_4_ = fVar308 * fVar199;
        auVar50._20_4_ = fVar306 * fVar307;
        auVar50._24_4_ = fVar236 * fVar147;
        auVar50._28_4_ = auVar300._28_4_;
        auVar51._4_4_ = fVar218 * fVar213;
        auVar51._0_4_ = fVar194 * fVar183;
        auVar51._8_4_ = fVar294 * fVar233;
        auVar51._12_4_ = fVar302 * fVar223;
        auVar51._16_4_ = fVar303 * fVar296;
        auVar51._20_4_ = fVar148 * fVar235;
        auVar51._24_4_ = fVar309 * fVar146;
        auVar51._28_4_ = auVar325._28_4_;
        auVar35 = vsubps_avx(auVar51,auVar50);
        auVar36 = vsubps_avx(auVar28,auVar31);
        fVar200 = auVar35._28_4_ + auVar34._28_4_;
        auVar159._0_4_ = auVar35._0_4_ + auVar34._0_4_ * 0.0 + auVar279._0_4_ * 0.0;
        auVar159._4_4_ = auVar35._4_4_ + auVar34._4_4_ * 0.0 + auVar279._4_4_ * 0.0;
        auVar159._8_4_ = auVar35._8_4_ + auVar34._8_4_ * 0.0 + auVar279._8_4_ * 0.0;
        auVar159._12_4_ = auVar35._12_4_ + auVar34._12_4_ * 0.0 + auVar279._12_4_ * 0.0;
        auVar159._16_4_ = auVar35._16_4_ + auVar34._16_4_ * 0.0 + auVar279._16_4_ * 0.0;
        auVar159._20_4_ = auVar35._20_4_ + auVar34._20_4_ * 0.0 + auVar279._20_4_ * 0.0;
        auVar159._24_4_ = auVar35._24_4_ + auVar34._24_4_ * 0.0 + auVar279._24_4_ * 0.0;
        auVar159._28_4_ = fVar200 + auVar279._28_4_;
        fVar165 = auVar162._0_4_;
        fVar237 = auVar162._4_4_;
        auVar52._4_4_ = fVar237 * auVar31._4_4_;
        auVar52._0_4_ = fVar165 * auVar31._0_4_;
        fVar166 = auVar162._8_4_;
        auVar52._8_4_ = fVar166 * auVar31._8_4_;
        fVar167 = auVar162._12_4_;
        auVar52._12_4_ = fVar167 * auVar31._12_4_;
        fVar168 = auVar162._16_4_;
        auVar52._16_4_ = fVar168 * auVar31._16_4_;
        fVar201 = auVar162._20_4_;
        auVar52._20_4_ = fVar201 * auVar31._20_4_;
        fVar202 = auVar162._24_4_;
        auVar52._24_4_ = fVar202 * auVar31._24_4_;
        auVar52._28_4_ = fVar200;
        fVar200 = auVar36._0_4_;
        fVar232 = auVar36._4_4_;
        auVar53._4_4_ = auVar37._4_4_ * fVar232;
        auVar53._0_4_ = auVar37._0_4_ * fVar200;
        fVar297 = auVar36._8_4_;
        auVar53._8_4_ = auVar37._8_4_ * fVar297;
        fVar198 = auVar36._12_4_;
        auVar53._12_4_ = auVar37._12_4_ * fVar198;
        fVar305 = auVar36._16_4_;
        auVar53._16_4_ = auVar37._16_4_ * fVar305;
        fVar132 = auVar36._20_4_;
        auVar53._20_4_ = auVar37._20_4_ * fVar132;
        fVar149 = auVar36._24_4_;
        auVar53._24_4_ = auVar37._24_4_ * fVar149;
        auVar53._28_4_ = auVar35._28_4_;
        auVar162 = vsubps_avx(auVar53,auVar52);
        auVar34 = vsubps_avx(local_620,auVar29);
        fVar215 = auVar34._0_4_;
        fVar217 = auVar34._4_4_;
        auVar54._4_4_ = fVar217 * auVar31._4_4_;
        auVar54._0_4_ = fVar215 * auVar31._0_4_;
        fVar247 = auVar34._8_4_;
        auVar54._8_4_ = fVar247 * auVar31._8_4_;
        fVar256 = auVar34._12_4_;
        auVar54._12_4_ = fVar256 * auVar31._12_4_;
        fVar258 = auVar34._16_4_;
        auVar54._16_4_ = fVar258 * auVar31._16_4_;
        fVar260 = auVar34._20_4_;
        auVar54._20_4_ = fVar260 * auVar31._20_4_;
        fVar221 = auVar34._24_4_;
        auVar54._24_4_ = fVar221 * auVar31._24_4_;
        auVar54._28_4_ = auVar31._28_4_;
        auVar55._4_4_ = auVar29._4_4_ * fVar232;
        auVar55._0_4_ = auVar29._0_4_ * fVar200;
        auVar55._8_4_ = auVar29._8_4_ * fVar297;
        auVar55._12_4_ = auVar29._12_4_ * fVar198;
        auVar55._16_4_ = auVar29._16_4_ * fVar305;
        auVar55._20_4_ = auVar29._20_4_ * fVar132;
        auVar55._24_4_ = auVar29._24_4_ * fVar149;
        auVar55._28_4_ = auVar279._28_4_;
        auVar279 = vsubps_avx(auVar54,auVar55);
        auVar56._4_4_ = auVar37._4_4_ * fVar217;
        auVar56._0_4_ = auVar37._0_4_ * fVar215;
        auVar56._8_4_ = auVar37._8_4_ * fVar247;
        auVar56._12_4_ = auVar37._12_4_ * fVar256;
        auVar56._16_4_ = auVar37._16_4_ * fVar258;
        auVar56._20_4_ = auVar37._20_4_ * fVar260;
        auVar56._24_4_ = auVar37._24_4_ * fVar221;
        auVar56._28_4_ = auVar31._28_4_;
        auVar57._4_4_ = auVar29._4_4_ * fVar237;
        auVar57._0_4_ = auVar29._0_4_ * fVar165;
        auVar57._8_4_ = auVar29._8_4_ * fVar166;
        auVar57._12_4_ = auVar29._12_4_ * fVar167;
        auVar57._16_4_ = auVar29._16_4_ * fVar168;
        auVar57._20_4_ = auVar29._20_4_ * fVar201;
        auVar57._24_4_ = auVar29._24_4_ * fVar202;
        auVar57._28_4_ = auVar29._28_4_;
        auVar29 = vsubps_avx(auVar57,auVar56);
        auVar210._0_4_ = auVar162._0_4_ * 0.0 + auVar29._0_4_ + auVar279._0_4_ * 0.0;
        auVar210._4_4_ = auVar162._4_4_ * 0.0 + auVar29._4_4_ + auVar279._4_4_ * 0.0;
        auVar210._8_4_ = auVar162._8_4_ * 0.0 + auVar29._8_4_ + auVar279._8_4_ * 0.0;
        auVar210._12_4_ = auVar162._12_4_ * 0.0 + auVar29._12_4_ + auVar279._12_4_ * 0.0;
        auVar210._16_4_ = auVar162._16_4_ * 0.0 + auVar29._16_4_ + auVar279._16_4_ * 0.0;
        auVar210._20_4_ = auVar162._20_4_ * 0.0 + auVar29._20_4_ + auVar279._20_4_ * 0.0;
        auVar210._24_4_ = auVar162._24_4_ * 0.0 + auVar29._24_4_ + auVar279._24_4_ * 0.0;
        auVar210._28_4_ = auVar29._28_4_ + auVar29._28_4_ + auVar279._28_4_;
        auVar162 = vmaxps_avx(auVar159,auVar210);
        auVar162 = vcmpps_avx(auVar162,ZEXT832(0) << 0x20,2);
        auVar327 = vpackssdw_avx(auVar162._0_16_,auVar162._16_16_);
        auVar327 = vpand_avx(auVar327,local_780._0_16_);
        auVar176 = vpmovsxwd_avx(auVar327);
        auVar207 = vpunpckhwd_avx(auVar327,auVar327);
        auVar190._16_16_ = auVar207;
        auVar190._0_16_ = auVar176;
        if ((((((((auVar190 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar190 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar190 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar190 >> 0x7f,0) == '\0') &&
              (auVar190 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar207 >> 0x3f,0) == '\0') &&
            (auVar190 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar207[0xf]) {
LAB_0104cdd6:
          auVar163 = ZEXT3264(CONCAT824(uStack_488,
                                        CONCAT816(uStack_490,CONCAT88(uStack_498,local_4a0))));
          auVar145 = ZEXT3264(local_4e0);
        }
        else {
          auVar58._4_4_ = fVar232 * fVar213;
          auVar58._0_4_ = fVar200 * fVar183;
          auVar58._8_4_ = fVar297 * fVar233;
          auVar58._12_4_ = fVar198 * fVar223;
          auVar58._16_4_ = fVar305 * fVar296;
          auVar58._20_4_ = fVar132 * fVar235;
          auVar58._24_4_ = fVar149 * fVar146;
          auVar58._28_4_ = auVar207._12_4_;
          auVar311._0_4_ = fVar165 * fVar214;
          auVar311._4_4_ = fVar237 * fVar182;
          auVar311._8_4_ = fVar166 * fVar222;
          auVar311._12_4_ = fVar167 * fVar246;
          auVar311._16_4_ = fVar168 * fVar219;
          auVar311._20_4_ = fVar201 * fVar220;
          auVar311._24_4_ = fVar202 * fVar203;
          auVar311._28_4_ = 0;
          auVar162 = vsubps_avx(auVar311,auVar58);
          auVar59._4_4_ = fVar217 * fVar182;
          auVar59._0_4_ = fVar215 * fVar214;
          auVar59._8_4_ = fVar247 * fVar222;
          auVar59._12_4_ = fVar256 * fVar246;
          auVar59._16_4_ = fVar258 * fVar219;
          auVar59._20_4_ = fVar260 * fVar220;
          auVar59._24_4_ = fVar221 * fVar203;
          auVar59._28_4_ = auVar33._28_4_;
          auVar60._4_4_ = fVar232 * fVar224;
          auVar60._0_4_ = fVar200 * fVar196;
          auVar60._8_4_ = fVar297 * fVar170;
          auVar60._12_4_ = fVar198 * fVar304;
          auVar60._16_4_ = fVar305 * fVar199;
          auVar60._20_4_ = fVar132 * fVar307;
          auVar60._24_4_ = fVar149 * fVar147;
          auVar60._28_4_ = auVar36._28_4_;
          auVar37 = vsubps_avx(auVar60,auVar59);
          auVar61._4_4_ = fVar237 * fVar224;
          auVar61._0_4_ = fVar165 * fVar196;
          auVar61._8_4_ = fVar166 * fVar170;
          auVar61._12_4_ = fVar167 * fVar304;
          auVar61._16_4_ = fVar168 * fVar199;
          auVar61._20_4_ = fVar201 * fVar307;
          auVar61._24_4_ = fVar202 * fVar147;
          auVar61._28_4_ = auVar159._28_4_;
          auVar62._4_4_ = fVar217 * fVar213;
          auVar62._0_4_ = fVar215 * fVar183;
          auVar62._8_4_ = fVar247 * fVar233;
          auVar62._12_4_ = fVar256 * fVar223;
          auVar62._16_4_ = fVar258 * fVar296;
          auVar62._20_4_ = fVar260 * fVar235;
          auVar62._24_4_ = fVar221 * fVar146;
          auVar62._28_4_ = auVar32._28_4_;
          auVar31 = vsubps_avx(auVar62,auVar61);
          auVar255._0_4_ = auVar162._0_4_ * 0.0 + auVar31._0_4_ + auVar37._0_4_ * 0.0;
          auVar255._4_4_ = auVar162._4_4_ * 0.0 + auVar31._4_4_ + auVar37._4_4_ * 0.0;
          auVar255._8_4_ = auVar162._8_4_ * 0.0 + auVar31._8_4_ + auVar37._8_4_ * 0.0;
          auVar255._12_4_ = auVar162._12_4_ * 0.0 + auVar31._12_4_ + auVar37._12_4_ * 0.0;
          auVar255._16_4_ = auVar162._16_4_ * 0.0 + auVar31._16_4_ + auVar37._16_4_ * 0.0;
          auVar255._20_4_ = auVar162._20_4_ * 0.0 + auVar31._20_4_ + auVar37._20_4_ * 0.0;
          auVar255._24_4_ = auVar162._24_4_ * 0.0 + auVar31._24_4_ + auVar37._24_4_ * 0.0;
          auVar255._28_4_ = auVar32._28_4_ + auVar31._28_4_ + auVar159._28_4_;
          auVar29 = vrcpps_avx(auVar255);
          fVar196 = auVar29._0_4_;
          fVar200 = auVar29._4_4_;
          auVar63._4_4_ = auVar255._4_4_ * fVar200;
          auVar63._0_4_ = auVar255._0_4_ * fVar196;
          fVar213 = auVar29._8_4_;
          auVar63._8_4_ = auVar255._8_4_ * fVar213;
          fVar224 = auVar29._12_4_;
          auVar63._12_4_ = auVar255._12_4_ * fVar224;
          fVar232 = auVar29._16_4_;
          auVar63._16_4_ = auVar255._16_4_ * fVar232;
          fVar233 = auVar29._20_4_;
          auVar63._20_4_ = auVar255._20_4_ * fVar233;
          fVar170 = auVar29._24_4_;
          auVar63._24_4_ = auVar255._24_4_ * fVar170;
          auVar63._28_4_ = auVar36._28_4_;
          auVar312._8_4_ = 0x3f800000;
          auVar312._0_8_ = &DAT_3f8000003f800000;
          auVar312._12_4_ = 0x3f800000;
          auVar312._16_4_ = 0x3f800000;
          auVar312._20_4_ = 0x3f800000;
          auVar312._24_4_ = 0x3f800000;
          auVar312._28_4_ = 0x3f800000;
          auVar279 = vsubps_avx(auVar312,auVar63);
          fVar196 = auVar279._0_4_ * fVar196 + fVar196;
          fVar200 = auVar279._4_4_ * fVar200 + fVar200;
          fVar213 = auVar279._8_4_ * fVar213 + fVar213;
          fVar224 = auVar279._12_4_ * fVar224 + fVar224;
          fVar232 = auVar279._16_4_ * fVar232 + fVar232;
          fVar233 = auVar279._20_4_ * fVar233 + fVar233;
          fVar170 = auVar279._24_4_ * fVar170 + fVar170;
          auVar64._4_4_ =
               (auVar162._4_4_ * fVar218 + auVar37._4_4_ * fVar216 + auVar31._4_4_ * fVar169) *
               fVar200;
          auVar64._0_4_ =
               (auVar162._0_4_ * fVar194 + auVar37._0_4_ * fVar193 + auVar31._0_4_ * fVar150) *
               fVar196;
          auVar64._8_4_ =
               (auVar162._8_4_ * fVar294 + auVar37._8_4_ * fVar234 + auVar31._8_4_ * fVar171) *
               fVar213;
          auVar64._12_4_ =
               (auVar162._12_4_ * fVar302 + auVar37._12_4_ * fVar295 + auVar31._12_4_ * fVar195) *
               fVar224;
          auVar64._16_4_ =
               (auVar162._16_4_ * fVar303 + auVar37._16_4_ * fVar308 + auVar31._16_4_ * fVar151) *
               fVar232;
          auVar64._20_4_ =
               (auVar162._20_4_ * fVar148 + auVar37._20_4_ * fVar306 + auVar31._20_4_ * fVar152) *
               fVar233;
          auVar64._24_4_ =
               (auVar162._24_4_ * fVar309 + auVar37._24_4_ * fVar236 + auVar31._24_4_ * fVar164) *
               fVar170;
          auVar64._28_4_ = local_620._28_4_ + auVar189._28_4_ + auVar28._28_4_;
          auVar176 = vpermilps_avx(ZEXT416(local_7c0),0);
          auVar191._16_16_ = auVar176;
          auVar191._0_16_ = auVar176;
          auVar162 = vcmpps_avx(auVar191,auVar64,2);
          fVar183 = ray->tfar;
          auVar228._4_4_ = fVar183;
          auVar228._0_4_ = fVar183;
          auVar228._8_4_ = fVar183;
          auVar228._12_4_ = fVar183;
          auVar228._16_4_ = fVar183;
          auVar228._20_4_ = fVar183;
          auVar228._24_4_ = fVar183;
          auVar228._28_4_ = fVar183;
          auVar28 = vcmpps_avx(auVar64,auVar228,2);
          auVar162 = vandps_avx(auVar28,auVar162);
          auVar176 = vpackssdw_avx(auVar162._0_16_,auVar162._16_16_);
          auVar327 = vpand_avx(auVar327,auVar176);
          auVar176 = vpmovsxwd_avx(auVar327);
          auVar207 = vpshufd_avx(auVar327,0xee);
          auVar207 = vpmovsxwd_avx(auVar207);
          auVar192._16_16_ = auVar207;
          auVar192._0_16_ = auVar176;
          if ((((((((auVar192 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar192 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar192 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar192 >> 0x7f,0) == '\0') &&
                (auVar192 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar207 >> 0x3f,0) == '\0') &&
              (auVar192 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar207[0xf]) goto LAB_0104cdd6;
          auVar162 = vcmpps_avx(ZEXT832(0) << 0x20,auVar255,4);
          auVar176 = vpackssdw_avx(auVar162._0_16_,auVar162._16_16_);
          auVar327 = vpand_avx(auVar327,auVar176);
          auVar176 = vpmovsxwd_avx(auVar327);
          auVar327 = vpunpckhwd_avx(auVar327,auVar327);
          auVar243._16_16_ = auVar327;
          auVar243._0_16_ = auVar176;
          auVar163 = ZEXT3264(CONCAT824(uStack_488,
                                        CONCAT816(uStack_490,CONCAT88(uStack_498,local_4a0))));
          auVar145 = ZEXT3264(local_4e0);
          if ((((((((auVar243 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar243 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar243 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar243 >> 0x7f,0) != '\0') ||
                (auVar243 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar327 >> 0x3f,0) != '\0') ||
              (auVar243 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar327[0xf] < '\0') {
            auVar65._4_4_ = auVar159._4_4_ * fVar200;
            auVar65._0_4_ = auVar159._0_4_ * fVar196;
            auVar65._8_4_ = auVar159._8_4_ * fVar213;
            auVar65._12_4_ = auVar159._12_4_ * fVar224;
            auVar65._16_4_ = auVar159._16_4_ * fVar232;
            auVar65._20_4_ = auVar159._20_4_ * fVar233;
            auVar65._24_4_ = auVar159._24_4_ * fVar170;
            auVar65._28_4_ = local_460._28_4_;
            auVar66._4_4_ = auVar210._4_4_ * fVar200;
            auVar66._0_4_ = auVar210._0_4_ * fVar196;
            auVar66._8_4_ = auVar210._8_4_ * fVar213;
            auVar66._12_4_ = auVar210._12_4_ * fVar224;
            auVar66._16_4_ = auVar210._16_4_ * fVar232;
            auVar66._20_4_ = auVar210._20_4_ * fVar233;
            auVar66._24_4_ = auVar210._24_4_ * fVar170;
            auVar66._28_4_ = auVar279._28_4_ + auVar29._28_4_;
            auVar229._8_4_ = 0x3f800000;
            auVar229._0_8_ = &DAT_3f8000003f800000;
            auVar229._12_4_ = 0x3f800000;
            auVar229._16_4_ = 0x3f800000;
            auVar229._20_4_ = 0x3f800000;
            auVar229._24_4_ = 0x3f800000;
            auVar229._28_4_ = 0x3f800000;
            auVar162 = vsubps_avx(auVar229,auVar65);
            auVar162 = vblendvps_avx(auVar162,auVar65,auVar324);
            auVar145 = ZEXT3264(auVar162);
            auVar162 = vsubps_avx(auVar229,auVar66);
            _local_360 = vblendvps_avx(auVar162,auVar66,auVar324);
            auVar163 = ZEXT3264(auVar243);
            local_460 = auVar64;
          }
        }
        auVar284 = ZEXT3264(auVar269);
        local_4e0 = auVar145._0_32_;
        auVar162 = auVar163._0_32_;
        if ((((((((auVar162 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar162 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar162 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar162 >> 0x7f,0) == '\0') &&
              (auVar163 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar162 >> 0xbf,0) == '\0') &&
            (auVar163 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar163[0x1f]) {
          p_Var131 = (RTCFilterFunctionN)0x0;
        }
        else {
          auVar28 = vsubps_avx(local_6a0._0_32_,_local_7e0);
          fVar193 = (float)local_7e0 + auVar28._0_4_ * auVar145._0_4_;
          fVar194 = (float)auStack_7dc._0_4_ + auVar28._4_4_ * auVar145._4_4_;
          fVar196 = (float)auStack_7dc._4_4_ + auVar28._8_4_ * auVar145._8_4_;
          fVar200 = fStack_7d4 + auVar28._12_4_ * auVar145._12_4_;
          fVar213 = fStack_7d0 + auVar28._16_4_ * auVar145._16_4_;
          fVar216 = fStack_7cc + auVar28._20_4_ * auVar145._20_4_;
          fVar218 = fStack_7c8 + auVar28._24_4_ * auVar145._24_4_;
          fVar224 = fStack_7c4 + auVar28._28_4_;
          fVar183 = local_788->depth_scale;
          auVar67._4_4_ = (fVar194 + fVar194) * fVar183;
          auVar67._0_4_ = (fVar193 + fVar193) * fVar183;
          auVar67._8_4_ = (fVar196 + fVar196) * fVar183;
          auVar67._12_4_ = (fVar200 + fVar200) * fVar183;
          auVar67._16_4_ = (fVar213 + fVar213) * fVar183;
          auVar67._20_4_ = (fVar216 + fVar216) * fVar183;
          auVar67._24_4_ = (fVar218 + fVar218) * fVar183;
          auVar67._28_4_ = fVar224 + fVar224;
          auVar28 = vcmpps_avx(local_460,auVar67,6);
          auVar29 = auVar162 & auVar28;
          if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar29 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar29 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar29 >> 0x7f,0) != '\0') ||
                (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar29 >> 0xbf,0) != '\0') ||
              (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar29[0x1f] < '\0') {
            local_220 = vandps_avx(auVar28,auVar162);
            local_2c0._0_4_ = (float)local_360._0_4_ + (float)local_360._0_4_ + -1.0;
            local_2c0._4_4_ = (float)local_360._4_4_ + (float)local_360._4_4_ + -1.0;
            fStack_2b8 = (float)uStack_358 + (float)uStack_358 + -1.0;
            fStack_2b4 = uStack_358._4_4_ + uStack_358._4_4_ + -1.0;
            fStack_2b0 = (float)uStack_350 + (float)uStack_350 + -1.0;
            fStack_2ac = uStack_350._4_4_ + uStack_350._4_4_ + -1.0;
            fStack_2a8 = (float)uStack_348 + (float)uStack_348 + -1.0;
            fStack_2a4 = uStack_348._4_4_ + uStack_348._4_4_ + -1.0;
            local_280 = 0;
            uStack_268 = uStack_668;
            uStack_258 = local_4b0._8_8_;
            local_250 = local_3e0._0_8_;
            uStack_248 = local_3e0._8_8_;
            uStack_238 = local_3d0._8_8_;
            local_360._4_4_ = local_2c0._4_4_;
            local_360._0_4_ = local_2c0._0_4_;
            uStack_358._0_4_ = fStack_2b8;
            uStack_358._4_4_ = fStack_2b4;
            uStack_350._0_4_ = fStack_2b0;
            uStack_350._4_4_ = fStack_2ac;
            auVar157 = _local_360;
            uStack_348._0_4_ = fStack_2a8;
            uStack_348._4_4_ = fStack_2a4;
            auVar162 = _local_360;
            if ((pGVar15->mask & ray->mask) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (p_Var131 = (RTCFilterFunctionN)CONCAT71((int7)((ulong)p_Var131 >> 8),1),
                 pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auVar178._0_4_ = 1.0 / local_3c0;
                auVar178._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar327 = vshufps_avx(auVar178,auVar178,0);
                local_200[0] = auVar327._0_4_ * (auVar145._0_4_ + 0.0);
                local_200[1] = auVar327._4_4_ * (auVar145._4_4_ + 1.0);
                local_200[2] = auVar327._8_4_ * (auVar145._8_4_ + 2.0);
                local_200[3] = auVar327._12_4_ * (auVar145._12_4_ + 3.0);
                fStack_1f0 = auVar327._0_4_ * (auVar145._16_4_ + 4.0);
                fStack_1ec = auVar327._4_4_ * (auVar145._20_4_ + 5.0);
                fStack_1e8 = auVar327._8_4_ * (auVar145._24_4_ + 6.0);
                fStack_1e4 = auVar145._28_4_ + 7.0;
                uStack_350 = auVar157._16_8_;
                uStack_348 = auVar162._24_8_;
                local_1e0 = local_360;
                uStack_1d8 = uStack_358;
                uStack_1d0 = uStack_350;
                uStack_1c8 = uStack_348;
                local_1c0 = local_460;
                iVar124 = vmovmskps_avx(local_220);
                uVar126 = CONCAT44((int)((ulong)context->args >> 0x20),iVar124);
                lVar130 = 0;
                if (uVar126 != 0) {
                  for (; (uVar126 >> lVar130 & 1) == 0; lVar130 = lVar130 + 1) {
                  }
                }
                uVar128 = CONCAT71((int7)((ulong)p_Var131 >> 8),iVar124 != 0);
                auVar28 = local_4e0;
                _local_360 = auVar162;
                if (iVar124 != 0) {
                  local_780._0_8_ = uVar126;
                  _auStack_6b0 = auVar30._16_16_;
                  uStack_6b8 = local_4b0._8_8_;
                  local_6c0 = (undefined1  [8])local_4b0._0_8_;
                  _auStack_5b0 = auVar208._16_16_;
                  _local_5c0 = local_3e0;
                  _auStack_6d0 = auVar188._16_16_;
                  uStack_6d8 = local_3d0._8_8_;
                  local_6e0 = (undefined1  [8])local_3d0._0_8_;
                  _local_560 = auVar269;
                  local_2e0 = local_4e0;
                  local_2a0 = local_460;
                  local_27c = uVar127;
                  local_270 = local_670;
                  local_260 = local_4b0._0_8_;
                  local_240 = local_3d0._0_8_;
                  do {
                    local_654 = local_200[lVar130];
                    local_650 = *(undefined4 *)((long)&local_1e0 + lVar130 * 4);
                    local_620._0_4_ = ray->tfar;
                    local_6a0._0_8_ = lVar130;
                    ray->tfar = *(float *)(local_1c0 + lVar130 * 4);
                    local_730.context = context->user;
                    fVar193 = 1.0 - local_654;
                    fVar183 = local_654 * fVar193 + local_654 * fVar193;
                    auVar327 = ZEXT416((uint)(local_654 * local_654 * 3.0));
                    auVar327 = vshufps_avx(auVar327,auVar327,0);
                    auVar176 = ZEXT416((uint)((fVar183 - local_654 * local_654) * 3.0));
                    auVar176 = vshufps_avx(auVar176,auVar176,0);
                    auVar207 = ZEXT416((uint)((fVar193 * fVar193 - fVar183) * 3.0));
                    auVar207 = vshufps_avx(auVar207,auVar207,0);
                    auVar187 = ZEXT416((uint)(fVar193 * fVar193 * -3.0));
                    auVar187 = vshufps_avx(auVar187,auVar187,0);
                    auVar179._0_4_ =
                         auVar187._0_4_ * (float)local_670._0_4_ +
                         auVar207._0_4_ * (float)local_6c0._0_4_ +
                         auVar327._0_4_ * (float)local_6e0._0_4_ +
                         auVar176._0_4_ * (float)local_5c0._0_4_;
                    auVar179._4_4_ =
                         auVar187._4_4_ * (float)local_670._4_4_ +
                         auVar207._4_4_ * (float)local_6c0._4_4_ +
                         auVar327._4_4_ * (float)local_6e0._4_4_ +
                         auVar176._4_4_ * (float)local_5c0._4_4_;
                    auVar179._8_4_ =
                         auVar187._8_4_ * (float)uStack_668 +
                         auVar207._8_4_ * (float)uStack_6b8 +
                         auVar327._8_4_ * (float)uStack_6d8 + auVar176._8_4_ * fStack_5b8;
                    auVar179._12_4_ =
                         auVar187._12_4_ * uStack_668._4_4_ +
                         auVar207._12_4_ * uStack_6b8._4_4_ +
                         auVar327._12_4_ * uStack_6d8._4_4_ + auVar176._12_4_ * fStack_5b4;
                    local_660 = vmovlps_avx(auVar179);
                    local_658 = vextractps_avx(auVar179,2);
                    local_64c = (undefined4)local_628;
                    local_648 = (undefined4)local_790;
                    local_644 = (local_730.context)->instID[0];
                    local_640 = (local_730.context)->instPrimID[0];
                    local_7ec = -1;
                    local_730.valid = &local_7ec;
                    local_730.geometryUserPtr = pGVar15->userPtr;
                    local_730.hit = (RTCHitN *)&local_660;
                    local_730.N = 1;
                    local_7e0 = (undefined1  [4])(int)uVar128;
                    local_730.ray = (RTCRayN *)ray;
                    if (pGVar15->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0104d095:
                      auVar269 = auVar284._0_32_;
                      p_Var131 = context->args->filter;
                      auVar28 = auVar145._0_32_;
                      if (p_Var131 == (RTCFilterFunctionN)0x0) break;
                      if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                         (((pGVar15->field_8).field_0x2 & 0x40) != 0)) {
                        (*p_Var131)(&local_730);
                        uVar128 = (ulong)(uint)local_7e0;
                        auVar284 = ZEXT3264(_local_560);
                        auVar145 = ZEXT3264(local_4e0);
                        prim = local_7e8;
                        fVar273 = (float)local_700._0_4_;
                        fVar274 = (float)local_700._4_4_;
                        fVar275 = fStack_6f8;
                        fVar276 = fStack_6f4;
                        fVar298 = fStack_6f0;
                        fVar181 = fStack_6ec;
                        fVar301 = fStack_6e8;
                        fVar197 = fStack_6e4;
                      }
                      auVar269 = auVar284._0_32_;
                      auVar28 = auVar145._0_32_;
                      if (*local_730.valid != 0) break;
                    }
                    else {
                      (*pGVar15->occlusionFilterN)(&local_730);
                      uVar128 = (ulong)(uint)local_7e0;
                      auVar284 = ZEXT3264(_local_560);
                      auVar145 = ZEXT3264(local_4e0);
                      prim = local_7e8;
                      fVar273 = (float)local_700._0_4_;
                      fVar274 = (float)local_700._4_4_;
                      fVar275 = fStack_6f8;
                      fVar276 = fStack_6f4;
                      fVar298 = fStack_6f0;
                      fVar181 = fStack_6ec;
                      fVar301 = fStack_6e8;
                      fVar197 = fStack_6e4;
                      if (*local_730.valid != 0) goto LAB_0104d095;
                    }
                    auVar269 = auVar284._0_32_;
                    ray->tfar = (float)local_620._0_4_;
                    uVar126 = local_780._0_8_ ^ 1L << (local_6a0._0_8_ & 0x3f);
                    lVar130 = 0;
                    if (uVar126 != 0) {
                      for (; (uVar126 >> lVar130 & 1) == 0; lVar130 = lVar130 + 1) {
                      }
                    }
                    local_780._0_8_ = uVar126;
                    uVar128 = CONCAT71((int7)(uVar128 >> 8),uVar126 != 0);
                    auVar28 = auVar145._0_32_;
                  } while (uVar126 != 0);
                }
                local_4e0 = auVar28;
                p_Var131 = (RTCFilterFunctionN)(uVar128 & 0xffffffffffffff01);
              }
              goto LAB_0104bf78;
            }
          }
          p_Var131 = (RTCFilterFunctionN)0x0;
        }
LAB_0104bf78:
        local_7e8 = prim;
        auVar327 = local_760._0_16_;
      }
      auVar163 = ZEXT1664(auVar327);
      if (8 < (int)uVar127) {
        _local_520 = vpshufd_avx(ZEXT416(uVar127),0);
        auVar327 = vshufps_avx(auVar327,auVar327,0);
        local_e0._16_16_ = auVar327;
        local_e0._0_16_ = auVar327;
        auVar113._4_4_ = uStack_7bc;
        auVar113._0_4_ = local_7c0;
        auVar113._8_4_ = fStack_7b8;
        auVar113._12_4_ = fStack_7b4;
        auVar327 = vpermilps_avx(auVar113,0);
        local_100._16_16_ = auVar327;
        local_100._0_16_ = auVar327;
        auVar138._0_4_ = 1.0 / local_3c0;
        auVar138._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar327 = vshufps_avx(auVar138,auVar138,0);
        register0x00001210 = auVar327;
        _local_120 = auVar327;
        auVar145 = ZEXT3264(_local_120);
        lVar130 = 8;
        fVar183 = (float)local_600._0_4_;
        fVar193 = (float)local_600._4_4_;
        fVar194 = fStack_5f8;
        fVar196 = fStack_5f4;
        fVar200 = fStack_5f0;
        fVar213 = fStack_5ec;
        fVar216 = fStack_5e8;
        fVar218 = fStack_5e4;
        fVar224 = (float)local_580._0_4_;
        fVar232 = (float)local_580._4_4_;
        fVar233 = fStack_578;
        fVar234 = fStack_574;
        fVar294 = fStack_570;
        fVar170 = fStack_56c;
        fVar297 = fStack_568;
        fVar223 = (float)local_480._0_4_;
        fVar295 = (float)local_480._4_4_;
        fVar302 = fStack_478;
        fVar304 = fStack_474;
        fVar198 = fStack_470;
        fVar296 = fStack_46c;
        fVar308 = fStack_468;
        _local_560 = auVar269;
        do {
          pauVar9 = (undefined1 (*) [28])(bezier_basis0 + lVar130 * 4 + lVar19);
          fVar303 = *(float *)*pauVar9;
          fVar199 = *(float *)(*pauVar9 + 4);
          fVar305 = *(float *)(*pauVar9 + 8);
          fVar235 = *(float *)(*pauVar9 + 0xc);
          fVar306 = *(float *)(*pauVar9 + 0x10);
          fVar148 = *(float *)(*pauVar9 + 0x14);
          fVar307 = *(float *)(*pauVar9 + 0x18);
          auVar121 = *pauVar9;
          pauVar11 = (undefined1 (*) [28])(lVar19 + 0x2227768 + lVar130 * 4);
          fVar132 = *(float *)*pauVar11;
          fVar146 = *(float *)(*pauVar11 + 4);
          fVar236 = *(float *)(*pauVar11 + 8);
          fVar309 = *(float *)(*pauVar11 + 0xc);
          fVar147 = *(float *)(*pauVar11 + 0x10);
          fVar149 = *(float *)(*pauVar11 + 0x14);
          fVar150 = *(float *)(*pauVar11 + 0x18);
          auVar120 = *pauVar11;
          pauVar11 = (undefined1 (*) [28])(lVar19 + 0x2227bec + lVar130 * 4);
          fVar169 = *(float *)*pauVar11;
          fVar171 = *(float *)(*pauVar11 + 4);
          fVar195 = *(float *)(*pauVar11 + 8);
          fVar151 = *(float *)(*pauVar11 + 0xc);
          fVar152 = *(float *)(*pauVar11 + 0x10);
          fVar164 = *(float *)(*pauVar11 + 0x14);
          fVar165 = *(float *)(*pauVar11 + 0x18);
          auVar119 = *pauVar11;
          pauVar11 = (undefined1 (*) [28])(lVar19 + 0x2228070 + lVar130 * 4);
          fVar237 = *(float *)*pauVar11;
          fVar166 = *(float *)(*pauVar11 + 4);
          fVar167 = *(float *)(*pauVar11 + 8);
          fVar168 = *(float *)(*pauVar11 + 0xc);
          fVar201 = *(float *)(*pauVar11 + 0x10);
          fVar202 = *(float *)(*pauVar11 + 0x14);
          fVar214 = *(float *)(*pauVar11 + 0x18);
          auVar118 = *pauVar11;
          fVar182 = fVar218 + *(float *)pauVar11[1];
          fStack_7a4 = fVar218 + fVar218 + auVar145._28_4_;
          fVar222 = fVar218 + fVar182;
          auVar281._0_4_ =
               (float)local_340._0_4_ * fVar303 +
               fVar273 * fVar132 + fVar224 * fVar169 + (float)local_3a0._0_4_ * fVar237;
          auVar281._4_4_ =
               (float)local_340._4_4_ * fVar199 +
               fVar274 * fVar146 + fVar232 * fVar171 + (float)local_3a0._4_4_ * fVar166;
          auVar281._8_4_ =
               fStack_338 * fVar305 + fVar275 * fVar236 + fVar233 * fVar195 + fStack_398 * fVar167;
          auVar281._12_4_ =
               fStack_334 * fVar235 + fVar276 * fVar309 + fVar234 * fVar151 + fStack_394 * fVar168;
          auVar281._16_4_ =
               fStack_330 * fVar306 + fVar298 * fVar147 + fVar294 * fVar152 + fStack_390 * fVar201;
          auVar281._20_4_ =
               fStack_32c * fVar148 + fVar181 * fVar149 + fVar170 * fVar164 + fStack_38c * fVar202;
          auVar281._24_4_ =
               fStack_328 * fVar307 + fVar301 * fVar150 + fVar297 * fVar165 + fStack_388 * fVar214;
          auVar281._28_4_ = fVar182 + fStack_7a4;
          local_760._0_4_ =
               (float)local_400._0_4_ * fVar303 +
               fVar223 * fVar132 + (float)local_5a0._0_4_ * fVar169 + fVar183 * fVar237;
          local_760._4_4_ =
               (float)local_400._4_4_ * fVar199 +
               fVar295 * fVar146 + (float)local_5a0._4_4_ * fVar171 + fVar193 * fVar166;
          local_760._8_4_ =
               fStack_3f8 * fVar305 + fVar302 * fVar236 + fStack_598 * fVar195 + fVar194 * fVar167;
          local_760._12_4_ =
               fStack_3f4 * fVar235 + fVar304 * fVar309 + fStack_594 * fVar151 + fVar196 * fVar168;
          local_760._16_4_ =
               fStack_3f0 * fVar306 + fVar198 * fVar147 + fStack_590 * fVar152 + fVar200 * fVar201;
          local_760._20_4_ =
               fStack_3ec * fVar148 + fVar296 * fVar149 + fStack_58c * fVar164 + fVar213 * fVar202;
          local_760._24_4_ =
               fStack_3e8 * fVar307 + fVar308 * fVar150 + fStack_588 * fVar165 + fVar216 * fVar214;
          local_760._28_4_ = fStack_7a4 + fVar218 + fVar218 + auVar163._28_4_;
          fVar132 = (float)local_a0._0_4_ * fVar303 +
                    fVar132 * (float)local_160._0_4_ +
                    (float)local_140._0_4_ * fVar169 + (float)local_80._0_4_ * fVar237;
          fVar146 = (float)local_a0._4_4_ * fVar199 +
                    fVar146 * (float)local_160._4_4_ +
                    (float)local_140._4_4_ * fVar171 + (float)local_80._4_4_ * fVar166;
          fStack_7b8 = fStack_98 * fVar305 +
                       fVar236 * fStack_158 + fStack_138 * fVar195 + fStack_78 * fVar167;
          fStack_7b4 = fStack_94 * fVar235 +
                       fVar309 * fStack_154 + fStack_134 * fVar151 + fStack_74 * fVar168;
          fStack_7b0 = fStack_90 * fVar306 +
                       fVar147 * fStack_150 + fStack_130 * fVar152 + fStack_70 * fVar201;
          fStack_7ac = fStack_8c * fVar148 +
                       fVar149 * fStack_14c + fStack_12c * fVar164 + fStack_6c * fVar202;
          fStack_7a8 = fStack_88 * fVar307 +
                       fVar150 * fStack_148 + fStack_128 * fVar165 + fStack_68 * fVar214;
          fStack_7a4 = fStack_7a4 + fVar222;
          auVar157 = *(undefined1 (*) [24])(bezier_basis1 + lVar130 * 4 + lVar19);
          auVar162 = *(undefined1 (*) [32])(lVar19 + 0x2229b88 + lVar130 * 4);
          auVar145 = ZEXT3264(auVar162);
          auVar30 = *(undefined1 (*) [32])(lVar19 + 0x222a00c + lVar130 * 4);
          auVar163 = ZEXT3264(auVar30);
          pauVar11 = (undefined1 (*) [28])(lVar19 + 0x222a490 + lVar130 * 4);
          fVar224 = *(float *)*pauVar11;
          fVar232 = *(float *)(*pauVar11 + 4);
          fVar233 = *(float *)(*pauVar11 + 8);
          fVar234 = *(float *)(*pauVar11 + 0xc);
          fVar294 = *(float *)(*pauVar11 + 0x10);
          fVar170 = *(float *)(*pauVar11 + 0x14);
          fVar297 = *(float *)(*pauVar11 + 0x18);
          auVar122 = *pauVar11;
          fVar236 = auVar30._0_4_;
          fVar309 = auVar30._4_4_;
          fVar147 = auVar30._8_4_;
          fVar149 = auVar30._12_4_;
          fVar150 = auVar30._16_4_;
          fVar169 = auVar30._20_4_;
          fVar171 = auVar30._24_4_;
          local_7e0 = auVar157._0_4_;
          auStack_7dc._0_4_ = auVar157._4_4_;
          auStack_7dc._4_4_ = auVar157._8_4_;
          fStack_7d4 = auVar157._12_4_;
          fStack_7d0 = auVar157._16_4_;
          fStack_7cc = auVar157._20_4_;
          fStack_7c8 = (float)*(undefined8 *)
                               ((undefined1 (*) [24])(bezier_basis1 + lVar130 * 4 + lVar19))[1];
          fVar303 = auVar162._0_4_;
          fVar199 = auVar162._4_4_;
          fVar305 = auVar162._8_4_;
          fVar235 = auVar162._12_4_;
          fVar306 = auVar162._16_4_;
          fVar148 = auVar162._20_4_;
          fVar307 = auVar162._24_4_;
          fVar223 = fVar218 + fVar218 + fVar222;
          auVar244._0_4_ =
               (float)local_340._0_4_ * (float)local_7e0 +
               fVar273 * fVar303 +
               fVar236 * (float)local_580._0_4_ + (float)local_3a0._0_4_ * fVar224;
          auVar244._4_4_ =
               (float)local_340._4_4_ * (float)auStack_7dc._0_4_ +
               fVar274 * fVar199 +
               fVar309 * (float)local_580._4_4_ + (float)local_3a0._4_4_ * fVar232;
          auVar244._8_4_ =
               fStack_338 * (float)auStack_7dc._4_4_ +
               fVar275 * fVar305 + fVar147 * fStack_578 + fStack_398 * fVar233;
          auVar244._12_4_ =
               fStack_334 * fStack_7d4 +
               fVar276 * fVar235 + fVar149 * fStack_574 + fStack_394 * fVar234;
          auVar244._16_4_ =
               fStack_330 * fStack_7d0 +
               fVar298 * fVar306 + fVar150 * fStack_570 + fStack_390 * fVar294;
          auVar244._20_4_ =
               fStack_32c * fStack_7cc +
               fVar181 * fVar148 + fVar169 * fStack_56c + fStack_38c * fVar170;
          auVar244._24_4_ =
               fStack_328 * fStack_7c8 +
               fVar301 * fVar307 + fVar171 * fStack_568 + fStack_388 * fVar297;
          auVar244._28_4_ = fVar218 + fStack_64 + fVar223;
          auVar230._0_4_ =
               (float)local_400._0_4_ * (float)local_7e0 +
               (float)local_480._0_4_ * fVar303 +
               (float)local_5a0._0_4_ * fVar236 + fVar224 * fVar183;
          auVar230._4_4_ =
               (float)local_400._4_4_ * (float)auStack_7dc._0_4_ +
               (float)local_480._4_4_ * fVar199 +
               (float)local_5a0._4_4_ * fVar309 + fVar232 * fVar193;
          auVar230._8_4_ =
               fStack_3f8 * (float)auStack_7dc._4_4_ +
               fStack_478 * fVar305 + fStack_598 * fVar147 + fVar233 * fVar194;
          auVar230._12_4_ =
               fStack_3f4 * fStack_7d4 +
               fStack_474 * fVar235 + fStack_594 * fVar149 + fVar234 * fVar196;
          auVar230._16_4_ =
               fStack_3f0 * fStack_7d0 +
               fStack_470 * fVar306 + fStack_590 * fVar150 + fVar294 * fVar200;
          auVar230._20_4_ =
               fStack_3ec * fStack_7cc +
               fStack_46c * fVar148 + fStack_58c * fVar169 + fVar170 * fVar213;
          auVar230._24_4_ =
               fStack_3e8 * fStack_7c8 +
               fStack_468 * fVar307 + fStack_588 * fVar171 + fVar297 * fVar216;
          auVar230._28_4_ = fVar223 + fVar218 + fVar218 + *(float *)pauVar9[1];
          auVar316._0_4_ =
               fVar303 * (float)local_160._0_4_ +
               (float)local_140._0_4_ * fVar236 + fVar224 * (float)local_80._0_4_ +
               (float)local_7e0 * (float)local_a0._0_4_;
          auVar316._4_4_ =
               fVar199 * (float)local_160._4_4_ +
               (float)local_140._4_4_ * fVar309 + fVar232 * (float)local_80._4_4_ +
               (float)auStack_7dc._0_4_ * (float)local_a0._4_4_;
          auVar316._8_4_ =
               fVar305 * fStack_158 + fStack_138 * fVar147 + fVar233 * fStack_78 +
               (float)auStack_7dc._4_4_ * fStack_98;
          auVar316._12_4_ =
               fVar235 * fStack_154 + fStack_134 * fVar149 + fVar234 * fStack_74 +
               fStack_7d4 * fStack_94;
          auVar316._16_4_ =
               fVar306 * fStack_150 + fStack_130 * fVar150 + fVar294 * fStack_70 +
               fStack_7d0 * fStack_90;
          auVar316._20_4_ =
               fVar148 * fStack_14c + fStack_12c * fVar169 + fVar170 * fStack_6c +
               fStack_7cc * fStack_8c;
          auVar316._24_4_ =
               fVar307 * fStack_148 + fStack_128 * fVar171 + fVar297 * fStack_68 +
               fStack_7c8 * fStack_88;
          auVar316._28_4_ = fVar218 + fVar218 + fStack_64 + fVar223;
          auVar29 = vsubps_avx(auVar244,auVar281);
          auVar37 = vsubps_avx(auVar230,local_760._0_32_);
          fVar218 = auVar29._0_4_;
          fVar224 = auVar29._4_4_;
          auVar68._4_4_ = fVar224 * local_760._4_4_;
          auVar68._0_4_ = fVar218 * local_760._0_4_;
          fVar232 = auVar29._8_4_;
          auVar68._8_4_ = fVar232 * local_760._8_4_;
          fVar233 = auVar29._12_4_;
          auVar68._12_4_ = fVar233 * local_760._12_4_;
          fVar234 = auVar29._16_4_;
          auVar68._16_4_ = fVar234 * local_760._16_4_;
          fVar294 = auVar29._20_4_;
          auVar68._20_4_ = fVar294 * local_760._20_4_;
          fVar170 = auVar29._24_4_;
          auVar68._24_4_ = fVar170 * local_760._24_4_;
          auVar68._28_4_ = fVar223;
          fVar183 = auVar37._0_4_;
          fVar193 = auVar37._4_4_;
          auVar69._4_4_ = auVar281._4_4_ * fVar193;
          auVar69._0_4_ = auVar281._0_4_ * fVar183;
          fVar194 = auVar37._8_4_;
          auVar69._8_4_ = auVar281._8_4_ * fVar194;
          fVar196 = auVar37._12_4_;
          auVar69._12_4_ = auVar281._12_4_ * fVar196;
          fVar200 = auVar37._16_4_;
          auVar69._16_4_ = auVar281._16_4_ * fVar200;
          fVar213 = auVar37._20_4_;
          auVar69._20_4_ = auVar281._20_4_ * fVar213;
          fVar216 = auVar37._24_4_;
          auVar69._24_4_ = auVar281._24_4_ * fVar216;
          auVar69._28_4_ = auVar230._28_4_;
          auVar31 = vsubps_avx(auVar68,auVar69);
          auVar114._4_4_ = fVar146;
          auVar114._0_4_ = fVar132;
          auVar114._8_4_ = fStack_7b8;
          auVar114._12_4_ = fStack_7b4;
          auVar114._16_4_ = fStack_7b0;
          auVar114._20_4_ = fStack_7ac;
          auVar114._24_4_ = fStack_7a8;
          auVar114._28_4_ = fStack_7a4;
          auVar28 = vmaxps_avx(auVar114,auVar316);
          auVar70._4_4_ = auVar28._4_4_ * auVar28._4_4_ * (fVar224 * fVar224 + fVar193 * fVar193);
          auVar70._0_4_ = auVar28._0_4_ * auVar28._0_4_ * (fVar218 * fVar218 + fVar183 * fVar183);
          auVar70._8_4_ = auVar28._8_4_ * auVar28._8_4_ * (fVar232 * fVar232 + fVar194 * fVar194);
          auVar70._12_4_ = auVar28._12_4_ * auVar28._12_4_ * (fVar233 * fVar233 + fVar196 * fVar196)
          ;
          auVar70._16_4_ = auVar28._16_4_ * auVar28._16_4_ * (fVar234 * fVar234 + fVar200 * fVar200)
          ;
          auVar70._20_4_ = auVar28._20_4_ * auVar28._20_4_ * (fVar294 * fVar294 + fVar213 * fVar213)
          ;
          auVar70._24_4_ = auVar28._24_4_ * auVar28._24_4_ * (fVar170 * fVar170 + fVar216 * fVar216)
          ;
          auVar70._28_4_ = auVar244._28_4_ + auVar230._28_4_;
          auVar71._4_4_ = auVar31._4_4_ * auVar31._4_4_;
          auVar71._0_4_ = auVar31._0_4_ * auVar31._0_4_;
          auVar71._8_4_ = auVar31._8_4_ * auVar31._8_4_;
          auVar71._12_4_ = auVar31._12_4_ * auVar31._12_4_;
          auVar71._16_4_ = auVar31._16_4_ * auVar31._16_4_;
          auVar71._20_4_ = auVar31._20_4_ * auVar31._20_4_;
          auVar71._24_4_ = auVar31._24_4_ * auVar31._24_4_;
          auVar71._28_4_ = auVar31._28_4_;
          auVar28 = vcmpps_avx(auVar71,auVar70,2);
          local_280 = (uint)lVar130;
          auVar176 = vpshufd_avx(ZEXT416(local_280),0);
          auVar327 = vpor_avx(auVar176,_DAT_01ff0cf0);
          auVar176 = vpor_avx(auVar176,_DAT_02020ea0);
          auVar327 = vpcmpgtd_avx(_local_520,auVar327);
          auVar176 = vpcmpgtd_avx(_local_520,auVar176);
          register0x000012d0 = auVar176;
          _local_420 = auVar327;
          auVar31 = _local_420 & auVar28;
          fVar183 = (float)local_600._0_4_;
          fVar193 = (float)local_600._4_4_;
          fVar194 = fStack_5f8;
          fVar196 = fStack_5f4;
          fVar200 = fStack_5f0;
          fVar213 = fStack_5ec;
          fVar216 = fStack_5e8;
          fVar218 = fStack_5e4;
          fVar224 = (float)local_580._0_4_;
          fVar232 = (float)local_580._4_4_;
          fVar233 = fStack_578;
          fVar234 = fStack_574;
          fVar294 = fStack_570;
          fVar170 = fStack_56c;
          fVar297 = fStack_568;
          fVar223 = (float)local_480._0_4_;
          fVar295 = (float)local_480._4_4_;
          fVar302 = fStack_478;
          fVar304 = fStack_474;
          fVar198 = fStack_470;
          fVar296 = fStack_46c;
          fVar308 = fStack_468;
          if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar31 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar31 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar31 >> 0x7f,0) != '\0') ||
                (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar31 >> 0xbf,0) != '\0') ||
              (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar31[0x1f] < '\0') {
            local_5e0._0_4_ = auVar122._0_4_;
            local_5e0._4_4_ = auVar122._4_4_;
            fStack_5d8 = auVar122._8_4_;
            fStack_5d4 = auVar122._12_4_;
            fStack_5d0 = auVar122._16_4_;
            fStack_5cc = auVar122._20_4_;
            fStack_5c8 = auVar122._24_4_;
            local_5e0._0_4_ =
                 (float)local_7e0 * (float)local_560._0_4_ +
                 (float)local_320._0_4_ * fVar303 +
                 (float)local_c0._0_4_ * fVar236 + (float)local_540._0_4_ * (float)local_5e0._0_4_;
            local_5e0._4_4_ =
                 (float)auStack_7dc._0_4_ * (float)local_560._4_4_ +
                 (float)local_320._4_4_ * fVar199 +
                 (float)local_c0._4_4_ * fVar309 + (float)local_540._4_4_ * (float)local_5e0._4_4_;
            fStack_5d8 = (float)auStack_7dc._4_4_ * fStack_558 +
                         fStack_318 * fVar305 + fStack_b8 * fVar147 + fStack_538 * fStack_5d8;
            fStack_5d4 = fStack_7d4 * fStack_554 +
                         fStack_314 * fVar235 + fStack_b4 * fVar149 + fStack_534 * fStack_5d4;
            fStack_5d0 = fStack_7d0 * fStack_550 +
                         fStack_310 * fVar306 + fStack_b0 * fVar150 + fStack_530 * fStack_5d0;
            fStack_5cc = fStack_7cc * fStack_54c +
                         fStack_30c * fVar148 + fStack_ac * fVar169 + fStack_52c * fStack_5cc;
            fStack_5c8 = fStack_7c8 * fStack_548 +
                         fStack_308 * fVar307 + fStack_a8 * fVar171 + fStack_528 * fStack_5c8;
            fStack_5c4 = auVar281._28_4_ + auVar162._28_4_ + auVar30._28_4_ + 0.0;
            local_5c0._0_4_ = auVar120._0_4_;
            local_5c0._4_4_ = auVar120._4_4_;
            fStack_5b8 = auVar120._8_4_;
            fStack_5b4 = auVar120._12_4_;
            auStack_5b0._0_4_ = auVar120._16_4_;
            auStack_5b0._4_4_ = auVar120._20_4_;
            fStack_5a8 = auVar120._24_4_;
            local_6e0._0_4_ = auVar119._0_4_;
            local_6e0._4_4_ = auVar119._4_4_;
            uStack_6d8._0_4_ = auVar119._8_4_;
            uStack_6d8._4_4_ = auVar119._12_4_;
            auStack_6d0._0_4_ = auVar119._16_4_;
            auStack_6d0._4_4_ = auVar119._20_4_;
            fStack_6c8 = auVar119._24_4_;
            local_500._0_4_ = auVar118._0_4_;
            local_500._4_4_ = auVar118._4_4_;
            fStack_4f8 = auVar118._8_4_;
            fStack_4f4 = auVar118._12_4_;
            fStack_4f0 = auVar118._16_4_;
            fStack_4ec = auVar118._20_4_;
            fStack_4e8 = auVar118._24_4_;
            pfVar1 = (float *)(lVar19 + 0x2228dfc + lVar130 * 4);
            fVar303 = *pfVar1;
            fVar199 = pfVar1[1];
            fVar305 = pfVar1[2];
            fVar235 = pfVar1[3];
            fVar306 = pfVar1[4];
            fVar148 = pfVar1[5];
            fVar307 = pfVar1[6];
            pfVar2 = (float *)(lVar19 + 0x2229280 + lVar130 * 4);
            fVar236 = *pfVar2;
            fVar309 = pfVar2[1];
            fVar147 = pfVar2[2];
            fVar149 = pfVar2[3];
            fVar150 = pfVar2[4];
            fVar169 = pfVar2[5];
            fVar171 = pfVar2[6];
            pfVar3 = (float *)(lVar19 + 0x2228978 + lVar130 * 4);
            fVar195 = *pfVar3;
            fVar151 = pfVar3[1];
            fVar152 = pfVar3[2];
            fVar164 = pfVar3[3];
            fVar165 = pfVar3[4];
            fVar237 = pfVar3[5];
            fVar166 = pfVar3[6];
            fVar222 = pfVar1[7] + pfVar2[7];
            fStack_3a4 = pfVar2[7] + fVar197 + 0.0;
            fVar246 = fVar197 + fStack_324 + fVar197 + 0.0;
            pfVar1 = (float *)(lVar19 + 0x22284f4 + lVar130 * 4);
            fVar197 = *pfVar1;
            fVar167 = pfVar1[1];
            fVar168 = pfVar1[2];
            fVar201 = pfVar1[3];
            fVar202 = pfVar1[4];
            fVar214 = pfVar1[5];
            fVar182 = pfVar1[6];
            local_440 = (float)local_340._0_4_ * fVar197 +
                        fVar195 * fVar273 +
                        (float)local_580._0_4_ * fVar303 + (float)local_3a0._0_4_ * fVar236;
            fStack_43c = (float)local_340._4_4_ * fVar167 +
                         fVar151 * fVar274 +
                         (float)local_580._4_4_ * fVar199 + (float)local_3a0._4_4_ * fVar309;
            fStack_438 = fStack_338 * fVar168 +
                         fVar152 * fVar275 + fStack_578 * fVar305 + fStack_398 * fVar147;
            fStack_434 = fStack_334 * fVar201 +
                         fVar164 * fVar276 + fStack_574 * fVar235 + fStack_394 * fVar149;
            fStack_430 = fStack_330 * fVar202 +
                         fVar165 * fVar298 + fStack_570 * fVar306 + fStack_390 * fVar150;
            fStack_42c = fStack_32c * fVar214 +
                         fVar237 * fVar181 + fStack_56c * fVar148 + fStack_38c * fVar169;
            fStack_428 = fStack_328 * fVar182 +
                         fVar166 * fVar301 + fStack_568 * fVar307 + fStack_388 * fVar171;
            fStack_424 = fVar222 + fStack_3a4;
            local_3c0 = fVar197 * (float)local_400._0_4_ +
                        fVar303 * (float)local_5a0._0_4_ + (float)local_600._0_4_ * fVar236 +
                        (float)local_480._0_4_ * fVar195;
            fStack_3bc = fVar167 * (float)local_400._4_4_ +
                         fVar199 * (float)local_5a0._4_4_ + (float)local_600._4_4_ * fVar309 +
                         (float)local_480._4_4_ * fVar151;
            fStack_3b8 = fVar168 * fStack_3f8 +
                         fVar305 * fStack_598 + fStack_5f8 * fVar147 + fStack_478 * fVar152;
            fStack_3b4 = fVar201 * fStack_3f4 +
                         fVar235 * fStack_594 + fStack_5f4 * fVar149 + fStack_474 * fVar164;
            fStack_3b0 = fVar202 * fStack_3f0 +
                         fVar306 * fStack_590 + fStack_5f0 * fVar150 + fStack_470 * fVar165;
            fStack_3ac = fVar214 * fStack_3ec +
                         fVar148 * fStack_58c + fStack_5ec * fVar169 + fStack_46c * fVar237;
            fStack_3a8 = fVar182 * fStack_3e8 +
                         fVar307 * fStack_588 + fStack_5e8 * fVar171 + fStack_468 * fVar166;
            fStack_3a4 = fStack_3a4 + fVar246;
            auVar317._0_4_ =
                 fVar195 * (float)local_320._0_4_ +
                 (float)local_c0._0_4_ * fVar303 + (float)local_540._0_4_ * fVar236 +
                 fVar197 * (float)local_560._0_4_;
            auVar317._4_4_ =
                 fVar151 * (float)local_320._4_4_ +
                 (float)local_c0._4_4_ * fVar199 + (float)local_540._4_4_ * fVar309 +
                 fVar167 * (float)local_560._4_4_;
            auVar317._8_4_ =
                 fVar152 * fStack_318 + fStack_b8 * fVar305 + fStack_538 * fVar147 +
                 fVar168 * fStack_558;
            auVar317._12_4_ =
                 fVar164 * fStack_314 + fStack_b4 * fVar235 + fStack_534 * fVar149 +
                 fVar201 * fStack_554;
            auVar317._16_4_ =
                 fVar165 * fStack_310 + fStack_b0 * fVar306 + fStack_530 * fVar150 +
                 fVar202 * fStack_550;
            auVar317._20_4_ =
                 fVar237 * fStack_30c + fStack_ac * fVar148 + fStack_52c * fVar169 +
                 fVar214 * fStack_54c;
            auVar317._24_4_ =
                 fVar166 * fStack_308 + fStack_a8 * fVar307 + fStack_528 * fVar171 +
                 fVar182 * fStack_548;
            auVar317._28_4_ = pfVar3[7] + fVar222 + fVar246;
            pfVar1 = (float *)(lVar19 + 0x222b21c + lVar130 * 4);
            fVar197 = *pfVar1;
            fVar303 = pfVar1[1];
            fVar199 = pfVar1[2];
            fVar305 = pfVar1[3];
            fVar235 = pfVar1[4];
            fVar306 = pfVar1[5];
            fVar148 = pfVar1[6];
            pfVar2 = (float *)(lVar19 + 0x222b6a0 + lVar130 * 4);
            fVar307 = *pfVar2;
            fVar236 = pfVar2[1];
            fVar309 = pfVar2[2];
            fVar147 = pfVar2[3];
            fVar149 = pfVar2[4];
            fVar150 = pfVar2[5];
            fVar169 = pfVar2[6];
            pfVar3 = (float *)(lVar19 + 0x222ad98 + lVar130 * 4);
            fVar171 = *pfVar3;
            fVar195 = pfVar3[1];
            fVar151 = pfVar3[2];
            fVar152 = pfVar3[3];
            fVar164 = pfVar3[4];
            fVar165 = pfVar3[5];
            fVar237 = pfVar3[6];
            pfVar4 = (float *)(lVar19 + 0x222a914 + lVar130 * 4);
            fVar166 = *pfVar4;
            fVar167 = pfVar4[1];
            fVar168 = pfVar4[2];
            fVar201 = pfVar4[3];
            fVar202 = pfVar4[4];
            fVar214 = pfVar4[5];
            fVar182 = pfVar4[6];
            auVar282._0_4_ =
                 fVar166 * (float)local_340._0_4_ +
                 fVar171 * fVar273 +
                 (float)local_580._0_4_ * fVar197 + (float)local_3a0._0_4_ * fVar307;
            auVar282._4_4_ =
                 fVar167 * (float)local_340._4_4_ +
                 fVar195 * fVar274 +
                 (float)local_580._4_4_ * fVar303 + (float)local_3a0._4_4_ * fVar236;
            auVar282._8_4_ =
                 fVar168 * fStack_338 +
                 fVar151 * fVar275 + fStack_578 * fVar199 + fStack_398 * fVar309;
            auVar282._12_4_ =
                 fVar201 * fStack_334 +
                 fVar152 * fVar276 + fStack_574 * fVar305 + fStack_394 * fVar147;
            auVar282._16_4_ =
                 fVar202 * fStack_330 +
                 fVar164 * fVar298 + fStack_570 * fVar235 + fStack_390 * fVar149;
            auVar282._20_4_ =
                 fVar214 * fStack_32c +
                 fVar165 * fVar181 + fStack_56c * fVar306 + fStack_38c * fVar150;
            auVar282._24_4_ =
                 fVar182 * fStack_328 +
                 fVar237 * fVar301 + fStack_568 * fVar148 + fStack_388 * fVar169;
            auVar282._28_4_ = fStack_464 + fStack_464 + fStack_384 + fStack_464;
            auVar313._0_4_ =
                 fVar166 * (float)local_400._0_4_ +
                 fVar171 * (float)local_480._0_4_ +
                 fVar197 * (float)local_5a0._0_4_ + (float)local_600._0_4_ * fVar307;
            auVar313._4_4_ =
                 fVar167 * (float)local_400._4_4_ +
                 fVar195 * (float)local_480._4_4_ +
                 fVar303 * (float)local_5a0._4_4_ + (float)local_600._4_4_ * fVar236;
            auVar313._8_4_ =
                 fVar168 * fStack_3f8 +
                 fVar151 * fStack_478 + fVar199 * fStack_598 + fStack_5f8 * fVar309;
            auVar313._12_4_ =
                 fVar201 * fStack_3f4 +
                 fVar152 * fStack_474 + fVar305 * fStack_594 + fStack_5f4 * fVar147;
            auVar313._16_4_ =
                 fVar202 * fStack_3f0 +
                 fVar164 * fStack_470 + fVar235 * fStack_590 + fStack_5f0 * fVar149;
            auVar313._20_4_ =
                 fVar214 * fStack_3ec +
                 fVar165 * fStack_46c + fVar306 * fStack_58c + fStack_5ec * fVar150;
            auVar313._24_4_ =
                 fVar182 * fStack_3e8 +
                 fVar237 * fStack_468 + fVar148 * fStack_588 + fStack_5e8 * fVar169;
            auVar313._28_4_ = fStack_464 + fStack_464 + fStack_324 + fStack_464;
            auVar231._8_4_ = 0x7fffffff;
            auVar231._0_8_ = 0x7fffffff7fffffff;
            auVar231._12_4_ = 0x7fffffff;
            auVar231._16_4_ = 0x7fffffff;
            auVar231._20_4_ = 0x7fffffff;
            auVar231._24_4_ = 0x7fffffff;
            auVar231._28_4_ = 0x7fffffff;
            auVar116._4_4_ = fStack_43c;
            auVar116._0_4_ = local_440;
            auVar116._8_4_ = fStack_438;
            auVar116._12_4_ = fStack_434;
            auVar116._16_4_ = fStack_430;
            auVar116._20_4_ = fStack_42c;
            auVar116._24_4_ = fStack_428;
            auVar116._28_4_ = fStack_424;
            auVar162 = vandps_avx(auVar116,auVar231);
            auVar117._4_4_ = fStack_3bc;
            auVar117._0_4_ = local_3c0;
            auVar117._8_4_ = fStack_3b8;
            auVar117._12_4_ = fStack_3b4;
            auVar117._16_4_ = fStack_3b0;
            auVar117._20_4_ = fStack_3ac;
            auVar117._24_4_ = fStack_3a8;
            auVar117._28_4_ = fStack_3a4;
            auVar31 = vandps_avx(auVar117,auVar231);
            auVar31 = vmaxps_avx(auVar162,auVar31);
            auVar162 = vandps_avx(auVar317,auVar231);
            auVar31 = vmaxps_avx(auVar31,auVar162);
            auVar31 = vcmpps_avx(auVar31,local_e0,1);
            auVar188 = vblendvps_avx(auVar116,auVar29,auVar31);
            auVar142._0_4_ =
                 fVar166 * (float)local_560._0_4_ +
                 fVar171 * (float)local_320._0_4_ +
                 fVar307 * (float)local_540._0_4_ + (float)local_c0._0_4_ * fVar197;
            auVar142._4_4_ =
                 fVar167 * (float)local_560._4_4_ +
                 fVar195 * (float)local_320._4_4_ +
                 fVar236 * (float)local_540._4_4_ + (float)local_c0._4_4_ * fVar303;
            auVar142._8_4_ =
                 fVar168 * fStack_558 +
                 fVar151 * fStack_318 + fVar309 * fStack_538 + fStack_b8 * fVar199;
            auVar142._12_4_ =
                 fVar201 * fStack_554 +
                 fVar152 * fStack_314 + fVar147 * fStack_534 + fStack_b4 * fVar305;
            auVar142._16_4_ =
                 fVar202 * fStack_550 +
                 fVar164 * fStack_310 + fVar149 * fStack_530 + fStack_b0 * fVar235;
            auVar142._20_4_ =
                 fVar214 * fStack_54c +
                 fVar165 * fStack_30c + fVar150 * fStack_52c + fStack_ac * fVar306;
            auVar142._24_4_ =
                 fVar182 * fStack_548 +
                 fVar237 * fStack_308 + fVar169 * fStack_528 + fStack_a8 * fVar148;
            auVar142._28_4_ = auVar162._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
            auVar189 = vblendvps_avx(auVar117,auVar37,auVar31);
            auVar162 = vandps_avx(auVar282,auVar231);
            auVar31 = vandps_avx(auVar313,auVar231);
            auVar208 = vmaxps_avx(auVar162,auVar31);
            auVar162 = vandps_avx(auVar142,auVar231);
            auVar162 = vmaxps_avx(auVar208,auVar162);
            local_6c0._0_4_ = auVar121._0_4_;
            local_6c0._4_4_ = auVar121._4_4_;
            uStack_6b8._0_4_ = auVar121._8_4_;
            uStack_6b8._4_4_ = auVar121._12_4_;
            auStack_6b0._0_4_ = auVar121._16_4_;
            auStack_6b0._4_4_ = auVar121._20_4_;
            fStack_6a8 = auVar121._24_4_;
            auVar31 = vcmpps_avx(auVar162,local_e0,1);
            auVar162 = vblendvps_avx(auVar282,auVar29,auVar31);
            auVar143._0_4_ =
                 (float)local_560._0_4_ * (float)local_6c0._0_4_ +
                 (float)local_320._0_4_ * (float)local_5c0._0_4_ +
                 (float)local_c0._0_4_ * (float)local_6e0._0_4_ +
                 (float)local_540._0_4_ * (float)local_500._0_4_;
            auVar143._4_4_ =
                 (float)local_560._4_4_ * (float)local_6c0._4_4_ +
                 (float)local_320._4_4_ * (float)local_5c0._4_4_ +
                 (float)local_c0._4_4_ * (float)local_6e0._4_4_ +
                 (float)local_540._4_4_ * (float)local_500._4_4_;
            auVar143._8_4_ =
                 fStack_558 * (float)uStack_6b8 +
                 fStack_318 * fStack_5b8 + fStack_b8 * (float)uStack_6d8 + fStack_538 * fStack_4f8;
            auVar143._12_4_ =
                 fStack_554 * uStack_6b8._4_4_ +
                 fStack_314 * fStack_5b4 + fStack_b4 * uStack_6d8._4_4_ + fStack_534 * fStack_4f4;
            auVar143._16_4_ =
                 fStack_550 * (float)auStack_6b0._0_4_ +
                 fStack_310 * (float)auStack_5b0._0_4_ +
                 fStack_b0 * (float)auStack_6d0._0_4_ + fStack_530 * fStack_4f0;
            auVar143._20_4_ =
                 fStack_54c * (float)auStack_6b0._4_4_ +
                 fStack_30c * (float)auStack_5b0._4_4_ +
                 fStack_ac * (float)auStack_6d0._4_4_ + fStack_52c * fStack_4ec;
            auVar143._24_4_ =
                 fStack_548 * fStack_6a8 +
                 fStack_308 * fStack_5a8 + fStack_a8 * fStack_6c8 + fStack_528 * fStack_4e8;
            auVar143._28_4_ = auVar208._28_4_ + fStack_5c4 + auVar30._28_4_ + 0.0;
            auVar30 = vblendvps_avx(auVar313,auVar37,auVar31);
            fVar222 = auVar188._0_4_;
            fVar246 = auVar188._4_4_;
            fVar219 = auVar188._8_4_;
            fVar220 = auVar188._12_4_;
            fVar203 = auVar188._16_4_;
            fVar215 = auVar188._20_4_;
            fVar217 = auVar188._24_4_;
            fVar247 = auVar188._28_4_;
            fVar149 = auVar162._0_4_;
            fVar169 = auVar162._4_4_;
            fVar195 = auVar162._8_4_;
            fVar274 = auVar162._12_4_;
            fVar276 = auVar162._16_4_;
            fVar152 = auVar162._20_4_;
            fVar165 = auVar162._24_4_;
            fVar298 = auVar189._0_4_;
            fVar301 = auVar189._4_4_;
            fVar303 = auVar189._8_4_;
            fVar305 = auVar189._12_4_;
            fVar306 = auVar189._16_4_;
            fVar307 = auVar189._20_4_;
            fVar309 = auVar189._24_4_;
            auVar293._0_4_ = fVar298 * fVar298 + fVar222 * fVar222;
            auVar293._4_4_ = fVar301 * fVar301 + fVar246 * fVar246;
            auVar293._8_4_ = fVar303 * fVar303 + fVar219 * fVar219;
            auVar293._12_4_ = fVar305 * fVar305 + fVar220 * fVar220;
            auVar293._16_4_ = fVar306 * fVar306 + fVar203 * fVar203;
            auVar293._20_4_ = fVar307 * fVar307 + fVar215 * fVar215;
            auVar293._24_4_ = fVar309 * fVar309 + fVar217 * fVar217;
            auVar293._28_4_ = auVar29._28_4_ + auVar37._28_4_;
            auVar29 = vrsqrtps_avx(auVar293);
            fVar181 = auVar29._0_4_;
            fVar197 = auVar29._4_4_;
            auVar72._4_4_ = fVar197 * 1.5;
            auVar72._0_4_ = fVar181 * 1.5;
            fVar199 = auVar29._8_4_;
            auVar72._8_4_ = fVar199 * 1.5;
            fVar235 = auVar29._12_4_;
            auVar72._12_4_ = fVar235 * 1.5;
            fVar148 = auVar29._16_4_;
            auVar72._16_4_ = fVar148 * 1.5;
            fVar236 = auVar29._20_4_;
            auVar72._20_4_ = fVar236 * 1.5;
            fVar147 = auVar29._24_4_;
            auVar72._24_4_ = fVar147 * 1.5;
            auVar72._28_4_ = auVar313._28_4_;
            auVar73._4_4_ = fVar197 * fVar197 * fVar197 * auVar293._4_4_ * 0.5;
            auVar73._0_4_ = fVar181 * fVar181 * fVar181 * auVar293._0_4_ * 0.5;
            auVar73._8_4_ = fVar199 * fVar199 * fVar199 * auVar293._8_4_ * 0.5;
            auVar73._12_4_ = fVar235 * fVar235 * fVar235 * auVar293._12_4_ * 0.5;
            auVar73._16_4_ = fVar148 * fVar148 * fVar148 * auVar293._16_4_ * 0.5;
            auVar73._20_4_ = fVar236 * fVar236 * fVar236 * auVar293._20_4_ * 0.5;
            auVar73._24_4_ = fVar147 * fVar147 * fVar147 * auVar293._24_4_ * 0.5;
            auVar73._28_4_ = auVar293._28_4_;
            auVar31 = vsubps_avx(auVar72,auVar73);
            fVar166 = auVar31._0_4_;
            fVar167 = auVar31._4_4_;
            fVar168 = auVar31._8_4_;
            fVar201 = auVar31._12_4_;
            fVar202 = auVar31._16_4_;
            fVar214 = auVar31._20_4_;
            fVar182 = auVar31._24_4_;
            fVar181 = auVar30._0_4_;
            fVar197 = auVar30._4_4_;
            fVar199 = auVar30._8_4_;
            fVar235 = auVar30._12_4_;
            fVar148 = auVar30._16_4_;
            fVar236 = auVar30._20_4_;
            fVar147 = auVar30._24_4_;
            auVar270._0_4_ = fVar181 * fVar181 + fVar149 * fVar149;
            auVar270._4_4_ = fVar197 * fVar197 + fVar169 * fVar169;
            auVar270._8_4_ = fVar199 * fVar199 + fVar195 * fVar195;
            auVar270._12_4_ = fVar235 * fVar235 + fVar274 * fVar274;
            auVar270._16_4_ = fVar148 * fVar148 + fVar276 * fVar276;
            auVar270._20_4_ = fVar236 * fVar236 + fVar152 * fVar152;
            auVar270._24_4_ = fVar147 * fVar147 + fVar165 * fVar165;
            auVar270._28_4_ = auVar29._28_4_ + auVar162._28_4_;
            auVar162 = vrsqrtps_avx(auVar270);
            fVar150 = auVar162._0_4_;
            fVar171 = auVar162._4_4_;
            auVar74._4_4_ = fVar171 * 1.5;
            auVar74._0_4_ = fVar150 * 1.5;
            fVar273 = auVar162._8_4_;
            auVar74._8_4_ = fVar273 * 1.5;
            fVar275 = auVar162._12_4_;
            auVar74._12_4_ = fVar275 * 1.5;
            fVar151 = auVar162._16_4_;
            auVar74._16_4_ = fVar151 * 1.5;
            fVar164 = auVar162._20_4_;
            auVar74._20_4_ = fVar164 * 1.5;
            fVar237 = auVar162._24_4_;
            auVar74._24_4_ = fVar237 * 1.5;
            auVar74._28_4_ = auVar313._28_4_;
            auVar75._4_4_ = fVar171 * fVar171 * fVar171 * auVar270._4_4_ * 0.5;
            auVar75._0_4_ = fVar150 * fVar150 * fVar150 * auVar270._0_4_ * 0.5;
            auVar75._8_4_ = fVar273 * fVar273 * fVar273 * auVar270._8_4_ * 0.5;
            auVar75._12_4_ = fVar275 * fVar275 * fVar275 * auVar270._12_4_ * 0.5;
            auVar75._16_4_ = fVar151 * fVar151 * fVar151 * auVar270._16_4_ * 0.5;
            auVar75._20_4_ = fVar164 * fVar164 * fVar164 * auVar270._20_4_ * 0.5;
            auVar75._24_4_ = fVar237 * fVar237 * fVar237 * auVar270._24_4_ * 0.5;
            auVar75._28_4_ = auVar270._28_4_;
            auVar30 = vsubps_avx(auVar74,auVar75);
            fVar150 = auVar30._0_4_;
            fVar171 = auVar30._4_4_;
            fVar273 = auVar30._8_4_;
            fVar275 = auVar30._12_4_;
            fVar151 = auVar30._16_4_;
            fVar164 = auVar30._20_4_;
            fVar237 = auVar30._24_4_;
            fVar298 = fVar132 * fVar166 * fVar298;
            fVar301 = fVar146 * fVar167 * fVar301;
            auVar76._4_4_ = fVar301;
            auVar76._0_4_ = fVar298;
            fVar303 = fStack_7b8 * fVar168 * fVar303;
            auVar76._8_4_ = fVar303;
            fVar305 = fStack_7b4 * fVar201 * fVar305;
            auVar76._12_4_ = fVar305;
            fVar306 = fStack_7b0 * fVar202 * fVar306;
            auVar76._16_4_ = fVar306;
            fVar307 = fStack_7ac * fVar214 * fVar307;
            auVar76._20_4_ = fVar307;
            fVar309 = fStack_7a8 * fVar182 * fVar309;
            auVar76._24_4_ = fVar309;
            auVar76._28_4_ = auVar162._28_4_;
            local_6c0._4_4_ = fVar301 + auVar281._4_4_;
            local_6c0._0_4_ = fVar298 + auVar281._0_4_;
            uStack_6b8._0_4_ = fVar303 + auVar281._8_4_;
            uStack_6b8._4_4_ = fVar305 + auVar281._12_4_;
            auStack_6b0._0_4_ = fVar306 + auVar281._16_4_;
            auStack_6b0._4_4_ = fVar307 + auVar281._20_4_;
            fStack_6a8 = fVar309 + auVar281._24_4_;
            fStack_6a4 = auVar162._28_4_ + auVar281._28_4_;
            fVar298 = fVar132 * fVar166 * -fVar222;
            fVar301 = fVar146 * fVar167 * -fVar246;
            auVar77._4_4_ = fVar301;
            auVar77._0_4_ = fVar298;
            fVar303 = fStack_7b8 * fVar168 * -fVar219;
            auVar77._8_4_ = fVar303;
            fVar305 = fStack_7b4 * fVar201 * -fVar220;
            auVar77._12_4_ = fVar305;
            fVar306 = fStack_7b0 * fVar202 * -fVar203;
            auVar77._16_4_ = fVar306;
            fVar307 = fStack_7ac * fVar214 * -fVar215;
            auVar77._20_4_ = fVar307;
            fVar309 = fStack_7a8 * fVar182 * -fVar217;
            auVar77._24_4_ = fVar309;
            auVar77._28_4_ = -fVar247;
            local_6e0._4_4_ = local_760._4_4_ + fVar301;
            local_6e0._0_4_ = local_760._0_4_ + fVar298;
            uStack_6d8._0_4_ = local_760._8_4_ + fVar303;
            uStack_6d8._4_4_ = local_760._12_4_ + fVar305;
            auStack_6d0._0_4_ = local_760._16_4_ + fVar306;
            auStack_6d0._4_4_ = local_760._20_4_ + fVar307;
            fStack_6c8 = local_760._24_4_ + fVar309;
            fStack_6c4 = local_760._28_4_ + -fVar247;
            fVar298 = fVar166 * 0.0 * fVar132;
            fVar301 = fVar167 * 0.0 * fVar146;
            auVar78._4_4_ = fVar301;
            auVar78._0_4_ = fVar298;
            fVar303 = fVar168 * 0.0 * fStack_7b8;
            auVar78._8_4_ = fVar303;
            fVar305 = fVar201 * 0.0 * fStack_7b4;
            auVar78._12_4_ = fVar305;
            fVar306 = fVar202 * 0.0 * fStack_7b0;
            auVar78._16_4_ = fVar306;
            fVar307 = fVar214 * 0.0 * fStack_7ac;
            auVar78._20_4_ = fVar307;
            fVar309 = fVar182 * 0.0 * fStack_7a8;
            auVar78._24_4_ = fVar309;
            auVar78._28_4_ = fVar247;
            auVar208 = vsubps_avx(auVar281,auVar76);
            auVar326._0_4_ = fVar298 + auVar143._0_4_;
            auVar326._4_4_ = fVar301 + auVar143._4_4_;
            auVar326._8_4_ = fVar303 + auVar143._8_4_;
            auVar326._12_4_ = fVar305 + auVar143._12_4_;
            auVar326._16_4_ = fVar306 + auVar143._16_4_;
            auVar326._20_4_ = fVar307 + auVar143._20_4_;
            auVar326._24_4_ = fVar309 + auVar143._24_4_;
            auVar326._28_4_ = fVar247 + auVar143._28_4_;
            fVar298 = auVar316._0_4_ * fVar150 * fVar181;
            fVar181 = auVar316._4_4_ * fVar171 * fVar197;
            auVar79._4_4_ = fVar181;
            auVar79._0_4_ = fVar298;
            fVar301 = auVar316._8_4_ * fVar273 * fVar199;
            auVar79._8_4_ = fVar301;
            fVar197 = auVar316._12_4_ * fVar275 * fVar235;
            auVar79._12_4_ = fVar197;
            fVar303 = auVar316._16_4_ * fVar151 * fVar148;
            auVar79._16_4_ = fVar303;
            fVar199 = auVar316._20_4_ * fVar164 * fVar236;
            auVar79._20_4_ = fVar199;
            fVar305 = auVar316._24_4_ * fVar237 * fVar147;
            auVar79._24_4_ = fVar305;
            auVar79._28_4_ = fStack_7a4;
            auVar32 = vsubps_avx(local_760._0_32_,auVar77);
            auVar318._0_4_ = auVar244._0_4_ + fVar298;
            auVar318._4_4_ = auVar244._4_4_ + fVar181;
            auVar318._8_4_ = auVar244._8_4_ + fVar301;
            auVar318._12_4_ = auVar244._12_4_ + fVar197;
            auVar318._16_4_ = auVar244._16_4_ + fVar303;
            auVar318._20_4_ = auVar244._20_4_ + fVar199;
            auVar318._24_4_ = auVar244._24_4_ + fVar305;
            auVar318._28_4_ = auVar244._28_4_ + fStack_7a4;
            fVar298 = fVar150 * -fVar149 * auVar316._0_4_;
            fVar181 = fVar171 * -fVar169 * auVar316._4_4_;
            auVar80._4_4_ = fVar181;
            auVar80._0_4_ = fVar298;
            fVar301 = fVar273 * -fVar195 * auVar316._8_4_;
            auVar80._8_4_ = fVar301;
            fVar197 = fVar275 * -fVar274 * auVar316._12_4_;
            auVar80._12_4_ = fVar197;
            fVar303 = fVar151 * -fVar276 * auVar316._16_4_;
            auVar80._16_4_ = fVar303;
            fVar199 = fVar164 * -fVar152 * auVar316._20_4_;
            auVar80._20_4_ = fVar199;
            fVar305 = fVar237 * -fVar165 * auVar316._24_4_;
            auVar80._24_4_ = fVar305;
            auVar80._28_4_ = auVar281._28_4_;
            auVar33 = vsubps_avx(auVar143,auVar78);
            auVar211._0_4_ = auVar230._0_4_ + fVar298;
            auVar211._4_4_ = auVar230._4_4_ + fVar181;
            auVar211._8_4_ = auVar230._8_4_ + fVar301;
            auVar211._12_4_ = auVar230._12_4_ + fVar197;
            auVar211._16_4_ = auVar230._16_4_ + fVar303;
            auVar211._20_4_ = auVar230._20_4_ + fVar199;
            auVar211._24_4_ = auVar230._24_4_ + fVar305;
            auVar211._28_4_ = auVar230._28_4_ + auVar281._28_4_;
            fVar298 = fVar150 * 0.0 * auVar316._0_4_;
            fVar181 = fVar171 * 0.0 * auVar316._4_4_;
            auVar81._4_4_ = fVar181;
            auVar81._0_4_ = fVar298;
            fVar301 = fVar273 * 0.0 * auVar316._8_4_;
            auVar81._8_4_ = fVar301;
            fVar197 = fVar275 * 0.0 * auVar316._12_4_;
            auVar81._12_4_ = fVar197;
            fVar303 = fVar151 * 0.0 * auVar316._16_4_;
            auVar81._16_4_ = fVar303;
            fVar199 = fVar164 * 0.0 * auVar316._20_4_;
            auVar81._20_4_ = fVar199;
            fVar305 = fVar237 * 0.0 * auVar316._24_4_;
            auVar81._24_4_ = fVar305;
            auVar81._28_4_ = auVar143._28_4_;
            auVar162 = vsubps_avx(auVar244,auVar79);
            auVar283._0_4_ = (float)local_5e0._0_4_ + fVar298;
            auVar283._4_4_ = (float)local_5e0._4_4_ + fVar181;
            auVar283._8_4_ = fStack_5d8 + fVar301;
            auVar283._12_4_ = fStack_5d4 + fVar197;
            auVar283._16_4_ = fStack_5d0 + fVar303;
            auVar283._20_4_ = fStack_5cc + fVar199;
            auVar283._24_4_ = fStack_5c8 + fVar305;
            auVar283._28_4_ = fStack_5c4 + auVar143._28_4_;
            auVar29 = vsubps_avx(auVar230,auVar80);
            auVar31 = vsubps_avx(_local_5e0,auVar81);
            auVar188 = vsubps_avx(auVar211,auVar32);
            auVar189 = vsubps_avx(auVar283,auVar33);
            auVar82._4_4_ = auVar33._4_4_ * auVar188._4_4_;
            auVar82._0_4_ = auVar33._0_4_ * auVar188._0_4_;
            auVar82._8_4_ = auVar33._8_4_ * auVar188._8_4_;
            auVar82._12_4_ = auVar33._12_4_ * auVar188._12_4_;
            auVar82._16_4_ = auVar33._16_4_ * auVar188._16_4_;
            auVar82._20_4_ = auVar33._20_4_ * auVar188._20_4_;
            auVar82._24_4_ = auVar33._24_4_ * auVar188._24_4_;
            auVar82._28_4_ = auVar313._28_4_;
            auVar83._4_4_ = auVar32._4_4_ * auVar189._4_4_;
            auVar83._0_4_ = auVar32._0_4_ * auVar189._0_4_;
            auVar83._8_4_ = auVar32._8_4_ * auVar189._8_4_;
            auVar83._12_4_ = auVar32._12_4_ * auVar189._12_4_;
            auVar83._16_4_ = auVar32._16_4_ * auVar189._16_4_;
            auVar83._20_4_ = auVar32._20_4_ * auVar189._20_4_;
            auVar83._24_4_ = auVar32._24_4_ * auVar189._24_4_;
            auVar83._28_4_ = fStack_5c4;
            auVar269 = vsubps_avx(auVar83,auVar82);
            auVar84._4_4_ = auVar208._4_4_ * auVar189._4_4_;
            auVar84._0_4_ = auVar208._0_4_ * auVar189._0_4_;
            auVar84._8_4_ = auVar208._8_4_ * auVar189._8_4_;
            auVar84._12_4_ = auVar208._12_4_ * auVar189._12_4_;
            auVar84._16_4_ = auVar208._16_4_ * auVar189._16_4_;
            auVar84._20_4_ = auVar208._20_4_ * auVar189._20_4_;
            auVar84._24_4_ = auVar208._24_4_ * auVar189._24_4_;
            auVar84._28_4_ = auVar189._28_4_;
            auVar189 = vsubps_avx(auVar318,auVar208);
            auVar85._4_4_ = auVar33._4_4_ * auVar189._4_4_;
            auVar85._0_4_ = auVar33._0_4_ * auVar189._0_4_;
            auVar85._8_4_ = auVar33._8_4_ * auVar189._8_4_;
            auVar85._12_4_ = auVar33._12_4_ * auVar189._12_4_;
            auVar85._16_4_ = auVar33._16_4_ * auVar189._16_4_;
            auVar85._20_4_ = auVar33._20_4_ * auVar189._20_4_;
            auVar85._24_4_ = auVar33._24_4_ * auVar189._24_4_;
            auVar85._28_4_ = auVar30._28_4_;
            auVar279 = vsubps_avx(auVar85,auVar84);
            auVar86._4_4_ = auVar32._4_4_ * auVar189._4_4_;
            auVar86._0_4_ = auVar32._0_4_ * auVar189._0_4_;
            auVar86._8_4_ = auVar32._8_4_ * auVar189._8_4_;
            auVar86._12_4_ = auVar32._12_4_ * auVar189._12_4_;
            auVar86._16_4_ = auVar32._16_4_ * auVar189._16_4_;
            auVar86._20_4_ = auVar32._20_4_ * auVar189._20_4_;
            auVar86._24_4_ = auVar32._24_4_ * auVar189._24_4_;
            auVar86._28_4_ = auVar30._28_4_;
            auVar87._4_4_ = auVar208._4_4_ * auVar188._4_4_;
            auVar87._0_4_ = auVar208._0_4_ * auVar188._0_4_;
            auVar87._8_4_ = auVar208._8_4_ * auVar188._8_4_;
            auVar87._12_4_ = auVar208._12_4_ * auVar188._12_4_;
            auVar87._16_4_ = auVar208._16_4_ * auVar188._16_4_;
            auVar87._20_4_ = auVar208._20_4_ * auVar188._20_4_;
            auVar87._24_4_ = auVar208._24_4_ * auVar188._24_4_;
            auVar87._28_4_ = auVar188._28_4_;
            auVar30 = vsubps_avx(auVar87,auVar86);
            auVar160._0_4_ = auVar269._0_4_ * 0.0 + auVar30._0_4_ + auVar279._0_4_ * 0.0;
            auVar160._4_4_ = auVar269._4_4_ * 0.0 + auVar30._4_4_ + auVar279._4_4_ * 0.0;
            auVar160._8_4_ = auVar269._8_4_ * 0.0 + auVar30._8_4_ + auVar279._8_4_ * 0.0;
            auVar160._12_4_ = auVar269._12_4_ * 0.0 + auVar30._12_4_ + auVar279._12_4_ * 0.0;
            auVar160._16_4_ = auVar269._16_4_ * 0.0 + auVar30._16_4_ + auVar279._16_4_ * 0.0;
            auVar160._20_4_ = auVar269._20_4_ * 0.0 + auVar30._20_4_ + auVar279._20_4_ * 0.0;
            auVar160._24_4_ = auVar269._24_4_ * 0.0 + auVar30._24_4_ + auVar279._24_4_ * 0.0;
            auVar160._28_4_ = auVar269._28_4_ + auVar30._28_4_ + auVar279._28_4_;
            auVar324 = vcmpps_avx(auVar160,ZEXT832(0) << 0x20,2);
            auVar162 = vblendvps_avx(auVar162,_local_6c0,auVar324);
            auVar30 = vblendvps_avx(auVar29,_local_6e0,auVar324);
            auVar29 = vblendvps_avx(auVar31,auVar326,auVar324);
            auVar31 = vblendvps_avx(auVar208,auVar318,auVar324);
            auVar188 = vblendvps_avx(auVar32,auVar211,auVar324);
            auVar189 = vblendvps_avx(auVar33,auVar283,auVar324);
            auVar208 = vblendvps_avx(auVar318,auVar208,auVar324);
            auVar269 = vblendvps_avx(auVar211,auVar32,auVar324);
            auVar279 = vblendvps_avx(auVar283,auVar33,auVar324);
            local_760._0_32_ = vandps_avx(auVar28,_local_420);
            auVar208 = vsubps_avx(auVar208,auVar162);
            auVar34 = vsubps_avx(auVar269,auVar30);
            auVar279 = vsubps_avx(auVar279,auVar29);
            auVar35 = vsubps_avx(auVar30,auVar188);
            fVar298 = auVar34._0_4_;
            fVar248 = auVar29._0_4_;
            fVar235 = auVar34._4_4_;
            fVar257 = auVar29._4_4_;
            auVar88._4_4_ = fVar257 * fVar235;
            auVar88._0_4_ = fVar248 * fVar298;
            fVar149 = auVar34._8_4_;
            fVar259 = auVar29._8_4_;
            auVar88._8_4_ = fVar259 * fVar149;
            fVar275 = auVar34._12_4_;
            fVar261 = auVar29._12_4_;
            auVar88._12_4_ = fVar261 * fVar275;
            fVar166 = auVar34._16_4_;
            fVar262 = auVar29._16_4_;
            auVar88._16_4_ = fVar262 * fVar166;
            fVar222 = auVar34._20_4_;
            fVar263 = auVar29._20_4_;
            auVar88._20_4_ = fVar263 * fVar222;
            fVar247 = auVar34._24_4_;
            fVar264 = auVar29._24_4_;
            auVar88._24_4_ = fVar264 * fVar247;
            auVar88._28_4_ = auVar269._28_4_;
            fVar181 = auVar30._0_4_;
            fVar277 = auVar279._0_4_;
            fVar306 = auVar30._4_4_;
            fVar285 = auVar279._4_4_;
            auVar89._4_4_ = fVar285 * fVar306;
            auVar89._0_4_ = fVar277 * fVar181;
            fVar150 = auVar30._8_4_;
            fVar286 = auVar279._8_4_;
            auVar89._8_4_ = fVar286 * fVar150;
            fVar276 = auVar30._12_4_;
            fVar287 = auVar279._12_4_;
            auVar89._12_4_ = fVar287 * fVar276;
            fVar167 = auVar30._16_4_;
            fVar288 = auVar279._16_4_;
            auVar89._16_4_ = fVar288 * fVar167;
            fVar246 = auVar30._20_4_;
            fVar289 = auVar279._20_4_;
            auVar89._20_4_ = fVar289 * fVar246;
            fVar256 = auVar30._24_4_;
            fVar290 = auVar279._24_4_;
            uVar12 = auVar32._28_4_;
            auVar89._24_4_ = fVar290 * fVar256;
            auVar89._28_4_ = uVar12;
            auVar269 = vsubps_avx(auVar89,auVar88);
            fVar301 = auVar162._0_4_;
            fVar148 = auVar162._4_4_;
            auVar90._4_4_ = fVar285 * fVar148;
            auVar90._0_4_ = fVar277 * fVar301;
            fVar169 = auVar162._8_4_;
            auVar90._8_4_ = fVar286 * fVar169;
            fVar151 = auVar162._12_4_;
            auVar90._12_4_ = fVar287 * fVar151;
            fVar168 = auVar162._16_4_;
            auVar90._16_4_ = fVar288 * fVar168;
            fVar219 = auVar162._20_4_;
            auVar90._20_4_ = fVar289 * fVar219;
            fVar258 = auVar162._24_4_;
            auVar90._24_4_ = fVar290 * fVar258;
            auVar90._28_4_ = uVar12;
            fVar197 = auVar208._0_4_;
            fVar307 = auVar208._4_4_;
            auVar91._4_4_ = fVar257 * fVar307;
            auVar91._0_4_ = fVar248 * fVar197;
            fVar171 = auVar208._8_4_;
            auVar91._8_4_ = fVar259 * fVar171;
            fVar152 = auVar208._12_4_;
            auVar91._12_4_ = fVar261 * fVar152;
            fVar201 = auVar208._16_4_;
            auVar91._16_4_ = fVar262 * fVar201;
            fVar220 = auVar208._20_4_;
            auVar91._20_4_ = fVar263 * fVar220;
            fVar260 = auVar208._24_4_;
            auVar91._24_4_ = fVar264 * fVar260;
            auVar91._28_4_ = auVar318._28_4_;
            auVar32 = vsubps_avx(auVar91,auVar90);
            auVar92._4_4_ = fVar306 * fVar307;
            auVar92._0_4_ = fVar181 * fVar197;
            auVar92._8_4_ = fVar150 * fVar171;
            auVar92._12_4_ = fVar276 * fVar152;
            auVar92._16_4_ = fVar167 * fVar201;
            auVar92._20_4_ = fVar246 * fVar220;
            auVar92._24_4_ = fVar256 * fVar260;
            auVar92._28_4_ = uVar12;
            auVar93._4_4_ = fVar148 * fVar235;
            auVar93._0_4_ = fVar301 * fVar298;
            auVar93._8_4_ = fVar169 * fVar149;
            auVar93._12_4_ = fVar151 * fVar275;
            auVar93._16_4_ = fVar168 * fVar166;
            auVar93._20_4_ = fVar219 * fVar222;
            auVar93._24_4_ = fVar258 * fVar247;
            auVar93._28_4_ = auVar33._28_4_;
            auVar33 = vsubps_avx(auVar93,auVar92);
            auVar36 = vsubps_avx(auVar29,auVar189);
            fVar199 = auVar33._28_4_ + auVar32._28_4_;
            local_780._0_4_ = auVar33._0_4_ + auVar32._0_4_ * 0.0 + auVar269._0_4_ * 0.0;
            local_780._4_4_ = auVar33._4_4_ + auVar32._4_4_ * 0.0 + auVar269._4_4_ * 0.0;
            local_780._8_4_ = auVar33._8_4_ + auVar32._8_4_ * 0.0 + auVar269._8_4_ * 0.0;
            local_780._12_4_ = auVar33._12_4_ + auVar32._12_4_ * 0.0 + auVar269._12_4_ * 0.0;
            local_780._16_4_ = auVar33._16_4_ + auVar32._16_4_ * 0.0 + auVar269._16_4_ * 0.0;
            local_780._20_4_ = auVar33._20_4_ + auVar32._20_4_ * 0.0 + auVar269._20_4_ * 0.0;
            local_780._24_4_ = auVar33._24_4_ + auVar32._24_4_ * 0.0 + auVar269._24_4_ * 0.0;
            local_780._28_4_ = fVar199 + auVar269._28_4_;
            fVar303 = auVar35._0_4_;
            fVar236 = auVar35._4_4_;
            auVar94._4_4_ = auVar189._4_4_ * fVar236;
            auVar94._0_4_ = auVar189._0_4_ * fVar303;
            fVar195 = auVar35._8_4_;
            auVar94._8_4_ = auVar189._8_4_ * fVar195;
            fVar164 = auVar35._12_4_;
            auVar94._12_4_ = auVar189._12_4_ * fVar164;
            fVar202 = auVar35._16_4_;
            auVar94._16_4_ = auVar189._16_4_ * fVar202;
            fVar203 = auVar35._20_4_;
            auVar94._20_4_ = auVar189._20_4_ * fVar203;
            fVar221 = auVar35._24_4_;
            auVar94._24_4_ = auVar189._24_4_ * fVar221;
            auVar94._28_4_ = fVar199;
            fVar199 = auVar36._0_4_;
            fVar309 = auVar36._4_4_;
            auVar95._4_4_ = auVar188._4_4_ * fVar309;
            auVar95._0_4_ = auVar188._0_4_ * fVar199;
            fVar273 = auVar36._8_4_;
            auVar95._8_4_ = auVar188._8_4_ * fVar273;
            fVar165 = auVar36._12_4_;
            auVar95._12_4_ = auVar188._12_4_ * fVar165;
            fVar214 = auVar36._16_4_;
            auVar95._16_4_ = auVar188._16_4_ * fVar214;
            fVar215 = auVar36._20_4_;
            auVar95._20_4_ = auVar188._20_4_ * fVar215;
            fVar265 = auVar36._24_4_;
            auVar95._24_4_ = auVar188._24_4_ * fVar265;
            auVar95._28_4_ = auVar33._28_4_;
            auVar32 = vsubps_avx(auVar95,auVar94);
            auVar33 = vsubps_avx(auVar162,auVar31);
            fVar305 = auVar33._0_4_;
            fVar147 = auVar33._4_4_;
            auVar96._4_4_ = auVar189._4_4_ * fVar147;
            auVar96._0_4_ = auVar189._0_4_ * fVar305;
            fVar274 = auVar33._8_4_;
            auVar96._8_4_ = auVar189._8_4_ * fVar274;
            fVar237 = auVar33._12_4_;
            auVar96._12_4_ = auVar189._12_4_ * fVar237;
            fVar182 = auVar33._16_4_;
            auVar96._16_4_ = auVar189._16_4_ * fVar182;
            fVar217 = auVar33._20_4_;
            auVar96._20_4_ = auVar189._20_4_ * fVar217;
            fVar272 = auVar33._24_4_;
            auVar96._24_4_ = auVar189._24_4_ * fVar272;
            auVar96._28_4_ = auVar189._28_4_;
            auVar97._4_4_ = fVar309 * auVar31._4_4_;
            auVar97._0_4_ = fVar199 * auVar31._0_4_;
            auVar97._8_4_ = fVar273 * auVar31._8_4_;
            auVar97._12_4_ = fVar165 * auVar31._12_4_;
            auVar97._16_4_ = fVar214 * auVar31._16_4_;
            auVar97._20_4_ = fVar215 * auVar31._20_4_;
            auVar97._24_4_ = fVar265 * auVar31._24_4_;
            auVar97._28_4_ = auVar269._28_4_;
            auVar189 = vsubps_avx(auVar96,auVar97);
            auVar98._4_4_ = auVar188._4_4_ * fVar147;
            auVar98._0_4_ = auVar188._0_4_ * fVar305;
            auVar98._8_4_ = auVar188._8_4_ * fVar274;
            auVar98._12_4_ = auVar188._12_4_ * fVar237;
            auVar98._16_4_ = auVar188._16_4_ * fVar182;
            auVar98._20_4_ = auVar188._20_4_ * fVar217;
            auVar98._24_4_ = auVar188._24_4_ * fVar272;
            auVar98._28_4_ = auVar188._28_4_;
            auVar99._4_4_ = fVar236 * auVar31._4_4_;
            auVar99._0_4_ = fVar303 * auVar31._0_4_;
            auVar99._8_4_ = fVar195 * auVar31._8_4_;
            auVar99._12_4_ = fVar164 * auVar31._12_4_;
            auVar99._16_4_ = fVar202 * auVar31._16_4_;
            auVar99._20_4_ = fVar203 * auVar31._20_4_;
            auVar99._24_4_ = fVar221 * auVar31._24_4_;
            auVar99._28_4_ = auVar31._28_4_;
            auVar31 = vsubps_avx(auVar99,auVar98);
            auVar144._0_4_ = auVar32._0_4_ * 0.0 + auVar31._0_4_ + auVar189._0_4_ * 0.0;
            auVar144._4_4_ = auVar32._4_4_ * 0.0 + auVar31._4_4_ + auVar189._4_4_ * 0.0;
            auVar144._8_4_ = auVar32._8_4_ * 0.0 + auVar31._8_4_ + auVar189._8_4_ * 0.0;
            auVar144._12_4_ = auVar32._12_4_ * 0.0 + auVar31._12_4_ + auVar189._12_4_ * 0.0;
            auVar144._16_4_ = auVar32._16_4_ * 0.0 + auVar31._16_4_ + auVar189._16_4_ * 0.0;
            auVar144._20_4_ = auVar32._20_4_ * 0.0 + auVar31._20_4_ + auVar189._20_4_ * 0.0;
            auVar144._24_4_ = auVar32._24_4_ * 0.0 + auVar31._24_4_ + auVar189._24_4_ * 0.0;
            auVar144._28_4_ = auVar189._28_4_ + auVar31._28_4_ + auVar189._28_4_;
            auVar145 = ZEXT3264(auVar144);
            auVar31 = vmaxps_avx(local_780,auVar144);
            auVar31 = vcmpps_avx(auVar31,ZEXT432(0) << 0x20,2);
            auVar188 = local_760._0_32_ & auVar31;
            if ((((((((auVar188 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar188 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar188 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar188 >> 0x7f,0) == '\0') &&
                  (auVar188 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar188 >> 0xbf,0) == '\0') &&
                (auVar188 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar188[0x1f]) {
LAB_0104cd9a:
              auVar163 = ZEXT3264(CONCAT824(uStack_488,
                                            CONCAT816(uStack_490,CONCAT88(uStack_498,local_4a0))));
              auVar271._4_4_ = fVar146;
              auVar271._0_4_ = fVar132;
              auVar271._8_4_ = fStack_7b8;
              auVar271._12_4_ = fStack_7b4;
              auVar271._16_4_ = fStack_7b0;
              auVar271._20_4_ = fStack_7ac;
              auVar271._24_4_ = fStack_7a8;
              auVar271._28_4_ = fStack_7a4;
            }
            else {
              auVar188 = vandps_avx(auVar31,local_760._0_32_);
              auVar100._4_4_ = fVar309 * fVar235;
              auVar100._0_4_ = fVar199 * fVar298;
              auVar100._8_4_ = fVar273 * fVar149;
              auVar100._12_4_ = fVar165 * fVar275;
              auVar100._16_4_ = fVar214 * fVar166;
              auVar100._20_4_ = fVar215 * fVar222;
              auVar100._24_4_ = fVar265 * fVar247;
              auVar100._28_4_ = local_760._28_4_;
              auVar101._4_4_ = fVar236 * fVar285;
              auVar101._0_4_ = fVar303 * fVar277;
              auVar101._8_4_ = fVar195 * fVar286;
              auVar101._12_4_ = fVar164 * fVar287;
              auVar101._16_4_ = fVar202 * fVar288;
              auVar101._20_4_ = fVar203 * fVar289;
              auVar101._24_4_ = fVar221 * fVar290;
              auVar101._28_4_ = auVar31._28_4_;
              auVar189 = vsubps_avx(auVar101,auVar100);
              auVar102._4_4_ = fVar147 * fVar285;
              auVar102._0_4_ = fVar305 * fVar277;
              auVar102._8_4_ = fVar274 * fVar286;
              auVar102._12_4_ = fVar237 * fVar287;
              auVar102._16_4_ = fVar182 * fVar288;
              auVar102._20_4_ = fVar217 * fVar289;
              auVar102._24_4_ = fVar272 * fVar290;
              auVar102._28_4_ = auVar279._28_4_;
              auVar103._4_4_ = fVar309 * fVar307;
              auVar103._0_4_ = fVar199 * fVar197;
              auVar103._8_4_ = fVar273 * fVar171;
              auVar103._12_4_ = fVar165 * fVar152;
              auVar103._16_4_ = fVar214 * fVar201;
              auVar103._20_4_ = fVar215 * fVar220;
              auVar103._24_4_ = fVar265 * fVar260;
              auVar103._28_4_ = auVar36._28_4_;
              auVar269 = vsubps_avx(auVar103,auVar102);
              auVar104._4_4_ = fVar236 * fVar307;
              auVar104._0_4_ = fVar303 * fVar197;
              auVar104._8_4_ = fVar195 * fVar171;
              auVar104._12_4_ = fVar164 * fVar152;
              auVar104._16_4_ = fVar202 * fVar201;
              auVar104._20_4_ = fVar203 * fVar220;
              auVar104._24_4_ = fVar221 * fVar260;
              auVar104._28_4_ = auVar208._28_4_;
              auVar105._4_4_ = fVar147 * fVar235;
              auVar105._0_4_ = fVar305 * fVar298;
              auVar105._8_4_ = fVar274 * fVar149;
              auVar105._12_4_ = fVar237 * fVar275;
              auVar105._16_4_ = fVar182 * fVar166;
              auVar105._20_4_ = fVar217 * fVar222;
              auVar105._24_4_ = fVar272 * fVar247;
              auVar105._28_4_ = auVar34._28_4_;
              auVar279 = vsubps_avx(auVar105,auVar104);
              auVar161._0_4_ = auVar189._0_4_ * 0.0 + auVar279._0_4_ + auVar269._0_4_ * 0.0;
              auVar161._4_4_ = auVar189._4_4_ * 0.0 + auVar279._4_4_ + auVar269._4_4_ * 0.0;
              auVar161._8_4_ = auVar189._8_4_ * 0.0 + auVar279._8_4_ + auVar269._8_4_ * 0.0;
              auVar161._12_4_ = auVar189._12_4_ * 0.0 + auVar279._12_4_ + auVar269._12_4_ * 0.0;
              auVar161._16_4_ = auVar189._16_4_ * 0.0 + auVar279._16_4_ + auVar269._16_4_ * 0.0;
              auVar161._20_4_ = auVar189._20_4_ * 0.0 + auVar279._20_4_ + auVar269._20_4_ * 0.0;
              auVar161._24_4_ = auVar189._24_4_ * 0.0 + auVar279._24_4_ + auVar269._24_4_ * 0.0;
              auVar161._28_4_ = auVar34._28_4_ + auVar279._28_4_ + auVar208._28_4_;
              auVar31 = vrcpps_avx(auVar161);
              fVar197 = auVar31._0_4_;
              fVar303 = auVar31._4_4_;
              auVar106._4_4_ = auVar161._4_4_ * fVar303;
              auVar106._0_4_ = auVar161._0_4_ * fVar197;
              fVar199 = auVar31._8_4_;
              auVar106._8_4_ = auVar161._8_4_ * fVar199;
              fVar305 = auVar31._12_4_;
              auVar106._12_4_ = auVar161._12_4_ * fVar305;
              fVar235 = auVar31._16_4_;
              auVar106._16_4_ = auVar161._16_4_ * fVar235;
              fVar307 = auVar31._20_4_;
              auVar106._20_4_ = auVar161._20_4_ * fVar307;
              fVar236 = auVar31._24_4_;
              auVar106._24_4_ = auVar161._24_4_ * fVar236;
              auVar106._28_4_ = auVar36._28_4_;
              auVar314._8_4_ = 0x3f800000;
              auVar314._0_8_ = &DAT_3f8000003f800000;
              auVar314._12_4_ = 0x3f800000;
              auVar314._16_4_ = 0x3f800000;
              auVar314._20_4_ = 0x3f800000;
              auVar314._24_4_ = 0x3f800000;
              auVar314._28_4_ = 0x3f800000;
              auVar31 = vsubps_avx(auVar314,auVar106);
              fVar197 = auVar31._0_4_ * fVar197 + fVar197;
              fVar303 = auVar31._4_4_ * fVar303 + fVar303;
              fVar199 = auVar31._8_4_ * fVar199 + fVar199;
              fVar305 = auVar31._12_4_ * fVar305 + fVar305;
              fVar235 = auVar31._16_4_ * fVar235 + fVar235;
              fVar307 = auVar31._20_4_ * fVar307 + fVar307;
              fVar236 = auVar31._24_4_ * fVar236 + fVar236;
              auVar107._4_4_ =
                   (fVar148 * auVar189._4_4_ + auVar269._4_4_ * fVar306 + auVar279._4_4_ * fVar257)
                   * fVar303;
              auVar107._0_4_ =
                   (fVar301 * auVar189._0_4_ + auVar269._0_4_ * fVar181 + auVar279._0_4_ * fVar248)
                   * fVar197;
              auVar107._8_4_ =
                   (fVar169 * auVar189._8_4_ + auVar269._8_4_ * fVar150 + auVar279._8_4_ * fVar259)
                   * fVar199;
              auVar107._12_4_ =
                   (fVar151 * auVar189._12_4_ +
                   auVar269._12_4_ * fVar276 + auVar279._12_4_ * fVar261) * fVar305;
              auVar107._16_4_ =
                   (fVar168 * auVar189._16_4_ +
                   auVar269._16_4_ * fVar167 + auVar279._16_4_ * fVar262) * fVar235;
              auVar107._20_4_ =
                   (fVar219 * auVar189._20_4_ +
                   auVar269._20_4_ * fVar246 + auVar279._20_4_ * fVar263) * fVar307;
              auVar107._24_4_ =
                   (fVar258 * auVar189._24_4_ +
                   auVar269._24_4_ * fVar256 + auVar279._24_4_ * fVar264) * fVar236;
              auVar107._28_4_ = auVar162._28_4_ + auVar30._28_4_ + auVar29._28_4_;
              fVar298 = ray->tfar;
              auVar212._4_4_ = fVar298;
              auVar212._0_4_ = fVar298;
              auVar212._8_4_ = fVar298;
              auVar212._12_4_ = fVar298;
              auVar212._16_4_ = fVar298;
              auVar212._20_4_ = fVar298;
              auVar212._24_4_ = fVar298;
              auVar212._28_4_ = fVar298;
              auVar162 = vcmpps_avx(local_100,auVar107,2);
              auVar30 = vcmpps_avx(auVar107,auVar212,2);
              auVar162 = vandps_avx(auVar162,auVar30);
              auVar29 = auVar188 & auVar162;
              if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar29 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar29 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar29 >> 0x7f,0) == '\0') &&
                    (auVar29 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar29 >> 0xbf,0) == '\0') &&
                  (auVar29 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar29[0x1f]) goto LAB_0104cd9a;
              auVar162 = vandps_avx(auVar188,auVar162);
              auVar29 = vcmpps_avx(ZEXT432(0) << 0x20,auVar161,4);
              auVar31 = auVar162 & auVar29;
              auVar163 = ZEXT3264(CONCAT824(uStack_488,
                                            CONCAT816(uStack_490,CONCAT88(uStack_498,local_4a0))));
              auVar271._4_4_ = fVar146;
              auVar271._0_4_ = fVar132;
              auVar271._8_4_ = fStack_7b8;
              auVar271._12_4_ = fStack_7b4;
              auVar271._16_4_ = fStack_7b0;
              auVar271._20_4_ = fStack_7ac;
              auVar271._24_4_ = fStack_7a8;
              auVar271._28_4_ = fStack_7a4;
              if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar31 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar31 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar31 >> 0x7f,0) != '\0') ||
                    (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar31 >> 0xbf,0) != '\0') ||
                  (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar31[0x1f] < '\0') {
                auVar162 = vandps_avx(auVar29,auVar162);
                auVar163 = ZEXT3264(auVar162);
                auVar108._4_4_ = fVar303 * local_780._4_4_;
                auVar108._0_4_ = fVar197 * (float)local_780._0_4_;
                auVar108._8_4_ = fVar199 * local_780._8_4_;
                auVar108._12_4_ = fVar305 * local_780._12_4_;
                auVar108._16_4_ = fVar235 * local_780._16_4_;
                auVar108._20_4_ = fVar307 * local_780._20_4_;
                auVar108._24_4_ = fVar236 * local_780._24_4_;
                auVar108._28_4_ = auVar30._28_4_;
                auVar109._4_4_ = auVar144._4_4_ * fVar303;
                auVar109._0_4_ = auVar144._0_4_ * fVar197;
                auVar109._8_4_ = auVar144._8_4_ * fVar199;
                auVar109._12_4_ = auVar144._12_4_ * fVar305;
                auVar109._16_4_ = auVar144._16_4_ * fVar235;
                auVar109._20_4_ = auVar144._20_4_ * fVar307;
                auVar109._24_4_ = auVar144._24_4_ * fVar236;
                auVar109._28_4_ = auVar144._28_4_;
                auVar245._8_4_ = 0x3f800000;
                auVar245._0_8_ = &DAT_3f8000003f800000;
                auVar245._12_4_ = 0x3f800000;
                auVar245._16_4_ = 0x3f800000;
                auVar245._20_4_ = 0x3f800000;
                auVar245._24_4_ = 0x3f800000;
                auVar245._28_4_ = 0x3f800000;
                auVar162 = vsubps_avx(auVar245,auVar108);
                _local_180 = vblendvps_avx(auVar162,auVar108,auVar324);
                auVar162 = vsubps_avx(auVar245,auVar109);
                _local_380 = vblendvps_avx(auVar162,auVar109,auVar324);
                auVar145 = ZEXT3264(_local_380);
                local_1a0 = auVar107;
              }
            }
            auVar162 = auVar163._0_32_;
            fVar273 = (float)local_700._0_4_;
            fVar274 = (float)local_700._4_4_;
            fVar275 = fStack_6f8;
            fVar276 = fStack_6f4;
            fVar298 = fStack_6f0;
            fVar181 = fStack_6ec;
            fVar301 = fStack_6e8;
            fVar197 = fStack_6e4;
            if ((((((((auVar162 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar162 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar162 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar162 >> 0x7f,0) != '\0') ||
                  (auVar163 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                 SUB321(auVar162 >> 0xbf,0) != '\0') ||
                (auVar163 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                auVar163[0x1f] < '\0') {
              auVar30 = vsubps_avx(auVar316,auVar271);
              fVar199 = auVar271._0_4_ + auVar30._0_4_ * (float)local_180._0_4_;
              fVar305 = auVar271._4_4_ + auVar30._4_4_ * (float)local_180._4_4_;
              fVar235 = auVar271._8_4_ + auVar30._8_4_ * fStack_178;
              fVar306 = auVar271._12_4_ + auVar30._12_4_ * fStack_174;
              fVar148 = auVar271._16_4_ + auVar30._16_4_ * fStack_170;
              fVar307 = auVar271._20_4_ + auVar30._20_4_ * fStack_16c;
              fVar132 = auVar271._24_4_ + auVar30._24_4_ * fStack_168;
              fVar146 = auVar271._28_4_ + auVar30._28_4_;
              fVar303 = local_788->depth_scale;
              auVar110._4_4_ = (fVar305 + fVar305) * fVar303;
              auVar110._0_4_ = (fVar199 + fVar199) * fVar303;
              auVar110._8_4_ = (fVar235 + fVar235) * fVar303;
              auVar110._12_4_ = (fVar306 + fVar306) * fVar303;
              auVar110._16_4_ = (fVar148 + fVar148) * fVar303;
              auVar110._20_4_ = (fVar307 + fVar307) * fVar303;
              auVar110._24_4_ = (fVar132 + fVar132) * fVar303;
              auVar110._28_4_ = fVar146 + fVar146;
              auVar30 = vcmpps_avx(local_1a0,auVar110,6);
              auVar145 = ZEXT3264(auVar30);
              auVar29 = auVar162 & auVar30;
              if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar29 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar29 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar29 >> 0x7f,0) != '\0') ||
                    (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar29 >> 0xbf,0) != '\0') ||
                  (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar29[0x1f] < '\0') {
                local_220 = vandps_avx(auVar30,auVar162);
                auVar145 = ZEXT3264(local_220);
                auVar156._0_8_ =
                     CONCAT44((float)local_380._4_4_ + (float)local_380._4_4_ + -1.0,
                              (float)local_380._0_4_ + (float)local_380._0_4_ + -1.0);
                auVar156._8_4_ = (float)uStack_378 + (float)uStack_378 + -1.0;
                auVar156._12_4_ = uStack_378._4_4_ + uStack_378._4_4_ + -1.0;
                auVar157._16_4_ = (float)uStack_370 + (float)uStack_370 + -1.0;
                auVar157._0_16_ = auVar156;
                auVar157._20_4_ = uStack_370._4_4_ + uStack_370._4_4_ + -1.0;
                fStack_2a8 = (float)uStack_368 + (float)uStack_368 + -1.0;
                _local_2c0 = auVar157;
                fStack_2a4 = uStack_368._4_4_ + uStack_368._4_4_ + -1.0;
                auVar163 = ZEXT3264(_local_2c0);
                local_2e0 = _local_180;
                local_2a0 = local_1a0;
                local_270 = local_670;
                uStack_268 = uStack_668;
                local_260 = local_4b0._0_8_;
                uStack_258 = local_4b0._8_8_;
                local_250 = local_3e0._0_8_;
                uStack_248 = local_3e0._8_8_;
                local_240 = local_3d0._0_8_;
                uStack_238 = local_3d0._8_8_;
                local_6a0._0_8_ = (context->scene->geometries).items[local_790].ptr;
                _local_380 = _local_2c0;
                if ((((Geometry *)local_6a0._0_8_)->mask & ray->mask) == 0) {
                  pRVar125 = (RTCIntersectArguments *)0x0;
                }
                else {
                  pRVar125 = context->args;
                  if ((pRVar125->filter != (RTCFilterFunctionN)0x0) ||
                     (pRVar125 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar125 >> 8),1),
                     ((Geometry *)local_6a0._0_8_)->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_6a0._8_24_ = auVar244._8_24_;
                    _auStack_7dc = auVar316._4_28_;
                    local_7e0 = (undefined1  [4])(int)p_Var131;
                    auVar327 = vshufps_avx(ZEXT416((uint)(float)(int)local_280),
                                           ZEXT416((uint)(float)(int)local_280),0);
                    local_200[0] = (auVar327._0_4_ + (float)local_180._0_4_ + 0.0) *
                                   (float)local_120._0_4_;
                    local_200[1] = (auVar327._4_4_ + (float)local_180._4_4_ + 1.0) *
                                   (float)local_120._4_4_;
                    local_200[2] = (auVar327._8_4_ + fStack_178 + 2.0) * fStack_118;
                    local_200[3] = (auVar327._12_4_ + fStack_174 + 3.0) * fStack_114;
                    fStack_1f0 = (auVar327._0_4_ + fStack_170 + 4.0) * fStack_110;
                    fStack_1ec = (auVar327._4_4_ + fStack_16c + 5.0) * fStack_10c;
                    fStack_1e8 = (auVar327._8_4_ + fStack_168 + 6.0) * fStack_108;
                    fStack_1e4 = auVar327._12_4_ + fStack_164 + 7.0;
                    uStack_378 = auVar156._8_8_;
                    uStack_370 = auVar157._16_8_;
                    uStack_368 = local_2c0._24_8_;
                    local_1e0 = auVar156._0_8_;
                    uStack_1d8 = uStack_378;
                    uStack_1d0 = uStack_370;
                    uStack_1c8 = uStack_368;
                    auVar163 = ZEXT3264(local_1a0);
                    local_1c0 = local_1a0;
                    iVar124 = vmovmskps_avx(local_220);
                    uVar126 = CONCAT44((int)((ulong)pRVar125 >> 0x20),iVar124);
                    lVar17 = 0;
                    if (uVar126 != 0) {
                      for (; (uVar126 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
                      }
                    }
                    local_7c0 = (uint)lVar17;
                    uStack_7bc = (undefined4)((ulong)lVar17 >> 0x20);
                    local_760._0_8_ = uVar126;
                    local_620._4_28_ = auVar230._4_28_;
                    local_620._0_4_ = (int)CONCAT71((int7)(uVar126 >> 8),iVar124 != 0);
                    if (iVar124 != 0) {
                      _local_6c0 = local_4b0;
                      _auStack_5b0 = auVar28._16_16_;
                      _local_5c0 = local_3e0;
                      _local_6e0 = local_3d0;
                      _local_500 = auVar37;
                      local_27c = uVar127;
                      do {
                        lVar17 = CONCAT44(uStack_7bc,local_7c0);
                        local_654 = local_200[lVar17];
                        auVar145 = ZEXT464((uint)local_654);
                        local_650 = *(uint *)((long)&local_1e0 + lVar17 * 4);
                        auVar163 = ZEXT464(local_650);
                        local_780._0_4_ = ray->tfar;
                        ray->tfar = *(float *)(local_1c0 + lVar17 * 4);
                        local_730.context = context->user;
                        fVar181 = 1.0 - local_654;
                        fVar298 = local_654 * fVar181 + local_654 * fVar181;
                        auVar327 = ZEXT416((uint)(local_654 * local_654 * 3.0));
                        auVar327 = vshufps_avx(auVar327,auVar327,0);
                        auVar176 = ZEXT416((uint)((fVar298 - local_654 * local_654) * 3.0));
                        auVar176 = vshufps_avx(auVar176,auVar176,0);
                        auVar207 = ZEXT416((uint)((fVar181 * fVar181 - fVar298) * 3.0));
                        auVar207 = vshufps_avx(auVar207,auVar207,0);
                        auVar187 = ZEXT416((uint)(fVar181 * fVar181 * -3.0));
                        auVar187 = vshufps_avx(auVar187,auVar187,0);
                        auVar177._0_4_ =
                             auVar187._0_4_ * (float)local_670._0_4_ +
                             auVar207._0_4_ * (float)local_6c0._0_4_ +
                             auVar327._0_4_ * (float)local_6e0._0_4_ +
                             auVar176._0_4_ * (float)local_5c0._0_4_;
                        auVar177._4_4_ =
                             auVar187._4_4_ * (float)local_670._4_4_ +
                             auVar207._4_4_ * (float)local_6c0._4_4_ +
                             auVar327._4_4_ * (float)local_6e0._4_4_ +
                             auVar176._4_4_ * (float)local_5c0._4_4_;
                        auVar177._8_4_ =
                             auVar187._8_4_ * (float)uStack_668 +
                             auVar207._8_4_ * (float)uStack_6b8 +
                             auVar327._8_4_ * (float)uStack_6d8 + auVar176._8_4_ * fStack_5b8;
                        auVar177._12_4_ =
                             auVar187._12_4_ * uStack_668._4_4_ +
                             auVar207._12_4_ * uStack_6b8._4_4_ +
                             auVar327._12_4_ * uStack_6d8._4_4_ + auVar176._12_4_ * fStack_5b4;
                        local_660 = vmovlps_avx(auVar177);
                        local_658 = vextractps_avx(auVar177,2);
                        local_64c = (undefined4)local_628;
                        local_648 = (undefined4)local_790;
                        local_644 = (local_730.context)->instID[0];
                        local_640 = (local_730.context)->instPrimID[0];
                        local_7ec = -1;
                        local_730.valid = &local_7ec;
                        local_730.geometryUserPtr = *(void **)(local_6a0._0_8_ + 0x18);
                        local_730.hit = (RTCHitN *)&local_660;
                        local_730.N = 1;
                        local_730.ray = (RTCRayN *)ray;
                        if (*(code **)(local_6a0._0_8_ + 0x48) == (code *)0x0) {
LAB_0104cca2:
                          p_Var131 = context->args->filter;
                          if (p_Var131 == (RTCFilterFunctionN)0x0) break;
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             ((*(byte *)(local_6a0._0_8_ + 0x3e) & 0x40) != 0)) {
                            auVar327 = (*p_Var131)(&local_730);
                            auVar163._0_8_ = auVar327._8_8_;
                            auVar145._0_8_ = auVar327._0_8_;
                            auVar163._8_56_ = extraout_var_02;
                            auVar145._8_56_ = extraout_var_00;
                          }
                          if (*local_730.valid != 0) break;
                        }
                        else {
                          auVar327 = (**(code **)(local_6a0._0_8_ + 0x48))(&local_730);
                          auVar163._0_8_ = auVar327._8_8_;
                          auVar145._0_8_ = auVar327._0_8_;
                          auVar163._8_56_ = extraout_var_01;
                          auVar145._8_56_ = extraout_var;
                          if (*local_730.valid != 0) goto LAB_0104cca2;
                        }
                        auVar145 = ZEXT464((uint)local_780._0_4_);
                        ray->tfar = (float)local_780._0_4_;
                        uVar126 = local_760._0_8_ ^ 1L << ((ulong)local_7c0 & 0x3f);
                        lVar17 = 0;
                        if (uVar126 != 0) {
                          for (; (uVar126 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
                          }
                        }
                        local_7c0 = (uint)lVar17;
                        uStack_7bc = (undefined4)((ulong)lVar17 >> 0x20);
                        local_760._0_8_ = uVar126;
                        local_620._0_4_ = (int)CONCAT71((int7)(uVar126 >> 8),uVar126 != 0);
                      } while (uVar126 != 0);
                    }
                    pRVar125 = (RTCIntersectArguments *)(ulong)(local_620[0] & 1);
                    p_Var131 = (RTCFilterFunctionN)(ulong)(uint)local_7e0;
                  }
                }
                p_Var131 = (RTCFilterFunctionN)
                           CONCAT71((int7)((ulong)p_Var131 >> 8),(byte)p_Var131 | (byte)pRVar125);
                fVar183 = (float)local_600._0_4_;
                fVar193 = (float)local_600._4_4_;
                fVar194 = fStack_5f8;
                fVar196 = fStack_5f4;
                fVar200 = fStack_5f0;
                fVar213 = fStack_5ec;
                fVar216 = fStack_5e8;
                fVar218 = fStack_5e4;
                fVar224 = (float)local_580._0_4_;
                fVar232 = (float)local_580._4_4_;
                fVar233 = fStack_578;
                fVar234 = fStack_574;
                fVar294 = fStack_570;
                fVar170 = fStack_56c;
                fVar297 = fStack_568;
                fVar223 = (float)local_480._0_4_;
                fVar295 = (float)local_480._4_4_;
                fVar302 = fStack_478;
                fVar304 = fStack_474;
                fVar198 = fStack_470;
                fVar296 = fStack_46c;
                fVar308 = fStack_468;
                fVar273 = (float)local_700._0_4_;
                fVar274 = (float)local_700._4_4_;
                fVar275 = fStack_6f8;
                fVar276 = fStack_6f4;
                fVar298 = fStack_6f0;
                fVar181 = fStack_6ec;
                fVar301 = fStack_6e8;
                fVar197 = fStack_6e4;
              }
            }
          }
          lVar130 = lVar130 + 8;
        } while ((int)lVar130 < (int)uVar127);
      }
      if (((ulong)p_Var131 & 1) != 0) {
        return local_7f9;
      }
      fVar298 = ray->tfar;
      auVar137._4_4_ = fVar298;
      auVar137._0_4_ = fVar298;
      auVar137._8_4_ = fVar298;
      auVar137._12_4_ = fVar298;
      auVar327 = vcmpps_avx(local_2f0,auVar137,2);
      uVar127 = vmovmskps_avx(auVar327);
      uVar123 = uVar123 & uVar123 + 0xf & uVar127;
      local_7f9 = uVar123 != 0;
      prim = local_7e8;
    } while (local_7f9);
  }
  return local_7f9;
}

Assistant:

static __forceinline bool occluded_h(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time());
          if (Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }